

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

char * duckdb_yyjson::yyjson_val_write_opts
                 (yyjson_val *val,yyjson_write_flag flg,yyjson_alc *alc_ptr,usize *dat_len,
                 yyjson_write_err *err)

{
  undefined4 *puVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  _func_void_ptr_void_ptr_size_t *p_Var5;
  _func_void_void_ptr_void_ptr *p_Var6;
  void *pvVar7;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined4 uVar104;
  undefined4 uVar105;
  yyjson_write_err *pyVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  char *pcVar110;
  byte *pbVar111;
  undefined2 uVar112;
  byte *pbVar113;
  uint *puVar114;
  undefined8 uVar115;
  long lVar116;
  long lVar117;
  yyjson_write_err *pyVar118;
  int iVar119;
  ulong uVar120;
  uint *puVar121;
  ulong uVar122;
  size_t sVar123;
  yyjson_val *pyVar124;
  ulong uVar125;
  uint *puVar126;
  long lVar127;
  size_t sVar128;
  char cVar129;
  undefined1 *puVar130;
  uint uVar131;
  int iVar132;
  long lVar133;
  long lVar134;
  int iVar135;
  long lVar136;
  ulong *__dest;
  int iVar137;
  uint uVar138;
  undefined2 *puVar139;
  uint *puVar140;
  uint uVar141;
  long lVar142;
  ulong uVar143;
  long lVar144;
  long lVar145;
  int iVar146;
  uint uVar147;
  int iVar148;
  undefined **ppuVar149;
  ulong uVar150;
  uint *puVar151;
  ulong uVar152;
  byte bVar153;
  byte *pbVar154;
  uint uVar155;
  uint uVar156;
  undefined1 *puVar157;
  ushort *puVar158;
  undefined8 *puVar159;
  bool bVar160;
  bool bVar161;
  long lStack_120;
  char local_10c;
  uint *local_108;
  byte *local_100;
  ulong local_f8;
  ulong *local_e8;
  uint *local_d8;
  ulong *local_a8;
  ulong local_78;
  yyjson_write_err dummy_err;
  ulong local_48;
  
  ppuVar149 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar149 = &alc_ptr->malloc;
  }
  pyVar106 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar106 = &dummy_err;
  }
  if (val == (yyjson_val *)0x0) {
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar118->msg = "input JSON is NULL";
    pyVar106->code = 1;
    return (char *)0x0;
  }
  p_Var5 = ((yyjson_alc *)ppuVar149)->malloc;
  p_Var6 = ((yyjson_alc *)ppuVar149)->free;
  pvVar7 = ((yyjson_alc *)ppuVar149)->ctx;
  uVar150 = val->tag;
  bVar153 = (byte)uVar150;
  local_10c = (char)flg;
  if (0xff < uVar150 && (~bVar153 & 6) == 0) {
    p_Var8 = ((yyjson_alc *)ppuVar149)->realloc;
    if ((flg & 0x41) != 0) {
      puVar157 = enc_table_cpy;
      if ((flg & 2) == 0) {
        puVar130 = enc_table_cpy_slash;
      }
      else {
        puVar157 = enc_table_esc;
        puVar130 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar130 = puVar157;
      }
      local_d8 = (uint *)(((val->uni).u64 & 0xfffffffffffffff0) * 2 + 0x40);
      local_100 = (byte *)(*p_Var5)(pvVar7,(size_t)local_d8);
      if (local_100 == (byte *)0x0) {
        local_100 = (byte *)0x0;
LAB_00f26ca3:
        if (dat_len != (usize *)0x0) {
          *dat_len = 0;
        }
        pyVar118 = &dummy_err;
        if (err != (yyjson_write_err *)0x0) {
          pyVar118 = err;
        }
        pyVar106->code = 2;
        pyVar118->msg = "memory allocation failed";
        if (local_100 == (byte *)0x0) {
          return (char *)0x0;
        }
        (*p_Var6)(pvVar7,local_100);
        return (char *)0x0;
      }
      lVar134 = 1;
      uVar150 = (ulong)((flg & 0x40) == 0);
      lVar127 = uVar150 * 2 + 2;
      local_e8 = (ulong *)(local_100 + (long)local_d8);
      bVar161 = (~(uint)val->tag & 7) == 0;
      local_48 = (ulong)bVar161;
      lVar142 = (val->tag >> 8) << bVar161;
      *local_100 = bVar161 << 5 | 0x5b;
      puVar151 = (uint *)(local_100 + 2);
      local_100[1] = 10;
      pyVar124 = val + 1;
      local_a8 = local_e8;
LAB_00f21239:
      uVar108 = local_48 & 0xff;
      uVar109 = lVar134 * 4 + 0x20;
      uVar152 = lVar134 * 4 + 0x10;
LAB_00f2126e:
      uVar120 = pyVar124->tag;
      bVar153 = (byte)uVar120 & 7;
      uVar141 = (uint)lVar142;
      uVar131 = (uint)uVar108;
      if (bVar153 == 4) {
        uVar120 = 0x20;
        if ((uVar141 & uVar131) == 0) {
          uVar120 = uVar109;
        }
        if (local_e8 <= (ulong *)(uVar120 + (long)puVar151)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar120) {
            uVar107 = uVar120;
          }
          sVar128 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar128);
          if (pbVar154 == (byte *)0x0) goto LAB_00f26ca3;
          sVar123 = (long)local_a8 - (long)local_e8;
          memmove(pbVar154 + (sVar128 - sVar123),pbVar154 + ((long)local_e8 - (long)local_100),
                  sVar123);
          puVar151 = (uint *)(pbVar154 + ((long)puVar151 - (long)local_100));
          local_a8 = (ulong *)(pbVar154 + sVar128);
          local_100 = pbVar154;
          local_e8 = (ulong *)(pbVar154 + (sVar128 - sVar123));
          local_d8 = (uint *)sVar128;
        }
        lVar133 = 0;
        if ((uVar141 & uVar131) == 0) {
          lVar133 = lVar134;
        }
        iVar135 = (int)puVar151;
        iVar137 = -2 - iVar135;
        puVar158 = (ushort *)((long)puVar151 + 2);
        lVar136 = 0;
        puVar126 = puVar151;
        while (bVar161 = lVar133 != 0, lVar133 = lVar133 + -1, bVar161) {
          pbVar154 = (byte *)((long)puVar151 + lVar136);
          pbVar154[0] = 0x20;
          pbVar154[1] = 0x20;
          pbVar154[2] = 0x20;
          pbVar154[3] = 0x20;
          lVar136 = lVar136 + lVar127;
          iVar137 = iVar137 - (int)lVar127;
          puVar126 = (uint *)((long)puVar126 + lVar127);
          puVar158 = puVar158 + uVar150 + 1;
        }
        uVar120 = (pyVar124->uni).u64;
        uVar141 = (uint)(uVar120 >> 0x20);
        if ((pyVar124->tag & 0x10) == 0) {
          uVar141 = uVar141 >> 0x1f & (uint)(pyVar124->tag >> 3);
          uVar125 = (ulong)uVar141;
          *(byte *)((long)puVar151 + lVar136) = 0x2d;
          uVar107 = -uVar120;
          if (uVar141 == 0) {
            uVar107 = uVar120;
          }
          if (uVar107 < 100000000) {
            if (uVar107 < 100) {
              *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                   *(undefined2 *)(digit_table + (ulong)(uVar107 < 10) + uVar107 * 2);
              pbVar154 = (byte *)((long)puVar151 + lVar136 + (uVar125 - (uVar107 < 10)) + 2);
            }
            else {
              iVar137 = (int)uVar107;
              if (uVar107 < 10000) {
                uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                     *(undefined2 *)(digit_table + (ulong)(uVar107 < 1000) + (ulong)uVar141 * 2);
                lVar136 = lVar136 + (uVar125 - (uVar107 < 1000));
                *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                     *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                pbVar154 = (byte *)((long)puVar151 + lVar136 + 4);
              }
              else {
                if (uVar107 < 1000000) {
                  iVar137 = (int)(uVar107 * 0x68db9 >> 0x20) * -10000 + iVar137;
                  uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                       *(undefined2 *)
                        (digit_table + (ulong)(uVar107 < 100000) + (uVar107 * 0x68db9 >> 0x20) * 2);
                  lVar136 = lVar136 + (uVar125 - (uVar107 < 100000));
                  pbVar154 = (byte *)((long)puVar151 + lVar136 + 6);
                  *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                }
                else {
                  uVar141 = (uint)(uVar107 * 0x68db8bb >> 0x20);
                  uVar131 = uVar141 >> 8;
                  iVar137 = uVar131 * -10000 + iVar137;
                  uVar131 = uVar131 * 0x147b >> 0x13;
                  uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                       *(undefined2 *)
                        (digit_table + (ulong)(uVar107 < 10000000) + (ulong)uVar131 * 2);
                  lVar136 = lVar136 + (uVar125 - (uVar107 < 10000000));
                  pbVar154 = (byte *)((long)puVar151 + lVar136 + 8);
                  *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                       *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                  *(undefined2 *)((long)puVar151 + lVar136 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                  uVar112 = *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
                }
LAB_00f22f35:
                *(undefined2 *)(pbVar154 + -2) = uVar112;
              }
            }
          }
          else {
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar107;
            lVar133 = SUB168(auVar10 / ZEXT816(100000000),0);
            uVar120 = lVar133 * 0xfa0a1f00 + uVar107;
            iVar137 = SUB164(auVar10 / ZEXT816(100000000),0);
            if (uVar107 < 10000000000000000) {
              if (uVar107 < 10000000000) {
                *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                     *(undefined2 *)(digit_table + (ulong)(uVar107 < 1000000000) + lVar133 * 2);
                pbVar154 = (byte *)((long)puVar151 +
                                   lVar136 + (uVar125 - (uVar107 < 1000000000)) + 2);
              }
              else {
                if (uVar107 < 1000000000000) {
                  uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                  uVar107 = (ulong)(uVar107 >> 0xb < 0x2e90edd);
                  *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                       *(undefined2 *)(digit_table + uVar107 + (ulong)uVar141 * 2);
                  uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                  pbVar154 = (byte *)((long)puVar151 + lVar136 + (uVar125 - uVar107) + 4);
                }
                else if (uVar107 < 100000000000000) {
                  iVar137 = (int)((ulong)(lVar133 * 0x68db9) >> 0x20) * -10000 + iVar137;
                  uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                  uVar107 = (ulong)(uVar107 >> 0xd < 0x48c27395);
                  *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                       *(undefined2 *)
                        (digit_table + uVar107 + ((ulong)(lVar133 * 0x68db9) >> 0x20) * 2);
                  lVar136 = lVar136 + (uVar125 - uVar107);
                  pbVar154 = (byte *)((long)puVar151 + lVar136 + 6);
                  *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                }
                else {
                  uVar141 = (uint)((ulong)(lVar133 * 0x68db8bb) >> 0x20);
                  uVar131 = uVar141 >> 8;
                  iVar137 = uVar131 * -10000 + iVar137;
                  uVar131 = uVar131 * 0x147b >> 0x13;
                  uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                       *(undefined2 *)
                        (digit_table + (ulong)(uVar107 < 1000000000000000) + (ulong)uVar131 * 2);
                  lVar136 = lVar136 + (uVar125 - (uVar107 < 1000000000000000));
                  pbVar154 = (byte *)((long)puVar151 + lVar136 + 8);
                  *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                       *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                  *(undefined2 *)((long)puVar151 + lVar136 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                  uVar112 = *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
                }
                *(undefined2 *)(pbVar154 + -2) = uVar112;
              }
              uVar141 = (uint)((uVar120 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar131 = uVar141 >> 8;
              iVar137 = uVar131 * -10000 + (int)uVar120;
              uVar131 = uVar131 * 0x147b >> 0x13;
              uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
              *(undefined2 *)(pbVar154 + 2) =
                   *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
              *(undefined2 *)(pbVar154 + 4) = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
              *(undefined2 *)(pbVar154 + 6) =
                   *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar137) * 2);
              pbVar154 = pbVar154 + 8;
            }
            else {
              auVar11._8_8_ = 0;
              auVar11._0_8_ = uVar107;
              lVar133 = SUB168(auVar11 / ZEXT816(1000000000000),0);
              iVar135 = SUB164(auVar11 / ZEXT816(1000000000000),0);
              if (uVar107 < 1000000000000000000) {
                uVar122 = lVar133 * 0x68db9;
                iVar146 = (int)(uVar122 >> 0x20) * -10000 + iVar135;
                uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                     *(undefined2 *)
                      (digit_table + (ulong)(uVar107 < 100000000000000000) + (uVar122 >> 0x20) * 2);
                lVar136 = lVar136 + (uVar125 - (uVar107 < 100000000000000000));
                lVar133 = lVar136 + 6;
                *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                     *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
              }
              else {
                uVar141 = (uint)((ulong)(lVar133 * 0x68db8bb) >> 0x20);
                uVar131 = uVar141 >> 8;
                iVar146 = uVar131 * -10000 + iVar135;
                uVar131 = uVar131 * 0x147b >> 0x13;
                uVar138 = (uint)(iVar146 * 0x147b) >> 0x13;
                *(undefined2 *)((long)puVar151 + lVar136 + uVar125) =
                     *(undefined2 *)
                      (digit_table + (ulong)(uVar107 < 10000000000000000000) + (ulong)uVar131 * 2);
                lVar136 = lVar136 + (uVar125 - (uVar107 < 10000000000000000000));
                lVar133 = lVar136 + 8;
                *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                     *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                *(undefined2 *)((long)puVar151 + lVar136 + 4) =
                     *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                uVar112 = *(undefined2 *)(digit_table + (uVar138 * -100 + iVar146) * 2);
              }
              pbVar154 = (byte *)((long)puVar151 + lVar133);
              *(undefined2 *)(pbVar154 + -2) = uVar112;
              iVar137 = iVar137 + iVar135 * -10000;
              uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
              *(undefined2 *)(pbVar154 + 2) =
                   *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar137) * 2);
              uVar141 = (uint)((uVar120 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar131 = uVar141 >> 8;
              iVar137 = uVar131 * -10000 + (int)uVar120;
              uVar131 = uVar131 * 0x147b >> 0x13;
              uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar154 + 4) = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
              *(undefined2 *)(pbVar154 + 6) =
                   *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
              *(undefined2 *)(pbVar154 + 8) = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
              *(undefined2 *)(pbVar154 + 10) =
                   *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar137) * 2);
              pbVar154 = pbVar154 + 0xc;
            }
          }
        }
        else {
          uVar107 = uVar120 & 0xfffffffffffff;
          uVar141 = uVar141 >> 0x14 & 0x7ff;
          if (uVar141 == 0x7ff) {
            if ((flg & 0x10) == 0) {
              if ((flg & 8) == 0) goto LAB_00f26d85;
              if (uVar107 == 0) {
                *(byte *)((long)puVar151 + lVar136) = 0x2d;
                pbVar113 = (byte *)((long)puVar151 + (lVar136 - ((long)uVar120 >> 0x3f)));
                pbVar154 = pbVar113 + 8;
                pbVar113[0] = 0x49;
                pbVar113[1] = 0x6e;
                pbVar113[2] = 0x66;
                pbVar113[3] = 0x69;
                pbVar113[4] = 0x6e;
                pbVar113[5] = 0x69;
                pbVar113[6] = 0x74;
                pbVar113[7] = 0x79;
              }
              else {
                pbVar113 = (byte *)((long)puVar151 + lVar136);
                pbVar154 = pbVar113 + 3;
                pbVar113[0] = 0x4e;
                pbVar113[1] = 0x61;
                pbVar113[2] = 0x4e;
                pbVar113[3] = 0;
              }
            }
            else {
              pbVar154 = (byte *)((long)puVar151 + lVar136);
              pbVar154[0] = 0x6e;
              pbVar154[1] = 0x75;
              pbVar154[2] = 0x6c;
              pbVar154[3] = 0x6c;
              pbVar154 = pbVar154 + 4;
            }
          }
          else {
            *(byte *)((long)puVar151 + lVar136) = 0x2d;
            lVar133 = -((long)uVar120 >> 0x3f);
            pbVar154 = (byte *)((long)puVar151 + lVar133 + lVar136);
            if ((uVar120 & 0x7fffffffffffffff) == 0) {
              pbVar154[0] = 0x30;
              pbVar154[1] = 0x2e;
              pbVar154[2] = 0x30;
              pbVar154[3] = 0;
              pbVar154 = (byte *)((long)puVar151 + lVar136 + lVar133 + 3);
            }
            else if (uVar141 == 0) {
              uVar120 = (ulong)((uint)uVar120 & 1);
              uVar107 = uVar107 * 0x20;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar107 - 0x10;
              auVar89._8_8_ = 0;
              auVar89._0_8_ = SUB168(auVar38 * ZEXT816(0x6c07a2c26a8346d2),8);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar107 - 0x10;
              auVar89 = auVar39 * ZEXT816(0x9e19db92b4e31ba9) + auVar89;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = uVar107;
              auVar90._8_8_ = 0;
              auVar90._0_8_ = SUB168(auVar40 * ZEXT816(0x6c07a2c26a8346d2),8);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar107;
              auVar90 = auVar41 * ZEXT816(0x9e19db92b4e31ba9) + auVar90;
              uVar125 = auVar90._8_8_;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uVar107 + 0x10;
              auVar91._8_8_ = 0;
              auVar91._0_8_ = SUB168(auVar42 * ZEXT816(0x6c07a2c26a8346d2),8);
              auVar43._8_8_ = 0;
              auVar43._0_8_ = uVar107 + 0x10;
              auVar91 = auVar43 * ZEXT816(0x9e19db92b4e31ba9) + auVar91;
              uVar107 = ((ulong)((auVar89 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar89._8_8_) + uVar120;
              uVar120 = ((ulong)((auVar91 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar91._8_8_) - uVar120;
              if (uVar125 < 0x28) {
LAB_00f2364c:
                uVar122 = (auVar90 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                          | uVar125;
                uVar143 = uVar125 & 0x7ffffffffffffffc;
                bVar161 = true;
                if (uVar122 <= (uVar143 | 2)) {
                  bVar161 = (bool)((byte)((uVar125 & 0xffffffff) >> 2) & 0x3f &
                                  uVar122 == (uVar143 | 2));
                }
                uVar122 = uVar125 >> 2;
                bVar160 = uVar143 + 4 <= uVar120;
                if (uVar143 < uVar107 == bVar160) {
                  bVar161 = bVar160;
                }
                iVar146 = -0x144;
              }
              else {
                uVar122 = uVar125 / 0x28;
                bVar161 = uVar122 * 0x28 + 0x28 <= uVar120;
                if (uVar122 * 0x28 < uVar107 != bVar161) goto LAB_00f2364c;
                iVar146 = -0x143;
              }
              uVar122 = bVar161 + uVar122;
              if (uVar122 < 1000000000000000) {
                iVar148 = (int)uVar122;
                if (uVar122 < 100000000) {
                  if (uVar122 < 100) {
                    *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + 1) =
                         *(undefined2 *)(digit_table + (ulong)(uVar122 < 10) + uVar122 * 2);
                    pbVar113 = (byte *)((long)puVar151 +
                                       lVar136 + (lVar133 - (ulong)(uVar122 < 10)) + 3);
                  }
                  else {
                    if (9999 < uVar122) {
                      if (uVar122 < 1000000) {
                        iVar148 = (int)(uVar122 * 0x68db9 >> 0x20) * -10000 + iVar148;
                        uVar141 = (uint)(iVar148 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + 1) =
                             *(undefined2 *)
                              (digit_table +
                              (ulong)(uVar122 < 100000) + (uVar122 * 0x68db9 >> 0x20) * 2);
                        lVar116 = lVar136 + (lVar133 - (ulong)(uVar122 < 100000));
                        pbVar113 = (byte *)((long)puVar151 + lVar116 + 7);
                        *(undefined2 *)((long)puVar151 + lVar116 + 3) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                        uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar148) * 2);
                      }
                      else {
                        uVar141 = (uint)(uVar122 * 0x68db8bb >> 0x20);
                        uVar131 = uVar141 >> 8;
                        iVar148 = uVar131 * -10000 + iVar148;
                        uVar131 = uVar131 * 0x147b >> 0x13;
                        uVar138 = (uint)(iVar148 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + 1) =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar122 < 10000000) + (ulong)uVar131 * 2);
                        lVar116 = lVar136 + (lVar133 - (ulong)(uVar122 < 10000000));
                        pbVar113 = (byte *)((long)puVar151 + lVar116 + 9);
                        *(undefined2 *)((long)puVar151 + lVar116 + 3) =
                             *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                        *(undefined2 *)((long)puVar151 + lVar116 + 5) =
                             *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                        uVar112 = *(undefined2 *)(digit_table + (uVar138 * -100 + iVar148) * 2);
                      }
                      goto LAB_00f23a01;
                    }
                    uVar141 = (uint)(iVar148 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + 1) =
                         *(undefined2 *)(digit_table + (ulong)(uVar122 < 1000) + (ulong)uVar141 * 2)
                    ;
                    lVar116 = lVar136 + (lVar133 - (ulong)(uVar122 < 1000));
                    pbVar113 = (byte *)((long)puVar151 + lVar116 + 5);
                    *(undefined2 *)((long)puVar151 + lVar116 + 3) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar148) * 2);
                  }
                }
                else {
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = uVar122;
                  lVar116 = SUB168(auVar17 / ZEXT816(100000000),0);
                  iVar119 = SUB164(auVar17 / ZEXT816(100000000),0);
                  if (uVar122 < 10000000000) {
                    *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + 1) =
                         *(undefined2 *)(digit_table + (ulong)(uVar122 < 1000000000) + lVar116 * 2);
                    pbVar113 = (byte *)((long)puVar151 +
                                       lVar136 + (lVar133 - (ulong)(uVar122 < 1000000000)) + 3);
                  }
                  else {
                    if (uVar122 < 1000000000000) {
                      uVar141 = (uint)(iVar119 * 0x147b) >> 0x13;
                      uVar120 = (ulong)(uVar122 >> 0xb < 0x2e90edd);
                      *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + 1) =
                           *(undefined2 *)(digit_table + uVar120 + (ulong)uVar141 * 2);
                      uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar119) * 2);
                      pbVar113 = (byte *)((long)puVar151 + lVar136 + (lVar133 - uVar120) + 5);
                    }
                    else if (uVar122 < 100000000000000) {
                      iVar132 = (int)((ulong)(lVar116 * 0x68db9) >> 0x20) * -10000 + iVar119;
                      uVar141 = (uint)(iVar132 * 0x147b) >> 0x13;
                      uVar120 = (ulong)(uVar122 >> 0xd < 0x48c27395);
                      *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + 1) =
                           *(undefined2 *)
                            (digit_table + uVar120 + ((ulong)(lVar116 * 0x68db9) >> 0x20) * 2);
                      lVar116 = lVar136 + (lVar133 - uVar120);
                      pbVar113 = (byte *)((long)puVar151 + lVar116 + 7);
                      *(undefined2 *)((long)puVar151 + lVar116 + 3) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar132) * 2);
                    }
                    else {
                      uVar141 = (uint)((ulong)(lVar116 * 0x68db8bb) >> 0x20);
                      uVar131 = uVar141 >> 8;
                      iVar132 = uVar131 * -10000 + iVar119;
                      uVar138 = uVar131 * 0x147b >> 0x13;
                      uVar131 = (uint)(iVar132 * 0x147b) >> 0x13;
                      *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + 1) =
                           *(undefined2 *)(digit_table + (ulong)uVar138 * 2 + 1);
                      lVar116 = lVar136 + lVar133;
                      pbVar113 = (byte *)((long)puVar151 + lVar116 + 8);
                      *(undefined2 *)((long)puVar151 + lVar116 + 2) =
                           *(undefined2 *)(digit_table + (uVar138 * -100 + (uVar141 >> 8)) * 2);
                      *(undefined2 *)((long)puVar151 + lVar116 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                      uVar112 = *(undefined2 *)(digit_table + (uVar131 * -100 + iVar132) * 2);
                    }
                    *(undefined2 *)(pbVar113 + -2) = uVar112;
                  }
                  uVar131 = iVar119 * -100000000 + iVar148;
                  uVar141 = (uint)((ulong)uVar131 * 0x68db8bb >> 0x20);
                  uVar138 = uVar141 >> 8;
                  iVar148 = uVar138 * -10000 + uVar131;
                  uVar131 = uVar138 * 0x147b >> 0x13;
                  uVar138 = (uint)(iVar148 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar113 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                  *(undefined2 *)(pbVar113 + 2) =
                       *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                  *(undefined2 *)(pbVar113 + 4) = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                  *(undefined2 *)(pbVar113 + 6) =
                       *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar148) * 2);
                  pbVar113 = pbVar113 + 8;
                }
              }
              else {
                auVar16._8_8_ = 0;
                auVar16._0_8_ = uVar122;
                uVar120 = SUB168(auVar16 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                          uVar122 / 100000000;
                uVar107 = (uVar122 / 100000000) * 0xfa0a1f00 + uVar122;
                *(byte *)((long)puVar151 + lVar136 + lVar133 + 1) =
                     SUB161(auVar16 / ZEXT816(10000000000000000),0) + 0x30;
                uVar141 = (uint)((uVar120 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar131 = uVar141 >> 8;
                iVar148 = uVar131 * -10000 + (int)uVar120;
                uVar131 = uVar131 * 0x147b >> 0x13;
                uVar138 = (uint)(iVar148 * 0x147b) >> 0x13;
                lVar116 = lVar136 + lVar133 + (ulong)(9999999999999999 < uVar122);
                pbVar113 = (byte *)((long)puVar151 + lVar116 + 0x11);
                *(undefined2 *)((long)puVar151 + lVar116 + 1) =
                     *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                *(undefined2 *)((long)puVar151 + lVar116 + 3) =
                     *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                *(undefined2 *)((long)puVar151 + lVar116 + 5) =
                     *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                *(undefined2 *)((long)puVar151 + lVar116 + 7) =
                     *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar148) * 2);
                uVar141 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar131 = uVar141 >> 8;
                iVar148 = uVar131 * -10000 + (int)uVar107;
                uVar131 = uVar131 * 0x147b >> 0x13;
                uVar138 = (uint)(iVar148 * 0x147b) >> 0x13;
                *(undefined2 *)((long)puVar151 + lVar116 + 9) =
                     *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                *(undefined2 *)((long)puVar151 + lVar116 + 0xb) =
                     *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                *(undefined2 *)((long)puVar151 + lVar116 + 0xd) =
                     *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                uVar112 = *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar148) * 2);
LAB_00f23a01:
                *(undefined2 *)(pbVar113 + -2) = uVar112;
              }
              *pbVar154 = *(byte *)((long)puVar151 + lVar136 + lVar133 + 1);
              *(byte *)((long)puVar151 + lVar136 + lVar133 + 1) = 0x2e;
              pbVar154 = pbVar113 + 5;
              do {
                pbVar111 = pbVar154;
                pbVar154 = pbVar111 + -1;
              } while (pbVar111[-6] == 0x30);
              iVar148 = (iVar146 + (int)pbVar113) - (int)lVar133;
              uVar120 = (ulong)(pbVar111[-6] != 0x2e);
              pbVar154 = pbVar111 + -1 + uVar120;
              (pbVar111 + (uVar120 - 6))[0] = 0x65;
              (pbVar111 + (uVar120 - 6))[1] = 0x2d;
              pbVar111[uVar120 - 4] =
                   (char)((uint)(((iVar148 - iVar135) - (int)lVar136) * -0x290 + 0x520) >> 0x10) +
                   0x30;
              *(undefined2 *)(pbVar111 + (uVar120 - 3)) =
                   *(undefined2 *)
                    (digit_table +
                    (((((int)lVar133 - iVar146) - (int)pbVar113) + iVar135 + (int)lVar136 +
                     ((uint)((iVar148 + iVar137) * -0x290) >> 0x10) * 0x7fffff9c) * 2 + 4));
            }
            else {
              uVar125 = uVar107 + 0x10000000000000;
              if (uVar141 - 0x3ff < 0x35) {
                lVar116 = 0;
                if (uVar125 != 0) {
                  for (; (uVar125 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
                  }
                }
                if (0x433 - uVar141 <= (uint)lVar116) {
                  uVar125 = uVar125 >> ((byte)(0x433 - uVar141) & 0x3f);
                  iVar137 = (int)uVar125;
                  if (uVar125 < 100000000) {
                    if (uVar125 < 100) {
                      *(undefined2 *)pbVar154 =
                           *(undefined2 *)(digit_table + (ulong)(uVar125 < 10) + uVar125 * 2);
                      pbVar154 = (byte *)((long)puVar151 +
                                         lVar136 + (lVar133 - (ulong)(uVar125 < 10)) + 2);
                    }
                    else {
                      if (uVar125 < 10000) {
                        uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar154 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar125 < 1000) + (ulong)uVar141 * 2);
                        uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                        pbVar154 = (byte *)((long)puVar151 +
                                           lVar136 + (lVar133 - (ulong)(uVar125 < 1000)) + 4);
                      }
                      else if (uVar125 < 1000000) {
                        iVar137 = (int)(uVar125 * 0x68db9 >> 0x20) * -10000 + iVar137;
                        uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar154 =
                             *(undefined2 *)
                              (digit_table +
                              (ulong)(uVar125 < 100000) + (uVar125 * 0x68db9 >> 0x20) * 2);
                        lVar136 = lVar136 + (lVar133 - (ulong)(uVar125 < 100000));
                        pbVar154 = (byte *)((long)puVar151 + lVar136 + 6);
                        *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                        uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                      }
                      else {
                        uVar141 = (uint)(uVar125 * 0x68db8bb >> 0x20);
                        uVar131 = uVar141 >> 8;
                        iVar137 = uVar131 * -10000 + iVar137;
                        uVar131 = uVar131 * 0x147b >> 0x13;
                        uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar154 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar125 < 10000000) + (ulong)uVar131 * 2);
                        lVar136 = lVar136 + (lVar133 - (ulong)(uVar125 < 10000000));
                        pbVar154 = (byte *)((long)puVar151 + lVar136 + 8);
                        *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                             *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                        *(undefined2 *)((long)puVar151 + lVar136 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                        uVar112 = *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
                      }
                      *(undefined2 *)(pbVar154 + -2) = uVar112;
                    }
                  }
                  else {
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = uVar125;
                    lVar116 = SUB168(auVar15 / ZEXT816(100000000),0);
                    iVar135 = SUB164(auVar15 / ZEXT816(100000000),0);
                    if (uVar125 < 10000000000) {
                      *(undefined2 *)pbVar154 =
                           *(undefined2 *)
                            (digit_table + (ulong)(uVar125 < 1000000000) + lVar116 * 2);
                      pbVar154 = (byte *)((long)puVar151 +
                                         lVar136 + (lVar133 - (ulong)(uVar125 < 1000000000)) + 2);
                    }
                    else {
                      if (uVar125 < 1000000000000) {
                        uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                        uVar120 = (ulong)(uVar125 >> 0xb < 0x2e90edd);
                        *(undefined2 *)pbVar154 =
                             *(undefined2 *)(digit_table + uVar120 + (ulong)uVar141 * 2);
                        uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                        pbVar154 = (byte *)((long)puVar151 + lVar136 + (lVar133 - uVar120) + 4);
                      }
                      else if (uVar125 < 100000000000000) {
                        iVar146 = (int)((ulong)(lVar116 * 0x68db9) >> 0x20) * -10000 + iVar135;
                        uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                        uVar120 = (ulong)(uVar125 >> 0xd < 0x48c27395);
                        *(undefined2 *)pbVar154 =
                             *(undefined2 *)
                              (digit_table + uVar120 + ((ulong)(lVar116 * 0x68db9) >> 0x20) * 2);
                        lVar136 = lVar136 + (lVar133 - uVar120);
                        pbVar154 = (byte *)((long)puVar151 + lVar136 + 6);
                        *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                        uVar112 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
                      }
                      else {
                        uVar141 = (uint)((ulong)(lVar116 * 0x68db8bb) >> 0x20);
                        uVar131 = uVar141 >> 8;
                        iVar146 = uVar131 * -10000 + iVar135;
                        uVar131 = uVar131 * 0x147b >> 0x13;
                        uVar138 = (uint)(iVar146 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar154 =
                             *(undefined2 *)
                              (digit_table +
                              (ulong)(uVar125 < 1000000000000000) + (ulong)uVar131 * 2);
                        lVar136 = lVar136 + (lVar133 - (ulong)(uVar125 < 1000000000000000));
                        pbVar154 = (byte *)((long)puVar151 + lVar136 + 8);
                        *(undefined2 *)((long)puVar151 + lVar136 + 2) =
                             *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                        *(undefined2 *)((long)puVar151 + lVar136 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                        uVar112 = *(undefined2 *)(digit_table + (uVar138 * -100 + iVar146) * 2);
                      }
                      *(undefined2 *)(pbVar154 + -2) = uVar112;
                    }
                    uVar131 = iVar135 * -100000000 + iVar137;
                    uVar141 = (uint)((ulong)uVar131 * 0x68db8bb >> 0x20);
                    uVar138 = uVar141 >> 8;
                    iVar137 = uVar138 * -10000 + uVar131;
                    uVar131 = uVar138 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                    *(undefined2 *)(pbVar154 + 2) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)(pbVar154 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)(pbVar154 + 6) =
                         *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar137) * 2);
                    pbVar154 = pbVar154 + 8;
                  }
                  pbVar154[0] = 0x2e;
                  pbVar154[1] = 0x30;
                  pbVar154 = pbVar154 + 2;
                  goto LAB_00f230d6;
                }
              }
              uVar120 = (ulong)((uint)uVar120 & 1);
              iVar137 = uVar141 * 0x4d105 + -0x200a5;
              if (uVar141 == 1 || uVar107 != 0) {
                iVar137 = uVar141 * 0x4d105;
              }
              iVar137 = iVar137 + -0x1439b7ff >> 0x14;
              uVar122 = *(ulong *)(pow10_sig_table + (ulong)(iVar137 * -2 + 0x2ae) * 8);
              uVar143 = *(long *)(pow10_sig_table + (ulong)(iVar137 * -2 + 0x2af) * 8) +
                        (ulong)(iVar137 - 1U < 0xffffffc8);
              bVar153 = ((char)((uint)(iVar137 * -0x3526b) >> 0x10) + (char)uVar141) - 0x32;
              uVar107 = (ulong)(uVar141 != 1 && uVar107 == 0) + uVar125 * 4 + -2 << (bVar153 & 0x3f)
              ;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar143;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = uVar107;
              auVar86._8_8_ = 0;
              auVar86._0_8_ = SUB168(auVar32 * auVar68,8);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar122;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = uVar107;
              auVar86 = auVar33 * auVar69 + auVar86;
              uVar107 = uVar125 * 4 << (bVar153 & 0x3f);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar143;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = uVar107;
              auVar87._8_8_ = 0;
              auVar87._0_8_ = SUB168(auVar34 * auVar70,8);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar122;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = uVar107;
              auVar87 = auVar35 * auVar71 + auVar87;
              uVar107 = auVar87._8_8_;
              uVar125 = uVar125 * 4 + 2 << (bVar153 & 0x3f);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar143;
              auVar72._8_8_ = 0;
              auVar72._0_8_ = uVar125;
              auVar88._8_8_ = 0;
              auVar88._0_8_ = SUB168(auVar36 * auVar72,8);
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar122;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar125;
              auVar88 = auVar37 * auVar73 + auVar88;
              uVar125 = ((ulong)((auVar86 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar86._8_8_) + uVar120;
              uVar120 = ((ulong)((auVar88 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar88._8_8_) - uVar120;
              if (uVar107 < 0x28) {
LAB_00f21767:
                uVar143 = (auVar87 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                          | uVar107;
                uVar122 = uVar107 & 0xfffffffffffffffc;
                bVar161 = true;
                if (uVar143 <= uVar122 + 2) {
                  bVar161 = (bool)((byte)((uVar107 & 0xffffffff) >> 2) & 0x3f &
                                  uVar143 == uVar122 + 2);
                }
                bVar160 = uVar122 + 4 <= uVar120;
                if (uVar122 < uVar125 == bVar160) {
                  bVar161 = bVar160;
                }
                uVar120 = (ulong)bVar161 + (uVar107 >> 2);
              }
              else {
                uVar143 = (uVar107 / 0x28) * 0x28;
                uVar122 = uVar143 + 0x28;
                if (uVar143 < uVar125 != uVar122 <= uVar120) goto LAB_00f21767;
                uVar120 = (uVar107 / 0x28 + 1) - (ulong)(uVar120 < uVar122);
                iVar137 = iVar137 + 1;
              }
              iVar135 = (0x11 - (uint)(uVar120 < 10000000000000000)) -
                        (uint)(uVar120 < 1000000000000000);
              uVar141 = iVar135 + iVar137;
              if (iVar135 + iVar137 + 5U < 0x1b) {
                if ((int)uVar141 < 1) {
                  uVar122 = (ulong)(2 - uVar141);
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = uVar120;
                  uVar107 = SUB168(auVar14 / ZEXT816(100000000),0);
                  uVar120 = uVar107 * 0xfa0a1f00 + uVar120;
                  uVar138 = SUB164(auVar14 / ZEXT816(100000000),0);
                  uVar107 = (uVar107 & 0xffffffff) / 10000;
                  iVar137 = (int)uVar107;
                  iVar135 = iVar137 * -10000 + uVar138;
                  iVar146 = (int)(uVar107 * 0x28f5d >> 0x18);
                  uVar147 = (uint)(iVar146 * 0x29) >> 0xc;
                  uVar155 = uVar147 * -100 + iVar146;
                  uVar131 = iVar146 * -100 + iVar137;
                  *(byte *)((long)puVar151 + lVar136 + uVar122 + lVar133) = (char)uVar147 + 0x30;
                  uVar125 = (ulong)(uVar138 >= 100000000);
                  uVar107 = (ulong)(uVar155 < 10 && uVar138 < 100000000);
                  *(undefined2 *)((long)puVar151 + lVar136 + lVar133 + uVar125 + uVar122) =
                       *(undefined2 *)(digit_table + uVar107 + uVar155 * 2);
                  *(undefined2 *)
                   ((long)puVar151 + lVar136 + 2 + ((lVar133 + uVar125) - uVar107) + uVar122) =
                       *(undefined2 *)(digit_table + uVar131 * 2);
                  lVar116 = -uVar107;
                  iVar137 = (int)uVar120;
                  if (iVar137 == 0) {
                    if (iVar135 == 0) {
                      uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar155];
                      if (uVar131 != 0) {
                        uVar120 = 0;
                      }
                      uVar120 = uVar120 + (byte)dec_trailing_zero_table[uVar131];
                      lStack_120 = 4;
                      goto LAB_00f229d5;
                    }
                    uVar131 = (uint)(iVar135 * 0x147b) >> 0x13;
                    uVar138 = uVar131 * -100 + iVar135;
                    lVar144 = lVar133 + lVar116 + uVar125 + uVar122;
                    *(undefined2 *)((long)puVar151 + lVar136 + 4 + lVar144) =
                         *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                    *(undefined2 *)((long)puVar151 + lVar136 + 6 + lVar144) =
                         *(undefined2 *)(digit_table + uVar138 * 2);
                    uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar131] + 2;
                    if (uVar138 != 0) {
                      uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar138];
                    }
                    uVar120 = 8 - uVar120;
                  }
                  else {
                    uVar155 = (uint)(iVar135 * 0x147b) >> 0x13;
                    lVar144 = lVar133 + lVar116 + uVar125 + uVar122;
                    uVar131 = (uint)((uVar120 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar138 = uVar131 >> 8;
                    uVar147 = uVar138 * 0x147b >> 0x13;
                    uVar120 = (ulong)uVar147;
                    *(undefined2 *)((long)puVar151 + lVar136 + 4 + lVar144) =
                         *(undefined2 *)(digit_table + (ulong)uVar155 * 2);
                    uVar138 = uVar147 * -100 + uVar138;
                    *(undefined2 *)((long)puVar151 + lVar136 + 6 + lVar144) =
                         *(undefined2 *)(digit_table + (uVar155 * 0x7fffff9c + iVar135) * 2);
                    *(undefined2 *)((long)puVar151 + lVar136 + 8 + lVar144) =
                         *(undefined2 *)(digit_table + uVar120 * 2);
                    *(undefined2 *)((long)puVar151 + lVar136 + 10 + lVar144) =
                         *(undefined2 *)(digit_table + uVar138 * 2);
                    lStack_120 = 0xc;
                    iVar137 = (uVar131 >> 8) * -10000 + iVar137;
                    if (iVar137 != 0) {
                      uVar131 = (uint)(iVar137 * 0x147b) >> 0x13;
                      uVar120 = (ulong)uVar131;
                      uVar138 = uVar131 * -100 + iVar137;
                      *(undefined2 *)((long)puVar151 + lVar136 + 0xc + lVar144) =
                           *(undefined2 *)(digit_table + uVar120 * 2);
                      *(undefined2 *)((long)puVar151 + lVar136 + 0xe + lVar144) =
                           *(undefined2 *)(digit_table + uVar138 * 2);
                      lStack_120 = 0x10;
                    }
                    uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar120] + 2;
                    if (uVar138 != 0) {
                      uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar138];
                    }
LAB_00f229d5:
                    uVar120 = lStack_120 - uVar120;
                  }
                  *pbVar154 = 0x30;
                  *(byte *)((long)puVar151 + lVar136 + 1 + lVar133) = 0x2e;
                  for (uVar107 = 0;
                      pbVar154 = (byte *)((long)puVar151 +
                                         (uVar120 & 0xffffffff) +
                                         lVar136 + uVar125 + uVar122 + lVar116 + lVar133),
                      -uVar141 != uVar107; uVar107 = uVar107 + 1) {
                    *(byte *)((long)puVar158 + uVar107 + lVar133) = 0x30;
                  }
                }
                else {
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = uVar120;
                  uVar107 = SUB168(auVar12 / ZEXT816(100000000),0);
                  uVar120 = uVar107 * 0xfa0a1f00 + uVar120;
                  uVar131 = SUB164(auVar12 / ZEXT816(100000000),0);
                  uVar107 = (uVar107 & 0xffffffff) / 10000;
                  iVar137 = (int)uVar107;
                  iVar146 = iVar137 * -10000 + uVar131;
                  iVar135 = (int)(uVar107 * 0x28f5d >> 0x18);
                  uVar155 = (uint)(iVar135 * 0x29) >> 0xc;
                  uVar147 = uVar155 * -100 + iVar135;
                  uVar138 = iVar135 * -100 + iVar137;
                  pbVar154[0x10] = 0x30;
                  pbVar154[0x11] = 0x30;
                  pbVar154[0x12] = 0x30;
                  pbVar154[0x13] = 0x30;
                  pbVar154[0x14] = 0x30;
                  pbVar154[0x15] = 0x30;
                  pbVar154[0x16] = 0x30;
                  pbVar154[0x17] = 0x30;
                  pbVar154[0] = 0x30;
                  pbVar154[1] = 0x30;
                  pbVar154[2] = 0x30;
                  pbVar154[3] = 0x30;
                  pbVar154[4] = 0x30;
                  pbVar154[5] = 0x30;
                  pbVar154[6] = 0x30;
                  pbVar154[7] = 0x30;
                  pbVar154[8] = 0x30;
                  pbVar154[9] = 0x30;
                  pbVar154[10] = 0x30;
                  pbVar154[0xb] = 0x30;
                  pbVar154[0xc] = 0x30;
                  pbVar154[0xd] = 0x30;
                  pbVar154[0xe] = 0x30;
                  pbVar154[0xf] = 0x30;
                  *(byte *)((long)puVar151 + lVar136 + 1 + lVar133) = (char)uVar155 + 0x30;
                  uVar107 = (ulong)(uVar131 >= 100000000);
                  uVar125 = (ulong)(uVar147 < 10 && uVar131 < 100000000);
                  *(undefined2 *)((long)puVar151 + lVar136 + 1 + lVar133 + uVar107) =
                       *(undefined2 *)(digit_table + uVar125 + uVar147 * 2);
                  *(undefined2 *)((long)puVar151 + lVar136 + 3 + ((lVar133 + uVar107) - uVar125)) =
                       *(undefined2 *)(digit_table + uVar138 * 2);
                  lVar116 = -uVar125;
                  iVar137 = (int)uVar120;
                  if (iVar137 == 0) {
                    if (iVar146 == 0) {
                      uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar147];
                      if (uVar138 != 0) {
                        uVar120 = 0;
                      }
                      uVar120 = 4 - (uVar120 + (byte)dec_trailing_zero_table[uVar138]);
                    }
                    else {
                      uVar131 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar138 = uVar131 * -100 + iVar146;
                      lVar144 = uVar107 + lVar133 + lVar116;
                      *(undefined2 *)((long)puVar151 + lVar136 + 5 + lVar144) =
                           *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                      *(undefined2 *)((long)puVar151 + lVar136 + 7 + lVar144) =
                           *(undefined2 *)(digit_table + uVar138 * 2);
                      uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar131] + 2;
                      if (uVar138 != 0) {
                        uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar138];
                      }
                      uVar120 = 8 - uVar120;
                    }
                  }
                  else {
                    uVar138 = (uint)(iVar146 * 0x147b) >> 0x13;
                    uVar131 = (uint)((uVar120 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar155 = uVar131 >> 8;
                    uVar147 = uVar155 * 0x147b >> 0x13;
                    uVar120 = (ulong)uVar147;
                    uVar131 = uVar147 * -100 + (uVar131 >> 8);
                    lVar145 = uVar107 + lVar133 + lVar116;
                    *(undefined2 *)((long)puVar151 + lVar136 + 5 + lVar145) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)((long)puVar151 + lVar136 + 7 + lVar145) =
                         *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar146) * 2);
                    *(undefined2 *)((long)puVar151 + lVar136 + 9 + lVar145) =
                         *(undefined2 *)(digit_table + uVar120 * 2);
                    *(undefined2 *)((long)puVar151 + lVar136 + 0xb + lVar145) =
                         *(undefined2 *)(digit_table + uVar131 * 2);
                    lVar144 = 0xc;
                    iVar137 = uVar155 * -10000 + iVar137;
                    if (iVar137 != 0) {
                      uVar131 = (uint)(iVar137 * 0x147b) >> 0x13;
                      uVar120 = (ulong)uVar131;
                      uVar131 = uVar131 * -100 + iVar137;
                      *(undefined2 *)((long)puVar151 + lVar136 + 0xd + lVar145) =
                           *(undefined2 *)(digit_table + uVar120 * 2);
                      *(undefined2 *)((long)puVar151 + lVar136 + 0xf + lVar145) =
                           *(undefined2 *)(digit_table + uVar131 * 2);
                      lVar144 = 0x10;
                    }
                    uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar120] + 2;
                    if (uVar131 != 0) {
                      uVar120 = (ulong)(byte)dec_trailing_zero_table[uVar131];
                    }
                    uVar120 = lVar144 - uVar120;
                  }
                  pbVar113 = (byte *)((long)puVar151 +
                                     lVar136 + (uVar120 & 0xffffffff) + lVar116 + lVar133 + uVar107
                                     + 1);
                  for (uVar120 = 0; uVar141 != uVar120; uVar120 = uVar120 + 1) {
                    *(byte *)((long)puVar126 + uVar120 + lVar133) =
                         *(byte *)((long)puVar126 + uVar120 + lVar133 + 1);
                  }
                  pbVar111 = (byte *)((long)puVar151 + lVar136 + lVar133 + (ulong)uVar141);
                  pbVar154 = pbVar111 + 2;
                  *pbVar111 = 0x2e;
                  if (pbVar154 < pbVar113) {
                    pbVar154 = pbVar113;
                  }
                }
              }
              else {
                auVar13._8_8_ = 0;
                auVar13._0_8_ = uVar120;
                uVar125 = SUB168(auVar13 / ZEXT816(100000000),0);
                uVar147 = SUB164(auVar13 / ZEXT816(100000000),0);
                lVar116 = 2 - (ulong)(uVar147 < 100000000);
                uVar107 = (uVar125 & 0xffffffff) / 10000;
                iVar137 = (int)uVar107;
                iVar146 = iVar137 * -10000 + uVar147;
                uVar120 = uVar125 * 0xfa0a1f00 + uVar120;
                iVar135 = (int)(uVar107 * 0x28f5d >> 0x18);
                uVar131 = (uint)(iVar135 * 0x29) >> 0xc;
                uVar155 = uVar131 * -100 + iVar135;
                uVar138 = iVar135 * -100 + iVar137;
                *(byte *)((long)puVar151 + lVar136 + 1 + lVar133) = (char)uVar131 + 0x30;
                lVar144 = lVar133 + lVar116;
                uVar107 = (ulong)(uVar155 < 10 && uVar147 < 100000000);
                *(undefined2 *)((long)puVar151 + lVar136 + lVar144) =
                     *(undefined2 *)(digit_table + uVar107 + uVar155 * 2);
                *(undefined2 *)((long)puVar151 + lVar136 + 2 + (lVar144 - uVar107)) =
                     *(undefined2 *)(digit_table + uVar138 * 2);
                lVar145 = -uVar107;
                iVar137 = (int)uVar120;
                if (iVar137 == 0) {
                  if (iVar146 == 0) {
                    uVar131 = (uint)(byte)dec_trailing_zero_table[uVar155];
                    if (uVar138 != 0) {
                      uVar131 = 0;
                    }
                    uVar131 = uVar131 + (byte)dec_trailing_zero_table[uVar138];
                    iVar137 = 4;
                  }
                  else {
                    uVar131 = (uint)(iVar146 * 0x147b) >> 0x13;
                    uVar138 = uVar131 * -100 + iVar146;
                    *(undefined2 *)((long)puVar151 + lVar136 + 4 + lVar145 + lVar144) =
                         *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                    *(undefined2 *)((long)puVar151 + lVar136 + 6 + lVar145 + lVar144) =
                         *(undefined2 *)(digit_table + uVar138 * 2);
                    uVar131 = (byte)dec_trailing_zero_table[uVar131] + 2;
                    if (uVar138 != 0) {
                      uVar131 = (uint)(byte)dec_trailing_zero_table[uVar138];
                    }
                    iVar137 = 8;
                  }
                  uVar131 = iVar137 - uVar131;
                }
                else {
                  uVar156 = (uint)(iVar146 * 0x147b) >> 0x13;
                  uVar131 = (uint)((uVar120 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar138 = uVar131 >> 8;
                  uVar155 = uVar138 * 0x147b >> 0x13;
                  uVar147 = uVar155 * -100 + (uVar131 >> 8);
                  lVar117 = lVar145 + lVar144;
                  *(undefined2 *)((long)puVar151 + lVar136 + 4 + lVar117) =
                       *(undefined2 *)(digit_table + (ulong)uVar156 * 2);
                  *(undefined2 *)((long)puVar151 + lVar136 + 6 + lVar117) =
                       *(undefined2 *)(digit_table + (uVar156 * 0x7fffff9c + iVar146) * 2);
                  *(undefined2 *)((long)puVar151 + lVar136 + 8 + lVar117) =
                       *(undefined2 *)(digit_table + (ulong)uVar155 * 2);
                  *(undefined2 *)((long)puVar151 + lVar136 + 10 + lVar117) =
                       *(undefined2 *)(digit_table + uVar147 * 2);
                  iVar137 = uVar138 * -10000 + iVar137;
                  if (iVar137 == 0) {
                    uVar131 = (byte)dec_trailing_zero_table[uVar155] + 2;
                    if (uVar147 != 0) {
                      uVar131 = (uint)(byte)dec_trailing_zero_table[uVar147];
                    }
                    iVar137 = 0xc;
                  }
                  else {
                    uVar131 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar138 = uVar131 * -100 + iVar137;
                    *(undefined2 *)((long)puVar151 + lVar136 + 0xc + lVar117) =
                         *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                    *(undefined2 *)((long)puVar151 + lVar136 + 0xe + lVar117) =
                         *(undefined2 *)(digit_table + uVar138 * 2);
                    uVar131 = (byte)dec_trailing_zero_table[uVar131] + 2;
                    if (uVar138 != 0) {
                      uVar131 = (uint)(byte)dec_trailing_zero_table[uVar138];
                    }
                    iVar137 = 0x10;
                  }
                  uVar131 = iVar137 - uVar131;
                }
                uVar125 = (ulong)uVar131;
                uVar120 = (ulong)((lVar116 - uVar107) + uVar125 == 2);
                lVar117 = -uVar120;
                lVar116 = (lVar144 - uVar120) + lVar145 + uVar125;
                uVar141 = uVar141 - 1;
                *pbVar154 = *(byte *)((long)puVar151 + lVar136 + lVar133 + 1);
                *(byte *)((long)puVar151 + lVar136 + lVar133 + 1) = 0x2e;
                pbVar154 = (byte *)((long)puVar151 + lVar136 + lVar116);
                pbVar154[0] = 0x65;
                pbVar154[1] = 0x2d;
                uVar120 = (ulong)(uVar141 >> 0x1f);
                lVar116 = uVar120 + lVar116;
                uVar131 = -uVar141;
                if (0 < (int)uVar141) {
                  uVar131 = uVar141;
                }
                if (99 < uVar131) {
                  *(byte *)((long)puVar151 + lVar136 + lVar116 + 1) =
                       (char)(uVar131 * 0x290 >> 0x10) + 0x30;
                  uVar112 = *(undefined2 *)
                             (digit_table + ((uVar131 * 0x290 >> 0x10) * 0x7fffff9c + uVar131) * 2);
                  pbVar154 = (byte *)((long)puVar151 +
                                     lVar136 + lVar117 + lVar144 + uVar120 + lVar145 + uVar125 + 4);
                  goto LAB_00f22f35;
                }
                *(undefined2 *)((long)puVar151 + lVar136 + lVar116 + 1) =
                     *(undefined2 *)(digit_table + (ulong)(uVar131 < 10) + (ulong)uVar131 * 2);
                pbVar154 = (byte *)((long)puVar151 +
                                   lVar136 + ((lVar144 + uVar120 + lVar117) - (ulong)(uVar131 < 10))
                                             + lVar145 + uVar125 + 3);
              }
            }
          }
        }
LAB_00f230d6:
        pbVar154[0] = 0x2c;
        pbVar154[1] = 10;
        puVar151 = (uint *)(pbVar154 + 2);
      }
      else if (((uint)uVar120 & 7) == 5) {
        uVar125 = uVar120 >> 8;
        uVar107 = 0x10;
        if ((uVar141 & uVar131) == 0) {
          uVar107 = uVar152;
        }
        pbVar154 = (byte *)(pyVar124->uni).str;
        uVar107 = uVar107 + uVar125 * 6;
        if (local_e8 <= (ulong *)(uVar107 + (long)puVar151)) {
          uVar122 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar107) {
            uVar122 = uVar107;
          }
          sVar128 = (uVar122 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar113 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar128);
          if (pbVar113 == (byte *)0x0) goto LAB_00f26ca3;
          sVar123 = (long)local_a8 - (long)local_e8;
          memmove(pbVar113 + (sVar128 - sVar123),pbVar113 + ((long)local_e8 - (long)local_100),
                  sVar123);
          puVar151 = (uint *)(pbVar113 + ((long)puVar151 - (long)local_100));
          local_a8 = (ulong *)(pbVar113 + sVar128);
          local_100 = pbVar113;
          local_e8 = (ulong *)(pbVar113 + (sVar128 - sVar123));
          local_d8 = (uint *)sVar128;
        }
        lVar133 = 0;
        if ((uVar141 & uVar131) == 0) {
          lVar133 = lVar134;
        }
        while (lVar133 != 0) {
          *puVar151 = 0x20202020;
          puVar151 = (uint *)((long)puVar151 + lVar127);
          lVar133 = lVar133 + -1;
        }
        if ((puVar130 != enc_table_cpy) || ((pyVar124->tag & 0x18) == 0)) {
          puVar126 = (uint *)(pbVar154 + uVar125);
          *(byte *)puVar151 = 0x22;
LAB_00f217d2:
          lVar136 = (long)puVar126 - (long)pbVar154;
          lVar133 = 0;
          while( true ) {
            puVar121 = (uint *)(pbVar154 + lVar133);
            puVar114 = (uint *)((long)puVar151 + lVar133 + 1);
            if (lVar136 < 0x10) break;
            bVar153 = (byte)*puVar121;
            if (puVar130[bVar153] != '\0') {
              puVar121 = (uint *)(pbVar154 + lVar133);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 1);
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 1]] != '\0') {
              puVar121 = (uint *)(pbVar154 + lVar133);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 1);
              goto LAB_00f21f36;
            }
            if (puVar130[pbVar154[lVar133 + 2]] != '\0') {
              puVar121 = (uint *)(pbVar154 + lVar133);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 1);
              goto LAB_00f219d1;
            }
            if (puVar130[pbVar154[lVar133 + 3]] != '\0') {
              puVar121 = (uint *)(pbVar154 + lVar133);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 1);
              goto LAB_00f219f8;
            }
            if (puVar130[pbVar154[lVar133 + 4]] != '\0') {
              puVar121 = (uint *)(pbVar154 + lVar133 + 4);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 5);
              *(undefined4 *)((long)puVar151 + lVar133 + 1) = *(undefined4 *)(pbVar154 + lVar133);
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 5]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 5);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 6);
              *(byte *)((long)puVar114 + -1) = pbVar154[4];
              *(undefined4 *)((long)puVar114 + -5) = *(undefined4 *)pbVar154;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 6]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 6);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 7);
              *(ushort *)((long)puVar114 + -2) = *(ushort *)(pbVar154 + 4);
              *(undefined4 *)((long)puVar114 + -6) = *(undefined4 *)pbVar154;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 7]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 7);
              uVar4 = *(undefined4 *)pbVar154;
              puVar114 = (uint *)((long)puVar151 + lVar133 + 8);
              *(undefined4 *)((long)puVar151 + lVar133 + 4) = *(undefined4 *)(pbVar154 + 3);
              *(undefined4 *)((long)puVar151 + lVar133 + 1) = uVar4;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 8]] != '\0') {
              puVar121 = (uint *)(pbVar154 + lVar133 + 8);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 9);
              *(undefined8 *)((long)puVar151 + lVar133 + 1) = *(undefined8 *)(pbVar154 + lVar133);
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 9]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 9);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 10);
              *(byte *)((long)puVar114 + -1) = pbVar154[8];
              *(undefined8 *)((long)puVar114 + -9) = *(undefined8 *)pbVar154;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 10]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 10);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 0xb);
              *(ushort *)((long)puVar114 + -2) = *(ushort *)(pbVar154 + 8);
              *(undefined8 *)((long)puVar114 + -10) = *(undefined8 *)pbVar154;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 0xb]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 0xb);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 0xc);
              puVar114[-1] = *(uint *)(pbVar154 + 7);
              *(undefined8 *)((long)puVar114 + -0xb) = *(undefined8 *)pbVar154;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 0xc]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 0xc);
              puVar114 = (uint *)((long)puVar151 + lVar133 + 0xd);
              puVar114[-1] = *(uint *)(pbVar154 + 8);
              *(undefined8 *)(puVar114 + -3) = *(undefined8 *)pbVar154;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 0xd]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 0xd);
              uVar115 = *(undefined8 *)pbVar154;
              puVar114 = (uint *)((long)puVar151 + lVar133 + 0xe);
              *(undefined8 *)((long)puVar151 + lVar133 + 6) = *(undefined8 *)(pbVar154 + 5);
              *(undefined8 *)((long)puVar151 + lVar133 + 1) = uVar115;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 0xe]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 0xe);
              uVar115 = *(undefined8 *)pbVar154;
              puVar114 = (uint *)((long)puVar151 + lVar133 + 0xf);
              *(undefined8 *)((long)puVar151 + lVar133 + 7) = *(undefined8 *)(pbVar154 + 6);
              *(undefined8 *)((long)puVar151 + lVar133 + 1) = uVar115;
              goto LAB_00f21ba8;
            }
            if (puVar130[pbVar154[lVar133 + 0xf]] != '\0') {
              pbVar154 = pbVar154 + lVar133;
              puVar121 = (uint *)(pbVar154 + 0xf);
              uVar115 = *(undefined8 *)pbVar154;
              puVar114 = (uint *)((long)puVar151 + lVar133 + 0x10);
              *(undefined8 *)((long)puVar151 + lVar133 + 8) = *(undefined8 *)(pbVar154 + 7);
              *(undefined8 *)((long)puVar151 + lVar133 + 1) = uVar115;
              goto LAB_00f21ba8;
            }
            uVar138 = puVar121[1];
            uVar147 = puVar121[2];
            uVar155 = puVar121[3];
            *puVar114 = *puVar121;
            *(uint *)((long)puVar151 + lVar133 + 5) = uVar138;
            *(uint *)((long)puVar151 + lVar133 + 9) = uVar147;
            *(uint *)((long)puVar151 + lVar133 + 0xd) = uVar155;
            lVar133 = lVar133 + 0x10;
            lVar136 = lVar136 + -0x10;
          }
LAB_00f21918:
          if (3 < lVar136) {
            if (puVar130[(byte)*puVar121] == '\0') {
              if (puVar130[*(byte *)((long)puVar121 + 1)] == '\0') {
                if (puVar130[*(byte *)((long)puVar121 + 2)] == '\0') {
                  if (puVar130[*(byte *)((long)puVar121 + 3)] == '\0') goto code_r0x00f21959;
LAB_00f219f8:
                  *(byte *)((long)puVar114 + 2) = *(byte *)((long)puVar121 + 2);
                  *(ushort *)puVar114 = (ushort)*puVar121;
                  puVar114 = (uint *)((long)puVar114 + 3);
                  puVar121 = (uint *)((long)puVar121 + 3);
                }
                else {
LAB_00f219d1:
                  *(ushort *)puVar114 = (ushort)*puVar121;
                  puVar114 = (uint *)((long)puVar114 + 2);
                  puVar121 = (uint *)((long)puVar121 + 2);
                }
              }
              else {
                bVar153 = (byte)*puVar121;
LAB_00f21f36:
                *(byte *)puVar114 = bVar153;
                puVar114 = (uint *)((long)puVar114 + 1);
                puVar121 = (uint *)((long)puVar121 + 1);
              }
            }
            goto LAB_00f21ba8;
          }
          goto LAB_00f21977;
        }
        *(byte *)puVar151 = 0x22;
        pbVar113 = (byte *)((long)puVar151 + 1);
        for (uVar107 = uVar125; 0xf < uVar107; uVar107 = uVar107 - 0x10) {
          uVar4 = *(undefined4 *)(pbVar154 + 4);
          uVar104 = *(undefined4 *)(pbVar154 + 8);
          uVar105 = *(undefined4 *)(pbVar154 + 0xc);
          *(undefined4 *)pbVar113 = *(undefined4 *)pbVar154;
          *(undefined4 *)(pbVar113 + 4) = uVar4;
          *(undefined4 *)(pbVar113 + 8) = uVar104;
          *(undefined4 *)(pbVar113 + 0xc) = uVar105;
          pbVar113 = pbVar113 + 0x10;
          pbVar154 = pbVar154 + 0x10;
        }
        for (uVar125 = uVar125 - (uVar120 >> 8 & 0xfffffffffffff0); 3 < uVar125;
            uVar125 = uVar125 - 4) {
          *(undefined4 *)pbVar113 = *(undefined4 *)pbVar154;
          pbVar113 = pbVar113 + 4;
          pbVar154 = pbVar154 + 4;
        }
        for (uVar120 = 0; uVar125 != uVar120; uVar120 = uVar120 + 1) {
          pbVar113[uVar120] = pbVar154[uVar120];
        }
        puVar114 = (uint *)(pbVar113 + uVar120);
switchD_00f21bd6_default:
        bVar161 = (~uVar141 & uVar131) == 0;
        *(byte *)puVar114 = 0x22;
        bVar153 = 0x3a;
        if (bVar161) {
          bVar153 = 0x2c;
        }
        *(byte *)((long)puVar114 + 1) = bVar153;
        bVar153 = 0x20;
        if (bVar161) {
          bVar153 = 10;
        }
        *(byte *)((long)puVar114 + 2) = bVar153;
        puVar151 = (uint *)((long)puVar114 + 3);
      }
      else if ((~(byte)uVar120 & 6) == 0) {
        if (0xff < uVar120) {
          local_48 = (ulong)(bVar153 == 7);
          if ((uVar141 & uVar131) != 0) {
            uVar109 = 0x20;
          }
          if (local_e8 <= (ulong *)(uVar109 + (long)puVar151)) {
            uVar152 = (ulong)local_d8 >> 1;
            if ((ulong)local_d8 >> 1 <= uVar109) {
              uVar152 = uVar109;
            }
            sVar128 = (uVar152 + 7 & 0xfffffffffffffff8) + (long)local_d8;
            pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar128);
            if (pbVar154 == (byte *)0x0) goto LAB_00f26ca3;
            sVar123 = (long)local_a8 - (long)local_e8;
            memmove(pbVar154 + (sVar128 - sVar123),pbVar154 + ((long)local_e8 - (long)local_100),
                    sVar123);
            puVar151 = (uint *)(pbVar154 + ((long)puVar151 - (long)local_100));
            local_a8 = (ulong *)(pbVar154 + sVar128);
            local_d8 = (uint *)sVar128;
            local_e8 = (ulong *)(pbVar154 + (sVar128 - sVar123));
            local_100 = pbVar154;
          }
          local_e8[-1] = uVar108 + lVar142 * 2;
          local_e8 = local_e8 + -1;
          lVar142 = 0;
          if ((uVar141 & uVar131) == 0) {
            lVar142 = lVar134;
          }
          puVar151 = (uint *)((long)puVar151 + 2);
          while (bVar161 = lVar142 != 0, lVar142 = lVar142 + -1, bVar161) {
            ((ushort *)((long)puVar151 + -2))[0] = 0x2020;
            ((ushort *)((long)puVar151 + -2))[1] = 0x2020;
            puVar151 = (uint *)((long)puVar151 + lVar127);
          }
          lVar142 = (uVar120 >> 8) << (bVar153 == 7);
          lVar134 = lVar134 + 1;
          *(byte *)((long)puVar151 + -2) = (bVar153 == 7) << 5 | 0x5b;
          *(byte *)((long)puVar151 + -1) = 10;
          pyVar124 = pyVar124 + 1;
          goto LAB_00f21239;
        }
        uVar120 = 0x10;
        if ((uVar141 & uVar131) == 0) {
          uVar120 = uVar152;
        }
        if (local_e8 <= (ulong *)(uVar120 + (long)puVar151)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar120) {
            uVar107 = uVar120;
          }
          sVar128 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar128);
          if (pbVar154 == (byte *)0x0) goto LAB_00f26ca3;
          sVar123 = (long)local_a8 - (long)local_e8;
          memmove(pbVar154 + (sVar128 - sVar123),pbVar154 + ((long)local_e8 - (long)local_100),
                  sVar123);
          puVar151 = (uint *)(pbVar154 + ((long)puVar151 - (long)local_100));
          local_a8 = (ulong *)(pbVar154 + sVar128);
          local_d8 = (uint *)sVar128;
          local_e8 = (ulong *)(pbVar154 + (sVar128 - sVar123));
          local_100 = pbVar154;
        }
        lVar133 = 0;
        if ((uVar141 & uVar131) == 0) {
          lVar133 = lVar134;
        }
        puVar151 = puVar151 + 1;
        while (bVar161 = lVar133 != 0, lVar133 = lVar133 + -1, bVar161) {
          puVar151[-1] = 0x20202020;
          puVar151 = (uint *)((long)puVar151 + lVar127);
        }
        bVar153 = (bVar153 == 7) * ' ';
        *(byte *)(puVar151 + -1) = bVar153 + 0x5b;
        *(byte *)((long)puVar151 + -3) = bVar153 | 0x5d;
        *(ushort *)((long)puVar151 + -2) = 0xa2c;
      }
      else if (bVar153 == 1) {
        uVar120 = uVar120 >> 8;
        pvVar9 = (pyVar124->uni).ptr;
        if (local_e8 <= (ulong *)((long)puVar151 + uVar120 + 3)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar120 + 3) {
            uVar107 = uVar120 + 3;
          }
          sVar128 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar128);
          if (pbVar154 == (byte *)0x0) goto LAB_00f26ca3;
          sVar123 = (long)local_a8 - (long)local_e8;
          memmove(pbVar154 + (sVar128 - sVar123),pbVar154 + ((long)local_e8 - (long)local_100),
                  sVar123);
          puVar151 = (uint *)(pbVar154 + ((long)puVar151 - (long)local_100));
          local_a8 = (ulong *)(pbVar154 + sVar128);
          local_e8 = (ulong *)(pbVar154 + (sVar128 - sVar123));
          local_100 = pbVar154;
          local_d8 = (uint *)sVar128;
        }
        switchD_00916250::default(puVar151,pvVar9,uVar120);
        pbVar154 = (byte *)((long)puVar151 + uVar120);
        puVar151 = (uint *)(pbVar154 + 2);
        pbVar154[0] = 0x2c;
        pbVar154[1] = 10;
      }
      else if (bVar153 == 2) {
        uVar120 = 0x10;
        if ((uVar141 & uVar131) == 0) {
          uVar120 = uVar152;
        }
        if (local_e8 <= (ulong *)(uVar120 + (long)puVar151)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar120) {
            uVar107 = uVar120;
          }
          sVar128 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar128);
          if (pbVar154 == (byte *)0x0) goto LAB_00f26ca3;
          sVar123 = (long)local_a8 - (long)local_e8;
          memmove(pbVar154 + (sVar128 - sVar123),pbVar154 + ((long)local_e8 - (long)local_100),
                  sVar123);
          puVar151 = (uint *)(pbVar154 + ((long)puVar151 - (long)local_100));
          local_a8 = (ulong *)(pbVar154 + sVar128);
          local_d8 = (uint *)sVar128;
          local_e8 = (ulong *)(pbVar154 + (sVar128 - sVar123));
          local_100 = pbVar154;
        }
        lVar133 = 0;
        if ((uVar141 & uVar131) == 0) {
          lVar133 = lVar134;
        }
        puVar151 = (uint *)((long)puVar151 + 6);
        while (bVar161 = lVar133 != 0, lVar133 = lVar133 + -1, bVar161) {
          ((ushort *)((long)puVar151 + -6))[0] = 0x2020;
          ((ushort *)((long)puVar151 + -6))[1] = 0x2020;
          puVar151 = (uint *)((long)puVar151 + lVar127);
        }
        puVar158 = (ushort *)((long)puVar151 + -6);
        puVar158[0] = 0x756e;
        puVar158[1] = 0x6c6c;
        puVar158[2] = 0xa2c;
        puVar158[3] = 0;
      }
      else {
        if (bVar153 != 3) goto LAB_00f26d49;
        uVar120 = 0x10;
        if ((uVar141 & uVar131) == 0) {
          uVar120 = uVar152;
        }
        if (local_e8 <= (ulong *)(uVar120 + (long)puVar151)) {
          uVar107 = (ulong)local_d8 >> 1;
          if ((ulong)local_d8 >> 1 <= uVar120) {
            uVar107 = uVar120;
          }
          sVar128 = (uVar107 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar128);
          if (pbVar154 == (byte *)0x0) goto LAB_00f26ca3;
          sVar123 = (long)local_a8 - (long)local_e8;
          memmove(pbVar154 + (sVar128 - sVar123),pbVar154 + ((long)local_e8 - (long)local_100),
                  sVar123);
          puVar151 = (uint *)(pbVar154 + ((long)puVar151 - (long)local_100));
          local_a8 = (ulong *)(pbVar154 + sVar128);
          local_d8 = (uint *)sVar128;
          local_e8 = (ulong *)(pbVar154 + (sVar128 - sVar123));
          local_100 = pbVar154;
        }
        lVar133 = 0;
        if ((uVar141 & uVar131) == 0) {
          lVar133 = lVar134;
        }
        pbVar154 = (byte *)((long)puVar151 + 7);
        while (bVar161 = lVar133 != 0, lVar133 = lVar133 + -1, bVar161) {
          pbVar154[-7] = 0x20;
          pbVar154[-6] = 0x20;
          pbVar154[-5] = 0x20;
          pbVar154[-4] = 0x20;
          pbVar154 = pbVar154 + lVar127;
        }
        bVar161 = (pyVar124->tag & 0x18) != 0;
        uVar115 = 0xa2c65736c6166;
        if (bVar161) {
          uVar115 = 0xa2c65757274;
        }
        *(undefined8 *)(pbVar154 + -7) = uVar115;
        puVar151 = (uint *)(pbVar154 + -(ulong)bVar161);
      }
      pyVar124 = pyVar124 + 1;
      lVar142 = lVar142 + -1;
      puVar126 = local_d8;
      lVar133 = lVar134;
      if (lVar142 == 0) goto LAB_00f23ffb;
      goto LAB_00f2126e;
    }
    if ((flg & 2) == 0) {
      puVar130 = enc_table_cpy;
      puVar157 = enc_table_cpy_slash;
    }
    else {
      puVar130 = enc_table_esc;
      puVar157 = enc_table_esc_slash;
    }
    if ((flg & 4) == 0) {
      puVar157 = puVar130;
    }
    local_f8 = ((val->uni).u64 >> 4) * 0x12 + 0x47 & 0xfffffffffffffff8;
    local_100 = (byte *)(*p_Var5)(pvVar7,local_f8);
    if (local_100 != (byte *)0x0) {
      puVar151 = (uint *)(local_100 + local_f8);
      bVar161 = (~(uint)val->tag & 7) == 0;
      local_78 = (ulong)bVar161;
      lVar134 = (val->tag >> 8) << bVar161;
      puVar126 = (uint *)(local_100 + 1);
      *local_100 = bVar161 << 5 | 0x5b;
      pyVar124 = val + 1;
      local_d8 = puVar151;
LAB_00f24282:
      do {
        uVar150 = local_78 & 0xff;
        do {
          uVar109 = pyVar124->tag;
          bVar153 = (byte)uVar109 & 7;
          local_108 = puVar151;
          if (bVar153 == 4) {
            if (puVar151 <= puVar126 + 8) {
              uVar109 = local_f8 >> 1;
              if (local_f8 >> 1 < 0x21) {
                uVar109 = 0x20;
              }
              sVar128 = (uVar109 + 7 & 0xfffffffffffffff8) + local_f8;
              pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar128);
              if (pbVar154 == (byte *)0x0) goto LAB_00f26cf0;
              local_108 = (uint *)(pbVar154 + (sVar128 - ((long)local_d8 - (long)puVar151)));
              memmove(local_108,pbVar154 + ((long)puVar151 - (long)local_100),
                      (long)local_d8 - (long)puVar151);
              puVar126 = (uint *)(pbVar154 + ((long)puVar126 - (long)local_100));
              local_d8 = (uint *)(pbVar154 + sVar128);
              uVar109 = pyVar124->tag;
              local_100 = pbVar154;
              local_f8 = sVar128;
            }
            uVar152 = (pyVar124->uni).u64;
            uVar141 = (uint)(uVar152 >> 0x20);
            if ((uVar109 & 0x10) == 0) {
              uVar141 = uVar141 >> 0x1f & (uint)(uVar109 >> 3);
              *(byte *)puVar126 = 0x2d;
              uVar109 = -uVar152;
              if (uVar141 == 0) {
                uVar109 = uVar152;
              }
              pbVar154 = (byte *)((ulong)uVar141 + (long)puVar126);
              if (uVar109 < 100000000) {
                if (uVar109 < 100) {
                  *(undefined2 *)pbVar154 =
                       *(undefined2 *)(digit_table + (ulong)(uVar109 < 10) + uVar109 * 2);
                  puVar126 = (uint *)(pbVar154 + (2 - (ulong)(uVar109 < 10)));
                }
                else {
                  iVar137 = (int)uVar109;
                  if (uVar109 < 10000) {
                    uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar109 < 1000);
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
                    *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                    puVar126 = (uint *)(pbVar154 + (4 - uVar109));
                  }
                  else if (uVar109 < 1000000) {
                    iVar137 = (int)(uVar109 * 0x68db9 >> 0x20) * -10000 + iVar137;
                    uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar152 = (ulong)(uVar109 < 100000);
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)(digit_table + uVar152 + (uVar109 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar154 + (2 - uVar152)) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pbVar154 + (4 - uVar152)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                    puVar126 = (uint *)(pbVar154 + (6 - uVar152));
                  }
                  else {
                    uVar141 = (uint)(uVar109 * 0x68db8bb >> 0x20);
                    uVar131 = uVar141 >> 8;
                    iVar137 = uVar131 * -10000 + iVar137;
                    uVar131 = uVar131 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar109 < 10000000);
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)(digit_table + uVar109 + (ulong)uVar131 * 2);
                    *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)(pbVar154 + (6 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
                    puVar126 = (uint *)(pbVar154 + (8 - uVar109));
                  }
                }
              }
              else {
                auVar18._8_8_ = 0;
                auVar18._0_8_ = uVar109;
                lVar127 = SUB168(auVar18 / ZEXT816(100000000),0);
                uVar152 = lVar127 * 0xfa0a1f00 + uVar109;
                iVar137 = SUB164(auVar18 / ZEXT816(100000000),0);
                if (uVar109 < 10000000000000000) {
                  if (uVar109 < 10000000000) {
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)(digit_table + (ulong)(uVar109 < 1000000000) + lVar127 * 2);
                    pbVar154 = pbVar154 + (2 - (ulong)(uVar109 < 1000000000));
                  }
                  else if (uVar109 < 1000000000000) {
                    uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar109 >> 0xb < 0x2e90edd);
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
                    *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                    pbVar154 = pbVar154 + (4 - uVar109);
                  }
                  else if (uVar109 < 100000000000000) {
                    iVar137 = (int)((ulong)(lVar127 * 0x68db9) >> 0x20) * -10000 + iVar137;
                    uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar109 >> 0xd < 0x48c27395);
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)
                          (digit_table + uVar109 + ((ulong)(lVar127 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                    pbVar154 = pbVar154 + (6 - uVar109);
                  }
                  else {
                    uVar141 = (uint)((ulong)(lVar127 * 0x68db8bb) >> 0x20);
                    uVar131 = uVar141 >> 8;
                    iVar137 = uVar131 * -10000 + iVar137;
                    uVar131 = uVar131 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar109 < 1000000000000000);
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)(digit_table + uVar109 + (ulong)uVar131 * 2);
                    *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)(pbVar154 + (6 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
                    pbVar154 = pbVar154 + (8 - uVar109);
                  }
                  uVar141 = (uint)((uVar152 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar131 = uVar141 >> 8;
                  iVar137 = uVar131 * -10000 + (int)uVar152;
                  uVar131 = uVar131 * 0x147b >> 0x13;
                  uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                  *(undefined2 *)(pbVar154 + 2) =
                       *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                  *(undefined2 *)(pbVar154 + 4) = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                  *(undefined2 *)(pbVar154 + 6) =
                       *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar137) * 2);
                  puVar126 = (uint *)(pbVar154 + 8);
                }
                else {
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = uVar109;
                  lVar127 = SUB168(auVar19 / ZEXT816(1000000000000),0);
                  iVar135 = SUB164(auVar19 / ZEXT816(1000000000000),0);
                  if (uVar109 < 1000000000000000000) {
                    uVar108 = lVar127 * 0x68db9;
                    iVar146 = (int)(uVar108 >> 0x20) * -10000 + iVar135;
                    uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar109 < 100000000000000000);
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)(digit_table + uVar109 + (uVar108 >> 0x20) * 2);
                    *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
                    lVar127 = 6 - uVar109;
                  }
                  else {
                    uVar141 = (uint)((ulong)(lVar127 * 0x68db8bb) >> 0x20);
                    uVar131 = uVar141 >> 8;
                    iVar146 = uVar131 * -10000 + iVar135;
                    uVar131 = uVar131 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar146 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar109 < 10000000000000000000);
                    *(undefined2 *)pbVar154 =
                         *(undefined2 *)(digit_table + uVar109 + (ulong)uVar131 * 2);
                    *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)(pbVar154 + (6 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar138 * -100 + iVar146) * 2);
                    lVar127 = 8 - uVar109;
                  }
                  pbVar154 = pbVar154 + lVar127;
                  iVar137 = iVar137 + iVar135 * -10000;
                  uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  *(undefined2 *)(pbVar154 + 2) =
                       *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar137) * 2);
                  uVar141 = (uint)((uVar152 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar131 = uVar141 >> 8;
                  iVar137 = uVar131 * -10000 + (int)uVar152;
                  uVar131 = uVar131 * 0x147b >> 0x13;
                  uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                  *(undefined2 *)(pbVar154 + 4) = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                  *(undefined2 *)(pbVar154 + 6) =
                       *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                  *(undefined2 *)(pbVar154 + 8) = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                  *(undefined2 *)(pbVar154 + 10) =
                       *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar137) * 2);
                  puVar126 = (uint *)(pbVar154 + 0xc);
                }
              }
            }
            else {
              uVar109 = uVar152 & 0xfffffffffffff;
              uVar141 = uVar141 >> 0x14 & 0x7ff;
              if (uVar141 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) goto LAB_00f26d85;
                  if (uVar109 == 0) {
                    *(byte *)puVar126 = 0x2d;
                    puVar159 = (undefined8 *)((long)puVar126 - ((long)uVar152 >> 0x3f));
                    *puVar159 = 0x7974696e69666e49;
                    puVar126 = (uint *)(puVar159 + 1);
                  }
                  else {
                    *puVar126 = 0x4e614e;
                    puVar126 = (uint *)((long)puVar126 + 3);
                  }
                }
                else {
                  *puVar126 = 0x6c6c756e;
                  puVar126 = puVar126 + 1;
                }
              }
              else {
                *(byte *)puVar126 = 0x2d;
                lVar127 = -((long)uVar152 >> 0x3f);
                puVar1 = (undefined4 *)((long)puVar126 + lVar127);
                if ((uVar152 & 0x7fffffffffffffff) == 0) {
                  *puVar1 = 0x302e30;
                  puVar126 = (uint *)((long)puVar1 + 3);
                }
                else if (uVar141 == 0) {
                  uVar152 = (ulong)((uint)uVar152 & 1);
                  uVar109 = uVar109 * 0x20;
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = uVar109 - 0x10;
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = SUB168(auVar50 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = uVar109 - 0x10;
                  auVar95 = auVar51 * ZEXT816(0x9e19db92b4e31ba9) + auVar95;
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar109;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = SUB168(auVar52 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = uVar109;
                  auVar96 = auVar53 * ZEXT816(0x9e19db92b4e31ba9) + auVar96;
                  uVar108 = auVar96._8_8_;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = uVar109 + 0x10;
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ = SUB168(auVar54 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = uVar109 + 0x10;
                  auVar97 = auVar55 * ZEXT816(0x9e19db92b4e31ba9) + auVar97;
                  uVar109 = ((ulong)((auVar95 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar95._8_8_) + uVar152;
                  uVar152 = ((ulong)((auVar97 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar97._8_8_) - uVar152;
                  if (uVar108 < 0x28) {
LAB_00f2637c:
                    uVar120 = (auVar96 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0 | uVar108;
                    uVar107 = uVar108 & 0x7ffffffffffffffc;
                    bVar161 = true;
                    if (uVar120 <= (uVar107 | 2)) {
                      bVar161 = (bool)((byte)((uVar108 & 0xffffffff) >> 2) & 0x3f &
                                      uVar120 == (uVar107 | 2));
                    }
                    uVar120 = uVar108 >> 2;
                    bVar160 = uVar107 + 4 <= uVar152;
                    if (uVar107 < uVar109 == bVar160) {
                      bVar161 = bVar160;
                    }
                    iVar137 = -0x144;
                  }
                  else {
                    uVar120 = uVar108 / 0x28;
                    bVar161 = uVar120 * 0x28 + 0x28 <= uVar152;
                    if (uVar120 * 0x28 < uVar109 != bVar161) goto LAB_00f2637c;
                    iVar137 = -0x143;
                  }
                  uVar120 = bVar161 + uVar120;
                  pcVar110 = (char *)((long)puVar1 + 1);
                  if (uVar120 < 1000000000000000) {
                    iVar135 = (int)uVar120;
                    if (uVar120 < 100000000) {
                      if (uVar120 < 100) {
                        *(undefined2 *)pcVar110 =
                             *(undefined2 *)(digit_table + (ulong)(uVar120 < 10) + uVar120 * 2);
                        pcVar110 = pcVar110 + (2 - (ulong)(uVar120 < 10));
                      }
                      else if (uVar120 < 10000) {
                        uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar120 < 1000);
                        *(undefined2 *)pcVar110 =
                             *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
                        *(undefined2 *)(pcVar110 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                        pcVar110 = pcVar110 + (4 - uVar109);
                      }
                      else {
                        if (999999 < uVar120) {
                          uVar141 = (uint)(uVar120 * 0x68db8bb >> 0x20);
                          uVar131 = uVar141 >> 8;
                          iVar135 = uVar131 * -10000 + iVar135;
                          uVar131 = uVar131 * 0x147b >> 0x13;
                          uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
                          *(undefined2 *)pcVar110 =
                               *(undefined2 *)
                                (digit_table + (ulong)(uVar120 < 10000000) + (ulong)uVar131 * 2);
                          pcVar110 = pcVar110 + -(ulong)(uVar120 < 10000000);
                          *(undefined2 *)(pcVar110 + 2) =
                               *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                          *(undefined2 *)(pcVar110 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                          uVar112 = *(undefined2 *)(digit_table + (uVar138 * -100 + iVar135) * 2);
                          goto LAB_00f26a53;
                        }
                        iVar135 = (int)(uVar120 * 0x68db9 >> 0x20) * -10000 + iVar135;
                        uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar120 < 100000);
                        *(undefined2 *)pcVar110 =
                             *(undefined2 *)
                              (digit_table + uVar109 + (uVar120 * 0x68db9 >> 0x20) * 2);
                        *(undefined2 *)(pcVar110 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                        *(undefined2 *)(pcVar110 + (4 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                        pcVar110 = pcVar110 + (6 - uVar109);
                      }
                    }
                    else {
                      auVar25._8_8_ = 0;
                      auVar25._0_8_ = uVar120;
                      lVar127 = SUB168(auVar25 / ZEXT816(100000000),0);
                      iVar146 = SUB164(auVar25 / ZEXT816(100000000),0);
                      if (uVar120 < 10000000000) {
                        *(undefined2 *)pcVar110 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar120 < 1000000000) + lVar127 * 2);
                        pcVar110 = pcVar110 + (2 - (ulong)(uVar120 < 1000000000));
                      }
                      else if (uVar120 < 1000000000000) {
                        uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar120 >> 0xb < 0x2e90edd);
                        *(undefined2 *)pcVar110 =
                             *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
                        *(undefined2 *)(pcVar110 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
                        pcVar110 = pcVar110 + (4 - uVar109);
                      }
                      else if (uVar120 < 100000000000000) {
                        iVar148 = (int)((ulong)(lVar127 * 0x68db9) >> 0x20) * -10000 + iVar146;
                        uVar141 = (uint)(iVar148 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar120 >> 0xd < 0x48c27395);
                        *(undefined2 *)pcVar110 =
                             *(undefined2 *)
                              (digit_table + uVar109 + ((ulong)(lVar127 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)(pcVar110 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                        *(undefined2 *)(pcVar110 + (4 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar148) * 2);
                        pcVar110 = pcVar110 + (6 - uVar109);
                      }
                      else {
                        uVar141 = (uint)((ulong)(lVar127 * 0x68db8bb) >> 0x20);
                        uVar131 = uVar141 >> 8;
                        iVar148 = uVar131 * -10000 + iVar146;
                        uVar131 = uVar131 * 0x147b >> 0x13;
                        uVar138 = (uint)(iVar148 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar1 + 1) =
                             *(undefined2 *)(digit_table + (ulong)uVar131 * 2 + 1);
                        *(undefined2 *)((long)puVar1 + 2) =
                             *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                        *(undefined2 *)(puVar1 + 1) =
                             *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                        *(undefined2 *)((long)puVar1 + 6) =
                             *(undefined2 *)(digit_table + (uVar138 * -100 + iVar148) * 2);
                        pcVar110 = (char *)(puVar1 + 2);
                      }
                      uVar131 = iVar146 * -100000000 + iVar135;
                      uVar141 = (uint)((ulong)uVar131 * 0x68db8bb >> 0x20);
                      uVar138 = uVar141 >> 8;
                      iVar135 = uVar138 * -10000 + uVar131;
                      uVar131 = uVar138 * 0x147b >> 0x13;
                      uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
                      *(undefined2 *)pcVar110 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                      *(undefined2 *)(pcVar110 + 2) =
                           *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                      *(undefined2 *)(pcVar110 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                      uVar112 = *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar135) * 2);
LAB_00f26a53:
                      *(undefined2 *)(pcVar110 + 6) = uVar112;
                      pcVar110 = pcVar110 + 8;
                    }
                  }
                  else {
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = uVar120;
                    uVar109 = SUB168(auVar24 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                              uVar120 / 100000000;
                    uVar152 = (uVar120 / 100000000) * 0xfa0a1f00 + uVar120;
                    *pcVar110 = SUB161(auVar24 / ZEXT816(10000000000000000),0) + '0';
                    pcVar110 = pcVar110 + (9999999999999999 < uVar120);
                    uVar141 = (uint)((uVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar131 = uVar141 >> 8;
                    iVar135 = uVar131 * -10000 + (int)uVar109;
                    uVar131 = uVar131 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
                    *(undefined2 *)pcVar110 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                    *(undefined2 *)(pcVar110 + 2) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)(pcVar110 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)(pcVar110 + 6) =
                         *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar135) * 2);
                    uVar141 = (uint)((uVar152 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar131 = uVar141 >> 8;
                    iVar135 = uVar131 * -10000 + (int)uVar152;
                    uVar131 = uVar131 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
                    *(undefined2 *)(pcVar110 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                    *(undefined2 *)(pcVar110 + 10) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)(pcVar110 + 0xc) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)(pcVar110 + 0xe) =
                         *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar135) * 2);
                    pcVar110 = pcVar110 + 0x10;
                  }
                  *(undefined1 *)puVar1 = *(undefined1 *)((long)puVar1 + 1);
                  *(undefined1 *)((long)puVar1 + 1) = 0x2e;
                  lVar127 = 0;
                  do {
                    lVar142 = lVar127 + -1;
                    lVar127 = lVar127 + -1;
                  } while (pcVar110[lVar142] == '0');
                  iVar137 = ((int)pcVar110 - (int)puVar1) + iVar137 + -2;
                  pcVar110 = pcVar110 + lVar127 + (ulong)(pcVar110[lVar142] != '.');
                  pcVar110[0] = 'e';
                  pcVar110[1] = '-';
                  uVar141 = iVar137 * -0x290;
                  pcVar110[2] = (char)(uVar141 >> 0x10) + '0';
                  *(undefined2 *)(pcVar110 + 3) =
                       *(undefined2 *)(digit_table + ((uVar141 >> 0x10) * 0x7fffff9c - iVar137) * 2)
                  ;
                  puVar126 = (uint *)(pcVar110 + 5);
                }
                else {
                  uVar108 = uVar109 + 0x10000000000000;
                  if (uVar141 - 0x3ff < 0x35) {
                    lVar142 = 0;
                    if (uVar108 != 0) {
                      for (; (uVar108 >> lVar142 & 1) == 0; lVar142 = lVar142 + 1) {
                      }
                    }
                    if ((uint)lVar142 < 0x433 - uVar141) goto LAB_00f24562;
                    uVar108 = uVar108 >> ((byte)(0x433 - uVar141) & 0x3f);
                    iVar137 = (int)uVar108;
                    if (uVar108 < 100000000) {
                      if (uVar108 < 100) {
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)(digit_table + (ulong)(uVar108 < 10) + uVar108 * 2);
                        pcVar110 = (char *)((long)puVar1 + (2 - (ulong)(uVar108 < 10)));
                      }
                      else if (uVar108 < 10000) {
                        uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar108 < 1000);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                        pcVar110 = (char *)((long)puVar1 + (4 - uVar109));
                      }
                      else {
                        if (999999 < uVar108) {
                          uVar141 = (uint)(uVar108 * 0x68db8bb >> 0x20);
                          uVar131 = uVar141 >> 8;
                          iVar137 = uVar131 * -10000 + iVar137;
                          uVar131 = uVar131 * 0x147b >> 0x13;
                          uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)
                                (digit_table + (ulong)(uVar108 < 10000000) + (ulong)uVar131 * 2);
                          puVar139 = (undefined2 *)((long)puVar1 - (ulong)(uVar108 < 10000000));
                          puVar139[1] = *(undefined2 *)
                                         (digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                          puVar139[2] = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                          uVar112 = *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
                          goto LAB_00f2603a;
                        }
                        iVar137 = (int)(uVar108 * 0x68db9 >> 0x20) * -10000 + iVar137;
                        uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar108 < 100000);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + uVar109 + (uVar108 * 0x68db9 >> 0x20) * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                        *(undefined2 *)((long)puVar1 + (4 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                        pcVar110 = (char *)((long)puVar1 + (6 - uVar109));
                      }
                    }
                    else {
                      auVar23._8_8_ = 0;
                      auVar23._0_8_ = uVar108;
                      lVar127 = SUB168(auVar23 / ZEXT816(100000000),0);
                      iVar135 = SUB164(auVar23 / ZEXT816(100000000),0);
                      if (uVar108 < 10000000000) {
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar108 < 1000000000) + lVar127 * 2);
                        puVar139 = (undefined2 *)
                                   ((long)puVar1 + (2 - (ulong)(uVar108 < 1000000000)));
                      }
                      else if (uVar108 < 1000000000000) {
                        uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar108 >> 0xb < 0x2e90edd);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                        puVar139 = (undefined2 *)((long)puVar1 + (4 - uVar109));
                      }
                      else if (uVar108 < 100000000000000) {
                        iVar146 = (int)((ulong)(lVar127 * 0x68db9) >> 0x20) * -10000 + iVar135;
                        uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar108 >> 0xd < 0x48c27395);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + uVar109 + ((ulong)(lVar127 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                        *(undefined2 *)((long)puVar1 + (4 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
                        puVar139 = (undefined2 *)((long)puVar1 + (6 - uVar109));
                      }
                      else {
                        uVar141 = (uint)((ulong)(lVar127 * 0x68db8bb) >> 0x20);
                        uVar131 = uVar141 >> 8;
                        iVar146 = uVar131 * -10000 + iVar135;
                        uVar131 = uVar131 * 0x147b >> 0x13;
                        uVar138 = (uint)(iVar146 * 0x147b) >> 0x13;
                        uVar109 = (ulong)(uVar108 < 1000000000000000);
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)(digit_table + uVar109 + (ulong)uVar131 * 2);
                        *(undefined2 *)((long)puVar1 + (2 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                        *(undefined2 *)((long)puVar1 + (4 - uVar109)) =
                             *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                        *(undefined2 *)((long)puVar1 + (6 - uVar109)) =
                             *(undefined2 *)(digit_table + (uVar138 * -100 + iVar146) * 2);
                        puVar139 = (undefined2 *)((long)puVar1 + (8 - uVar109));
                      }
                      uVar131 = iVar135 * -100000000 + iVar137;
                      uVar141 = (uint)((ulong)uVar131 * 0x68db8bb >> 0x20);
                      uVar138 = uVar141 >> 8;
                      iVar137 = uVar138 * -10000 + uVar131;
                      uVar131 = uVar138 * 0x147b >> 0x13;
                      uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                      *puVar139 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                      puVar139[1] = *(undefined2 *)
                                     (digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                      puVar139[2] = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                      uVar112 = *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar137) * 2);
LAB_00f2603a:
                      puVar139[3] = uVar112;
                      pcVar110 = (char *)(puVar139 + 4);
                    }
                    pcVar110[0] = '.';
                    pcVar110[1] = '0';
LAB_00f26049:
                    puVar126 = (uint *)(pcVar110 + 2);
                  }
                  else {
LAB_00f24562:
                    uVar152 = (ulong)((uint)uVar152 & 1);
                    iVar137 = uVar141 * 0x4d105 + -0x200a5;
                    if (uVar141 == 1 || uVar109 != 0) {
                      iVar137 = uVar141 * 0x4d105;
                    }
                    iVar137 = iVar137 + -0x1439b7ff >> 0x14;
                    uVar120 = *(ulong *)(pow10_sig_table + (ulong)(iVar137 * -2 + 0x2ae) * 8);
                    uVar125 = *(long *)(pow10_sig_table + (ulong)(iVar137 * -2 + 0x2af) * 8) +
                              (ulong)(iVar137 - 1U < 0xffffffc8);
                    bVar153 = ((char)((uint)(iVar137 * -0x3526b) >> 0x10) + (char)uVar141) - 0x32;
                    uVar109 = (ulong)(uVar141 != 1 && uVar109 == 0) + uVar108 * 4 + -2 <<
                              (bVar153 & 0x3f);
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = uVar125;
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = uVar109;
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = SUB168(auVar44 * auVar74,8);
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = uVar120;
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar109;
                    auVar92 = auVar45 * auVar75 + auVar92;
                    uVar109 = uVar108 * 4 << (bVar153 & 0x3f);
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar125;
                    auVar76._8_8_ = 0;
                    auVar76._0_8_ = uVar109;
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = SUB168(auVar46 * auVar76,8);
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = uVar120;
                    auVar77._8_8_ = 0;
                    auVar77._0_8_ = uVar109;
                    auVar93 = auVar47 * auVar77 + auVar93;
                    uVar107 = auVar93._8_8_;
                    uVar109 = uVar108 * 4 + 2 << (bVar153 & 0x3f);
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = uVar125;
                    auVar78._8_8_ = 0;
                    auVar78._0_8_ = uVar109;
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = SUB168(auVar48 * auVar78,8);
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar120;
                    auVar79._8_8_ = 0;
                    auVar79._0_8_ = uVar109;
                    auVar94 = auVar49 * auVar79 + auVar94;
                    uVar109 = ((ulong)((auVar92 & (undefined1  [16])0xfffffffffffffffe) !=
                                      (undefined1  [16])0x0) | auVar92._8_8_) + uVar152;
                    uVar152 = ((ulong)((auVar94 & (undefined1  [16])0xfffffffffffffffe) !=
                                      (undefined1  [16])0x0) | auVar94._8_8_) - uVar152;
                    if (uVar107 < 0x28) {
LAB_00f246a6:
                      uVar120 = (auVar93 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0 | uVar107;
                      uVar108 = uVar107 & 0xfffffffffffffffc;
                      bVar161 = true;
                      if (uVar120 <= uVar108 + 2) {
                        bVar161 = (bool)((byte)((uVar107 & 0xffffffff) >> 2) & 0x3f &
                                        uVar120 == uVar108 + 2);
                      }
                      bVar160 = uVar108 + 4 <= uVar152;
                      if (uVar108 < uVar109 == bVar160) {
                        bVar161 = bVar160;
                      }
                      uVar109 = (ulong)bVar161 + (uVar107 >> 2);
                    }
                    else {
                      uVar120 = (uVar107 / 0x28) * 0x28;
                      uVar108 = uVar120 + 0x28;
                      if (uVar120 < uVar109 != uVar108 <= uVar152) goto LAB_00f246a6;
                      uVar109 = (uVar107 / 0x28 + 1) - (ulong)(uVar152 < uVar108);
                      iVar137 = iVar137 + 1;
                    }
                    iVar135 = (0x11 - (uint)(uVar109 < 10000000000000000)) -
                              (uint)(uVar109 < 1000000000000000);
                    uVar141 = iVar135 + iVar137;
                    if (iVar135 + iVar137 + 5U < 0x1b) {
                      if ((int)uVar141 < 1) {
                        auVar22._8_8_ = 0;
                        auVar22._0_8_ = uVar109;
                        uVar108 = SUB168(auVar22 / ZEXT816(100000000),0);
                        uVar138 = SUB164(auVar22 / ZEXT816(100000000),0);
                        puVar139 = (undefined2 *)
                                   ((long)puVar1 +
                                   (((ulong)(2 - uVar141) + 1) - (ulong)(uVar138 < 100000000)));
                        uVar152 = (uVar108 & 0xffffffff) / 10000;
                        iVar146 = (int)(uVar152 * 0x28f5d >> 0x18);
                        uVar131 = (uint)(iVar146 * 0x29) >> 0xc;
                        *(char *)((long)puVar1 + (ulong)(2 - uVar141)) = (char)uVar131 + '0';
                        iVar137 = (int)uVar152;
                        iVar135 = iVar137 * -10000 + uVar138;
                        uVar109 = uVar108 * 0xfa0a1f00 + uVar109;
                        uVar147 = uVar131 * -100 + iVar146;
                        uVar131 = iVar146 * -100 + iVar137;
                        uVar152 = (ulong)(uVar147 < 10 && uVar138 < 100000000);
                        *puVar139 = *(undefined2 *)(digit_table + uVar152 + uVar147 * 2);
                        *(undefined2 *)((long)puVar139 + (2 - uVar152)) =
                             *(undefined2 *)(digit_table + uVar131 * 2);
                        iVar137 = (int)uVar109;
                        if (iVar137 == 0) {
                          if (iVar135 == 0) {
                            uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar147];
                            if (uVar131 != 0) {
                              uVar109 = 0;
                            }
                            uVar109 = uVar109 + (byte)dec_trailing_zero_table[uVar131];
                            lStack_120 = 4;
                          }
                          else {
                            uVar131 = (uint)(iVar135 * 0x147b) >> 0x13;
                            uVar138 = uVar131 * -100 + iVar135;
                            *(undefined2 *)((long)puVar139 + (4 - uVar152)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                            *(undefined2 *)((long)puVar139 + (6 - uVar152)) =
                                 *(undefined2 *)(digit_table + uVar138 * 2);
                            uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar131] + 2;
                            if (uVar138 != 0) {
                              uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar138];
                            }
                            lStack_120 = 8;
                          }
                          uVar109 = lStack_120 - uVar109;
                        }
                        else {
                          uVar147 = (uint)(iVar135 * 0x147b) >> 0x13;
                          uVar131 = (uint)((uVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar155 = uVar131 >> 8;
                          uVar138 = uVar155 * 0x147b >> 0x13;
                          uVar109 = (ulong)uVar138;
                          uVar131 = uVar138 * -100 + (uVar131 >> 8);
                          *(undefined2 *)((long)puVar139 + (4 - uVar152)) =
                               *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
                          *(undefined2 *)((long)puVar139 + (6 - uVar152)) =
                               *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar135) * 2);
                          *(undefined2 *)((long)puVar139 + (8 - uVar152)) =
                               *(undefined2 *)(digit_table + uVar109 * 2);
                          *(undefined2 *)((long)puVar139 + (10 - uVar152)) =
                               *(undefined2 *)(digit_table + uVar131 * 2);
                          lVar127 = 0xc;
                          iVar137 = uVar155 * -10000 + iVar137;
                          if (iVar137 != 0) {
                            uVar131 = (uint)(iVar137 * 0x147b) >> 0x13;
                            uVar109 = (ulong)uVar131;
                            uVar131 = uVar131 * -100 + iVar137;
                            *(undefined2 *)((long)puVar139 + (0xc - uVar152)) =
                                 *(undefined2 *)(digit_table + uVar109 * 2);
                            *(undefined2 *)((long)puVar139 + (0xe - uVar152)) =
                                 *(undefined2 *)(digit_table + uVar131 * 2);
                            lVar127 = 0x10;
                          }
                          uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar109] + 2;
                          if (uVar131 != 0) {
                            uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar131];
                          }
                          uVar109 = lVar127 - uVar109;
                        }
                        *(undefined2 *)puVar1 = 0x2e30;
                        for (uVar108 = 0;
                            puVar126 = (uint *)((long)puVar139 + ((uVar109 & 0xffffffff) - uVar152))
                            , -uVar141 != uVar108; uVar108 = uVar108 + 1) {
                          *(undefined1 *)((long)puVar1 + uVar108 + 2) = 0x30;
                        }
                      }
                      else {
                        auVar20._8_8_ = 0;
                        auVar20._0_8_ = uVar109;
                        uVar108 = SUB168(auVar20 / ZEXT816(100000000),0);
                        uVar138 = SUB164(auVar20 / ZEXT816(100000000),0);
                        puVar139 = (undefined2 *)((long)puVar1 + (2 - (ulong)(uVar138 < 100000000)))
                        ;
                        uVar152 = (uVar108 & 0xffffffff) / 10000;
                        iVar137 = (int)uVar152;
                        iVar146 = iVar137 * -10000 + uVar138;
                        uVar109 = uVar108 * 0xfa0a1f00 + uVar109;
                        iVar135 = (int)(uVar152 * 0x28f5d >> 0x18);
                        uVar155 = (uint)(iVar135 * 0x29) >> 0xc;
                        uVar147 = uVar155 * -100 + iVar135;
                        uVar131 = iVar135 * -100 + iVar137;
                        *puVar1 = 0x30303030;
                        puVar1[1] = 0x30303030;
                        puVar1[2] = 0x30303030;
                        puVar1[3] = 0x30303030;
                        *(undefined8 *)(puVar1 + 4) = 0x3030303030303030;
                        *(char *)((long)puVar1 + 1) = (char)uVar155 + '0';
                        uVar152 = (ulong)(uVar147 < 10 && uVar138 < 100000000);
                        *puVar139 = *(undefined2 *)(digit_table + uVar152 + uVar147 * 2);
                        *(undefined2 *)((long)puVar139 + (2 - uVar152)) =
                             *(undefined2 *)(digit_table + uVar131 * 2);
                        iVar137 = (int)uVar109;
                        if (iVar137 == 0) {
                          if (iVar146 == 0) {
                            uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar147];
                            if (uVar131 != 0) {
                              uVar109 = 0;
                            }
                            uVar109 = 4 - (uVar109 + (byte)dec_trailing_zero_table[uVar131]);
                          }
                          else {
                            uVar131 = (uint)(iVar146 * 0x147b) >> 0x13;
                            uVar138 = uVar131 * -100 + iVar146;
                            *(undefined2 *)((long)puVar139 + (4 - uVar152)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                            *(undefined2 *)((long)puVar139 + (6 - uVar152)) =
                                 *(undefined2 *)(digit_table + uVar138 * 2);
                            uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar131] + 2;
                            if (uVar138 != 0) {
                              uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar138];
                            }
                            uVar109 = 8 - uVar109;
                          }
                        }
                        else {
                          uVar147 = (uint)(iVar146 * 0x147b) >> 0x13;
                          uVar131 = (uint)((uVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar155 = uVar131 >> 8;
                          uVar138 = uVar155 * 0x147b >> 0x13;
                          uVar109 = (ulong)uVar138;
                          uVar131 = uVar138 * -100 + (uVar131 >> 8);
                          *(undefined2 *)((long)puVar139 + (4 - uVar152)) =
                               *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
                          *(undefined2 *)((long)puVar139 + (6 - uVar152)) =
                               *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar146) * 2);
                          *(undefined2 *)((long)puVar139 + (8 - uVar152)) =
                               *(undefined2 *)(digit_table + uVar109 * 2);
                          *(undefined2 *)((long)puVar139 + (10 - uVar152)) =
                               *(undefined2 *)(digit_table + uVar131 * 2);
                          lVar142 = 0xc;
                          iVar137 = uVar155 * -10000 + iVar137;
                          if (iVar137 != 0) {
                            uVar131 = (uint)(iVar137 * 0x147b) >> 0x13;
                            uVar109 = (ulong)uVar131;
                            uVar131 = uVar131 * -100 + iVar137;
                            *(undefined2 *)((long)puVar139 + (0xc - uVar152)) =
                                 *(undefined2 *)(digit_table + uVar109 * 2);
                            *(undefined2 *)((long)puVar139 + (0xe - uVar152)) =
                                 *(undefined2 *)(digit_table + uVar131 * 2);
                            lVar142 = 0x10;
                          }
                          uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar109] + 2;
                          if (uVar131 != 0) {
                            uVar109 = (ulong)(byte)dec_trailing_zero_table[uVar131];
                          }
                          uVar109 = lVar142 - uVar109;
                        }
                        puVar151 = (uint *)((long)puVar139 + ((uVar109 & 0xffffffff) - uVar152));
                        for (uVar109 = 0; uVar141 != uVar109; uVar109 = uVar109 + 1) {
                          *(byte *)((long)puVar126 + uVar109 + lVar127) =
                               *(byte *)((long)puVar126 + uVar109 + lVar127 + 1);
                        }
                        puVar130 = (undefined1 *)((ulong)uVar141 + (long)puVar1);
                        puVar126 = (uint *)(puVar130 + 2);
                        *puVar130 = 0x2e;
                        if (puVar126 < puVar151) {
                          puVar126 = puVar151;
                        }
                      }
                    }
                    else {
                      auVar21._8_8_ = 0;
                      auVar21._0_8_ = uVar109;
                      uVar108 = SUB168(auVar21 / ZEXT816(100000000),0);
                      uVar138 = SUB164(auVar21 / ZEXT816(100000000),0);
                      lVar127 = 2 - (ulong)(uVar138 < 100000000);
                      uVar152 = (uVar108 & 0xffffffff) / 10000;
                      iVar137 = (int)uVar152;
                      iVar146 = iVar137 * -10000 + uVar138;
                      uVar109 = uVar108 * 0xfa0a1f00 + uVar109;
                      iVar135 = (int)(uVar152 * 0x28f5d >> 0x18);
                      uVar155 = (uint)(iVar135 * 0x29) >> 0xc;
                      uVar147 = uVar155 * -100 + iVar135;
                      uVar131 = iVar135 * -100 + iVar137;
                      *(char *)((long)puVar1 + 1) = (char)uVar155 + '0';
                      uVar152 = (ulong)(uVar147 < 10 && uVar138 < 100000000);
                      *(undefined2 *)((long)puVar1 + lVar127) =
                           *(undefined2 *)(digit_table + uVar152 + uVar147 * 2);
                      lVar127 = lVar127 - uVar152;
                      *(undefined2 *)((long)puVar1 + lVar127 + 2) =
                           *(undefined2 *)(digit_table + uVar131 * 2);
                      iVar137 = (int)uVar109;
                      if (iVar137 == 0) {
                        if (iVar146 == 0) {
                          uVar138 = (uint)(byte)dec_trailing_zero_table[uVar147];
                          if (uVar131 != 0) {
                            uVar138 = 0;
                          }
                          uVar131 = 4 - (uVar138 + (byte)dec_trailing_zero_table[uVar131]);
                        }
                        else {
                          uVar131 = (uint)(iVar146 * 0x147b) >> 0x13;
                          uVar138 = uVar131 * -100 + iVar146;
                          *(undefined2 *)((long)puVar1 + lVar127 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                          *(undefined2 *)((long)puVar1 + lVar127 + 6) =
                               *(undefined2 *)(digit_table + uVar138 * 2);
                          uVar131 = (byte)dec_trailing_zero_table[uVar131] + 2;
                          if (uVar138 != 0) {
                            uVar131 = (uint)(byte)dec_trailing_zero_table[uVar138];
                          }
                          uVar131 = 8 - uVar131;
                        }
                      }
                      else {
                        uVar155 = (uint)(iVar146 * 0x147b) >> 0x13;
                        uVar131 = (uint)((uVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar156 = uVar131 >> 8;
                        uVar147 = uVar156 * 0x147b >> 0x13;
                        uVar138 = uVar147 * -100 + (uVar131 >> 8);
                        *(undefined2 *)((long)puVar1 + lVar127 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar155 * 2);
                        *(undefined2 *)((long)puVar1 + lVar127 + 6) =
                             *(undefined2 *)(digit_table + (uVar155 * 0x7fffff9c + iVar146) * 2);
                        *(undefined2 *)((long)puVar1 + lVar127 + 8) =
                             *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
                        *(undefined2 *)((long)puVar1 + lVar127 + 10) =
                             *(undefined2 *)(digit_table + uVar138 * 2);
                        iVar137 = uVar156 * -10000 + iVar137;
                        if (iVar137 == 0) {
                          uVar131 = (byte)dec_trailing_zero_table[uVar147] + 2;
                          if (uVar138 != 0) {
                            uVar131 = (uint)(byte)dec_trailing_zero_table[uVar138];
                          }
                          uVar131 = 0xc - uVar131;
                        }
                        else {
                          uVar131 = (uint)(iVar137 * 0x147b) >> 0x13;
                          uVar138 = uVar131 * -100 + iVar137;
                          *(undefined2 *)((long)puVar1 + lVar127 + 0xc) =
                               *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                          *(undefined2 *)((long)puVar1 + lVar127 + 0xe) =
                               *(undefined2 *)(digit_table + uVar138 * 2);
                          uVar131 = (byte)dec_trailing_zero_table[uVar131] + 2;
                          if (uVar138 != 0) {
                            uVar131 = (uint)(byte)dec_trailing_zero_table[uVar138];
                          }
                          uVar131 = 0x10 - uVar131;
                        }
                      }
                      puVar139 = (undefined2 *)
                                 ((long)puVar1 +
                                 (((ulong)uVar131 + lVar127) -
                                 (ulong)((ulong)uVar131 + lVar127 == 2)));
                      uVar141 = uVar141 - 1;
                      *(undefined1 *)puVar1 = *(undefined1 *)((long)puVar1 + 1);
                      *(undefined1 *)((long)puVar1 + 1) = 0x2e;
                      *puVar139 = 0x2d65;
                      uVar138 = uVar141 >> 0x1f;
                      pcVar110 = (char *)((long)puVar139 + (ulong)uVar138 + 1);
                      uVar131 = -uVar141;
                      if (0 < (int)uVar141) {
                        uVar131 = uVar141;
                      }
                      if (uVar131 < 100) {
                        *(undefined2 *)pcVar110 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar131 < 10) + (ulong)uVar131 * 2);
                        pcVar110 = pcVar110 + -(ulong)(uVar131 < 10);
                        goto LAB_00f26049;
                      }
                      *pcVar110 = (char)(uVar131 * 0x290 >> 0x10) + '0';
                      *(undefined2 *)((long)puVar139 + (ulong)uVar138 + 2) =
                           *(undefined2 *)
                            (digit_table + ((uVar131 * 0x290 >> 0x10) * 0x7fffff9c + uVar131) * 2);
                      puVar126 = (uint *)((long)puVar139 + (ulong)uVar138 + 4);
                    }
                  }
                }
              }
            }
            *(byte *)puVar126 = 0x2c;
            puVar126 = (uint *)((long)puVar126 + 1);
          }
          else if (((uint)uVar109 & 7) == 5) {
            uVar152 = uVar109 >> 8;
            pbVar154 = (byte *)(pyVar124->uni).str;
            if (puVar151 <= (uint *)((long)puVar126 + uVar152 * 6 + 0x10)) {
              uVar120 = uVar152 * 6 + 0x10;
              uVar108 = local_f8 >> 1;
              if (local_f8 >> 1 <= uVar120) {
                uVar108 = uVar120;
              }
              sVar128 = (uVar108 + 7 & 0xfffffffffffffff8) + local_f8;
              pbVar113 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar128);
              if (pbVar113 == (byte *)0x0) goto LAB_00f26cf0;
              local_108 = (uint *)(pbVar113 + (sVar128 - ((long)local_d8 - (long)puVar151)));
              memmove(local_108,pbVar113 + ((long)puVar151 - (long)local_100),
                      (long)local_d8 - (long)puVar151);
              puVar126 = (uint *)(pbVar113 + ((long)puVar126 - (long)local_100));
              local_d8 = (uint *)(pbVar113 + sVar128);
              local_100 = pbVar113;
              local_f8 = sVar128;
            }
            if ((puVar157 != enc_table_cpy) || ((pyVar124->tag & 0x18) == 0)) {
              puVar151 = (uint *)(pbVar154 + uVar152);
              *(byte *)puVar126 = 0x22;
LAB_00f2470b:
              lVar142 = (long)puVar151 - (long)pbVar154;
              lVar127 = 0;
              while( true ) {
                puVar121 = (uint *)(pbVar154 + lVar127);
                puVar114 = (uint *)((long)puVar126 + lVar127 + 1);
                if (lVar142 < 0x10) break;
                bVar153 = (byte)*puVar121;
                if (puVar157[bVar153] != '\0') {
                  puVar121 = (uint *)(pbVar154 + lVar127);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 1);
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 1]] != '\0') {
                  puVar121 = (uint *)(pbVar154 + lVar127);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 1);
                  goto LAB_00f24edf;
                }
                if (puVar157[pbVar154[lVar127 + 2]] != '\0') {
                  puVar121 = (uint *)(pbVar154 + lVar127);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 1);
                  goto LAB_00f24906;
                }
                if (puVar157[pbVar154[lVar127 + 3]] != '\0') {
                  puVar121 = (uint *)(pbVar154 + lVar127);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 1);
                  goto LAB_00f24931;
                }
                if (puVar157[pbVar154[lVar127 + 4]] != '\0') {
                  puVar121 = (uint *)(pbVar154 + lVar127 + 4);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 5);
                  *(undefined4 *)((long)puVar126 + lVar127 + 1) =
                       *(undefined4 *)(pbVar154 + lVar127);
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 5]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 5);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 6);
                  *(byte *)((long)puVar114 + -1) = pbVar154[4];
                  *(undefined4 *)((long)puVar114 + -5) = *(undefined4 *)pbVar154;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 6]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 6);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 7);
                  *(ushort *)((long)puVar114 + -2) = *(ushort *)(pbVar154 + 4);
                  *(undefined4 *)((long)puVar114 + -6) = *(undefined4 *)pbVar154;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 7]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 7);
                  uVar4 = *(undefined4 *)pbVar154;
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 8);
                  *(undefined4 *)((long)puVar126 + lVar127 + 4) = *(undefined4 *)(pbVar154 + 3);
                  *(undefined4 *)((long)puVar126 + lVar127 + 1) = uVar4;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 8]] != '\0') {
                  puVar121 = (uint *)(pbVar154 + lVar127 + 8);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 9);
                  *(undefined8 *)((long)puVar126 + lVar127 + 1) =
                       *(undefined8 *)(pbVar154 + lVar127);
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 9]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 9);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 10);
                  *(byte *)((long)puVar114 + -1) = pbVar154[8];
                  *(undefined8 *)((long)puVar114 + -9) = *(undefined8 *)pbVar154;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 10]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 10);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 0xb);
                  *(ushort *)((long)puVar114 + -2) = *(ushort *)(pbVar154 + 8);
                  *(undefined8 *)((long)puVar114 + -10) = *(undefined8 *)pbVar154;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 0xb]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 0xb);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 0xc);
                  puVar114[-1] = *(uint *)(pbVar154 + 7);
                  *(undefined8 *)((long)puVar114 + -0xb) = *(undefined8 *)pbVar154;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 0xc]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 0xc);
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 0xd);
                  puVar114[-1] = *(uint *)(pbVar154 + 8);
                  *(undefined8 *)(puVar114 + -3) = *(undefined8 *)pbVar154;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 0xd]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 0xd);
                  uVar115 = *(undefined8 *)pbVar154;
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 0xe);
                  *(undefined8 *)((long)puVar126 + lVar127 + 6) = *(undefined8 *)(pbVar154 + 5);
                  *(undefined8 *)((long)puVar126 + lVar127 + 1) = uVar115;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 0xe]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 0xe);
                  uVar115 = *(undefined8 *)pbVar154;
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 0xf);
                  *(undefined8 *)((long)puVar126 + lVar127 + 7) = *(undefined8 *)(pbVar154 + 6);
                  *(undefined8 *)((long)puVar126 + lVar127 + 1) = uVar115;
                  goto LAB_00f24adb;
                }
                if (puVar157[pbVar154[lVar127 + 0xf]] != '\0') {
                  pbVar154 = pbVar154 + lVar127;
                  puVar121 = (uint *)(pbVar154 + 0xf);
                  uVar115 = *(undefined8 *)pbVar154;
                  puVar114 = (uint *)((long)puVar126 + lVar127 + 0x10);
                  *(undefined8 *)((long)puVar126 + lVar127 + 8) = *(undefined8 *)(pbVar154 + 7);
                  *(undefined8 *)((long)puVar126 + lVar127 + 1) = uVar115;
                  goto LAB_00f24adb;
                }
                uVar141 = puVar121[1];
                uVar131 = puVar121[2];
                uVar138 = puVar121[3];
                *puVar114 = *puVar121;
                *(uint *)((long)puVar126 + lVar127 + 5) = uVar141;
                *(uint *)((long)puVar126 + lVar127 + 9) = uVar131;
                *(uint *)((long)puVar126 + lVar127 + 0xd) = uVar138;
                lVar127 = lVar127 + 0x10;
                lVar142 = lVar142 + -0x10;
              }
LAB_00f24845:
              if (3 < lVar142) {
                if (puVar157[(byte)*puVar121] == '\0') {
                  if (puVar157[*(byte *)((long)puVar121 + 1)] == '\0') {
                    if (puVar157[*(byte *)((long)puVar121 + 2)] == '\0') {
                      if (puVar157[*(byte *)((long)puVar121 + 3)] == '\0') goto code_r0x00f24886;
LAB_00f24931:
                      *(byte *)((long)puVar114 + 2) = *(byte *)((long)puVar121 + 2);
                      *(ushort *)puVar114 = (ushort)*puVar121;
                      puVar114 = (uint *)((long)puVar114 + 3);
                      puVar121 = (uint *)((long)puVar121 + 3);
                    }
                    else {
LAB_00f24906:
                      *(ushort *)puVar114 = (ushort)*puVar121;
                      puVar114 = (uint *)((long)puVar114 + 2);
                      puVar121 = (uint *)((long)puVar121 + 2);
                    }
                  }
                  else {
                    bVar153 = (byte)*puVar121;
LAB_00f24edf:
                    *(byte *)puVar114 = bVar153;
                    puVar114 = (uint *)((long)puVar114 + 1);
                    puVar121 = (uint *)((long)puVar121 + 1);
                  }
                }
                goto LAB_00f24adb;
              }
              goto LAB_00f248a0;
            }
            *(byte *)puVar126 = 0x22;
            pbVar113 = (byte *)((long)puVar126 + 1);
            for (uVar108 = uVar152; 0xf < uVar108; uVar108 = uVar108 - 0x10) {
              uVar4 = *(undefined4 *)(pbVar154 + 4);
              uVar104 = *(undefined4 *)(pbVar154 + 8);
              uVar105 = *(undefined4 *)(pbVar154 + 0xc);
              *(undefined4 *)pbVar113 = *(undefined4 *)pbVar154;
              *(undefined4 *)(pbVar113 + 4) = uVar4;
              *(undefined4 *)(pbVar113 + 8) = uVar104;
              *(undefined4 *)(pbVar113 + 0xc) = uVar105;
              pbVar113 = pbVar113 + 0x10;
              pbVar154 = pbVar154 + 0x10;
            }
            for (uVar152 = uVar152 - (uVar109 >> 8 & 0xfffffffffffff0); 3 < uVar152;
                uVar152 = uVar152 - 4) {
              *(undefined4 *)pbVar113 = *(undefined4 *)pbVar154;
              pbVar113 = pbVar113 + 4;
              pbVar154 = pbVar154 + 4;
            }
            for (uVar109 = 0; uVar152 != uVar109; uVar109 = uVar109 + 1) {
              pbVar113[uVar109] = pbVar154[uVar109];
            }
            puVar114 = (uint *)(pbVar113 + uVar109);
switchD_00f24b06_default:
            local_e8._0_4_ = (uint)uVar150;
            bVar153 = 0x3a;
            if ((~(uint)lVar134 & (uint)local_e8) == 0) {
              bVar153 = 0x2c;
            }
            *(byte *)puVar114 = 0x22;
            *(byte *)((long)puVar114 + 1) = bVar153;
            puVar126 = (uint *)((long)puVar114 + 2);
          }
          else if ((~(byte)uVar109 & 6) == 0) {
            if (puVar151 <= puVar126 + 4) {
              uVar152 = local_f8 >> 1;
              if (local_f8 >> 1 < 0x11) {
                uVar152 = 0x10;
              }
              sVar128 = (uVar152 + 7 & 0xfffffffffffffff8) + local_f8;
              pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar128);
              if (pbVar154 == (byte *)0x0) goto LAB_00f26cf0;
              sVar123 = (long)local_d8 - (long)puVar151;
              memmove(pbVar154 + (sVar128 - sVar123),pbVar154 + ((long)puVar151 - (long)local_100),
                      sVar123);
              puVar126 = (uint *)(pbVar154 + ((long)puVar126 - (long)local_100));
              local_d8 = (uint *)(pbVar154 + sVar128);
              puVar151 = (uint *)(pbVar154 + (sVar128 - sVar123));
              local_f8 = sVar128;
              local_100 = pbVar154;
            }
            if (0xff < uVar109) {
              bVar161 = bVar153 == 7;
              local_78 = (ulong)bVar161;
              *(ulong *)(puVar151 + -2) = uVar150 + lVar134 * 2;
              lVar134 = (uVar109 >> 8) << bVar161;
              puVar151 = puVar151 + -2;
              *(byte *)puVar126 = bVar161 << 5 | 0x5b;
              puVar126 = (uint *)((long)puVar126 + 1);
              pyVar124 = pyVar124 + 1;
              goto LAB_00f24282;
            }
            bVar153 = (bVar153 == 7) * ' ';
            *(byte *)puVar126 = bVar153 + 0x5b;
            *(byte *)((long)puVar126 + 1) = bVar153 | 0x5d;
            *(byte *)((long)puVar126 + 2) = 0x2c;
            puVar126 = (uint *)((long)puVar126 + 3);
            local_108 = puVar151;
          }
          else if (bVar153 == 1) {
            uVar109 = uVar109 >> 8;
            pvVar9 = (pyVar124->uni).ptr;
            if (puVar151 <= (uint *)((long)puVar126 + uVar109 + 2)) {
              uVar152 = local_f8 >> 1;
              if (local_f8 >> 1 <= uVar109 + 2) {
                uVar152 = uVar109 + 2;
              }
              sVar128 = (uVar152 + 7 & 0xfffffffffffffff8) + local_f8;
              pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar128);
              if (pbVar154 == (byte *)0x0) goto LAB_00f26cf0;
              sVar123 = (long)local_d8 - (long)puVar151;
              memmove(pbVar154 + (sVar128 - sVar123),pbVar154 + ((long)puVar151 - (long)local_100),
                      sVar123);
              puVar126 = (uint *)(pbVar154 + ((long)puVar126 - (long)local_100));
              local_d8 = (uint *)(pbVar154 + sVar128);
              local_108 = (uint *)(pbVar154 + (sVar128 - sVar123));
              local_100 = pbVar154;
              local_f8 = sVar128;
            }
            switchD_00916250::default(puVar126,pvVar9,uVar109);
            pbVar154 = (byte *)((long)puVar126 + uVar109);
            puVar126 = (uint *)(pbVar154 + 1);
            *pbVar154 = 0x2c;
          }
          else {
            uVar141 = (uint)uVar109 & 7;
            if (uVar141 == 2) {
              if (puVar151 <= puVar126 + 4) {
                uVar109 = local_f8 >> 1;
                if (local_f8 >> 1 < 0x11) {
                  uVar109 = 0x10;
                }
                sVar128 = (uVar109 + 7 & 0xfffffffffffffff8) + local_f8;
                pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar128);
                if (pbVar154 == (byte *)0x0) goto LAB_00f26cf0;
                local_108 = (uint *)(pbVar154 + (sVar128 - ((long)local_d8 - (long)puVar151)));
                memmove(local_108,pbVar154 + ((long)puVar151 - (long)local_100),
                        (long)local_d8 - (long)puVar151);
                puVar126 = (uint *)(pbVar154 + ((long)puVar126 - (long)local_100));
                local_d8 = (uint *)(pbVar154 + sVar128);
                local_100 = pbVar154;
                local_f8 = sVar128;
              }
              puVar126[0] = 0x6c6c756e;
              puVar126[1] = 0xa2c;
              puVar126 = (uint *)((long)puVar126 + 5);
            }
            else {
              if (uVar141 != 3) goto LAB_00f26d49;
              if (puVar151 <= puVar126 + 4) {
                uVar109 = local_f8 >> 1;
                if (local_f8 >> 1 < 0x11) {
                  uVar109 = 0x10;
                }
                sVar128 = (uVar109 + 7 & 0xfffffffffffffff8) + local_f8;
                pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,sVar128);
                if (pbVar154 == (byte *)0x0) goto LAB_00f26cf0;
                local_108 = (uint *)(pbVar154 + (sVar128 - ((long)local_d8 - (long)puVar151)));
                memmove(local_108,pbVar154 + ((long)puVar151 - (long)local_100),
                        (long)local_d8 - (long)puVar151);
                puVar126 = (uint *)(pbVar154 + ((long)puVar126 - (long)local_100));
                local_d8 = (uint *)(pbVar154 + sVar128);
                uVar109 = pyVar124->tag;
                local_100 = pbVar154;
                local_f8 = sVar128;
              }
              bVar161 = (uVar109 & 0x18) != 0;
              uVar115 = 0xa2c65736c6166;
              if (bVar161) {
                uVar115 = 0xa2c65757274;
              }
              *(undefined8 *)puVar126 = uVar115;
              puVar126 = (uint *)((long)puVar126 + (6 - (ulong)bVar161));
            }
          }
          pyVar124 = pyVar124 + 1;
          lVar134 = lVar134 + -1;
          puVar151 = local_108;
        } while (lVar134 != 0);
        lVar127 = 0;
        lVar142 = 0;
        do {
          *(byte *)((long)puVar126 + lVar142 + -1) = (char)local_78 * ' ' + 0x5d;
          *(byte *)((long)puVar126 + lVar142) = 0x2c;
          if (local_d8 <= (uint *)((long)local_108 + lVar127)) {
            if (local_10c < '\0') {
              if ((uint *)((long)local_108 + lVar127) <= (uint *)((long)puVar126 + lVar142 + 3)) {
                uVar150 = 2;
                if (2 < local_f8 >> 1) {
                  uVar150 = local_f8 >> 1;
                }
                uVar150 = uVar150 + 7 & 0xfffffffffffffff8;
                pbVar154 = (byte *)(*p_Var8)(pvVar7,local_100,local_f8,uVar150 + local_f8);
                if (pbVar154 == (byte *)0x0) goto LAB_00f26cf0;
                memmove(pbVar154 +
                        (long)((long)local_108 +
                              lVar142 * 8 + ((uVar150 + local_f8) - (long)local_d8)),
                        pbVar154 + (long)((long)local_108 + (lVar142 * 8 - (long)local_100)),
                        (size_t)((long)local_d8 + (-lVar127 - (long)local_108)));
                puVar126 = (uint *)(pbVar154 + ((long)puVar126 - (long)local_100));
                local_100 = pbVar154;
              }
              pbVar154 = (byte *)((long)puVar126 + lVar142) + 1;
              *(byte *)((long)puVar126 + lVar142) = 10;
            }
            else {
              pbVar154 = (byte *)((long)puVar126 + lVar142);
            }
            *pbVar154 = 0;
            if (dat_len != (usize *)0x0) {
              *dat_len = (long)pbVar154 - (long)local_100;
            }
LAB_00f28f98:
            *(undefined8 *)pyVar106 = 0;
            pyVar106->msg = (char *)0x0;
            return (char *)local_100;
          }
          lVar134 = lVar142 * 2;
          local_78 = *(ulong *)(local_108 + lVar134) & 0xffffffffffffff01;
          lVar142 = lVar142 + 1;
          lVar127 = lVar127 + 8;
          lVar134 = (*(ulong *)(local_108 + lVar134) >> 1) - 1;
        } while (lVar134 == 0);
        puVar151 = (uint *)((long)local_108 + lVar127);
        puVar126 = (uint *)((long)puVar126 + lVar142);
      } while( true );
    }
    local_100 = (byte *)0x0;
LAB_00f26cf0:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar106->code = 2;
    pyVar118->msg = "memory allocation failed";
    goto LAB_00f26d38;
  }
  if ((flg & 2) == 0) {
    puVar157 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar157 = enc_table_cpy;
    }
    switch(bVar153 & 7) {
    case 0:
      goto switchD_00f2112f_caseD_0;
    case 1:
switchD_00f2112f_caseD_1:
      uVar150 = uVar150 >> 8;
      pvVar9 = (val->uni).ptr;
      puVar151 = (uint *)(*p_Var5)(pvVar7,uVar150 + 2);
      if (puVar151 != (uint *)0x0) {
        switchD_00916250::default(puVar151,pvVar9,uVar150);
        puVar126 = (uint *)((long)puVar151 + uVar150);
        goto LAB_00f27024;
      }
      break;
    case 2:
switchD_00f2112f_caseD_2:
      puVar151 = (uint *)(*p_Var5)(pvVar7,8);
      if (puVar151 != (uint *)0x0) {
        puVar151[0] = 0x6c6c756e;
        puVar151[1] = 0xa2c;
        puVar126 = puVar151 + 1;
        goto LAB_00f27024;
      }
      break;
    case 3:
switchD_00f2112f_caseD_3:
      puVar151 = (uint *)(*p_Var5)(pvVar7,8);
      if (puVar151 != (uint *)0x0) {
        bVar161 = (val->tag & 0x18) != 0;
        uVar115 = 0xa2c65736c6166;
        if (bVar161) {
          uVar115 = 0xa2c65757274;
        }
        *(undefined8 *)puVar151 = uVar115;
        puVar126 = (uint *)((long)puVar151 + (5 - (ulong)bVar161));
        goto LAB_00f27024;
      }
      break;
    case 4:
switchD_00f2112f_caseD_4:
      puVar151 = (uint *)(*p_Var5)(pvVar7,0x22);
      if (puVar151 != (uint *)0x0) {
        uVar150 = (val->uni).u64;
        uVar141 = (uint)(uVar150 >> 0x20);
        if ((val->tag & 0x10) == 0) {
          uVar141 = uVar141 >> 0x1f & (uint)(val->tag >> 3);
          uVar109 = -uVar150;
          if (uVar141 == 0) {
            uVar109 = uVar150;
          }
          *(byte *)puVar151 = 0x2d;
          pbVar154 = (byte *)((long)puVar151 + (ulong)uVar141);
          if (uVar109 < 100000000) {
            if (uVar109 < 100) {
              *(undefined2 *)pbVar154 =
                   *(undefined2 *)(digit_table + (ulong)(uVar109 < 10) + uVar109 * 2);
              pbVar154 = pbVar154 + -(ulong)(uVar109 < 10);
              goto LAB_00f28ad2;
            }
            iVar137 = (int)uVar109;
            if (uVar109 < 10000) {
              uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
              uVar150 = (ulong)(uVar109 < 1000);
              *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + uVar150 + (ulong)uVar141 * 2);
              *(undefined2 *)(pbVar154 + (2 - uVar150)) =
                   *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
              puVar126 = (uint *)(pbVar154 + (4 - uVar150));
              goto LAB_00f27024;
            }
            if (uVar109 < 1000000) {
              iVar137 = (int)(uVar109 * 0x68db9 >> 0x20) * -10000 + iVar137;
              uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
              uVar150 = (ulong)(uVar109 < 100000);
              *(undefined2 *)pbVar154 =
                   *(undefined2 *)(digit_table + uVar150 + (uVar109 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar154 + (2 - uVar150)) =
                   *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
              *(undefined2 *)(pbVar154 + (4 - uVar150)) =
                   *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
              puVar126 = (uint *)(pbVar154 + (6 - uVar150));
              goto LAB_00f27024;
            }
            uVar141 = (uint)(uVar109 * 0x68db8bb >> 0x20);
            uVar131 = uVar141 >> 8;
            iVar137 = uVar131 * -10000 + iVar137;
            uVar131 = uVar131 * 0x147b >> 0x13;
            uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
            iVar137 = uVar138 * -100 + iVar137;
            *(undefined2 *)pbVar154 =
                 *(undefined2 *)(digit_table + (ulong)(uVar109 < 10000000) + (ulong)uVar131 * 2);
            pbVar154 = pbVar154 + -(ulong)(uVar109 < 10000000);
            *(undefined2 *)(pbVar154 + 2) =
                 *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
            uVar112 = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
          }
          else {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = uVar109;
            lVar134 = SUB168(auVar26 / ZEXT816(100000000),0);
            uVar150 = lVar134 * 0xfa0a1f00 + uVar109;
            iVar137 = SUB164(auVar26 / ZEXT816(100000000),0);
            if (9999999999999999 < uVar109) {
              auVar27._8_8_ = 0;
              auVar27._0_8_ = uVar109;
              lVar134 = SUB168(auVar27 / ZEXT816(1000000000000),0);
              iVar135 = SUB164(auVar27 / ZEXT816(1000000000000),0);
              iVar137 = iVar137 + iVar135 * -10000;
              if (uVar109 < 1000000000000000000) {
                uVar152 = lVar134 * 0x68db9;
                iVar135 = (int)(uVar152 >> 0x20) * -10000 + iVar135;
                uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                uVar109 = (ulong)(uVar109 < 100000000000000000);
                *(undefined2 *)pbVar154 =
                     *(undefined2 *)(digit_table + uVar109 + (uVar152 >> 0x20) * 2);
                *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                     *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                     *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                lVar134 = 6 - uVar109;
              }
              else {
                uVar141 = (uint)((ulong)(lVar134 * 0x68db8bb) >> 0x20);
                uVar131 = uVar141 >> 8;
                iVar135 = uVar131 * -10000 + iVar135;
                uVar131 = uVar131 * 0x147b >> 0x13;
                uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
                uVar109 = (ulong)(uVar109 < 10000000000000000000);
                *(undefined2 *)pbVar154 =
                     *(undefined2 *)(digit_table + uVar109 + (ulong)uVar131 * 2);
                *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                     *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                     *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                *(undefined2 *)(pbVar154 + (6 - uVar109)) =
                     *(undefined2 *)(digit_table + (uVar138 * -100 + iVar135) * 2);
                lVar134 = 8 - uVar109;
              }
              pbVar154 = pbVar154 + lVar134;
              uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
              *(undefined2 *)(pbVar154 + 2) =
                   *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar137) * 2);
              uVar141 = (uint)((uVar150 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar131 = uVar141 >> 8;
              iVar137 = uVar131 * -10000 + (int)uVar150;
              uVar131 = uVar131 * 0x147b >> 0x13;
              uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar154 + 4) = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
              *(undefined2 *)(pbVar154 + 6) =
                   *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
              *(undefined2 *)(pbVar154 + 8) = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
              *(undefined2 *)(pbVar154 + 10) =
                   *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar137) * 2);
              puVar126 = (uint *)(pbVar154 + 0xc);
              goto LAB_00f27024;
            }
            if (uVar109 >> 10 < 0x9502f9) {
              *(undefined2 *)pbVar154 =
                   *(undefined2 *)(digit_table + (ulong)(uVar109 < 1000000000) + lVar134 * 2);
              pbVar154 = pbVar154 + (2 - (ulong)(uVar109 < 1000000000));
            }
            else if (uVar109 >> 0xc < 0xe8d4a51) {
              uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
              uVar109 = (ulong)(uVar109 >> 0xb < 0x2e90edd);
              *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
              *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                   *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
              pbVar154 = pbVar154 + (4 - uVar109);
            }
            else if (uVar109 < 100000000000000) {
              iVar137 = (int)((ulong)(lVar134 * 0x68db9) >> 0x20) * -10000 + iVar137;
              uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
              uVar109 = (ulong)(uVar109 >> 0xd < 0x48c27395);
              *(undefined2 *)pbVar154 =
                   *(undefined2 *)(digit_table + uVar109 + ((ulong)(lVar134 * 0x68db9) >> 0x20) * 2)
              ;
              *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                   *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
              *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                   *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
              pbVar154 = pbVar154 + (6 - uVar109);
            }
            else {
              uVar141 = (uint)((ulong)(lVar134 * 0x68db8bb) >> 0x20);
              uVar131 = uVar141 >> 8;
              iVar137 = uVar131 * -10000 + iVar137;
              uVar131 = uVar131 * 0x147b >> 0x13;
              uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
              uVar109 = (ulong)(uVar109 < 1000000000000000);
              *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + uVar109 + (ulong)uVar131 * 2);
              *(undefined2 *)(pbVar154 + (2 - uVar109)) =
                   *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
              *(undefined2 *)(pbVar154 + (4 - uVar109)) =
                   *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
              *(undefined2 *)(pbVar154 + (6 - uVar109)) =
                   *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
              pbVar154 = pbVar154 + (8 - uVar109);
            }
            uVar141 = (uint)((uVar150 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar131 = uVar141 >> 8;
            iVar137 = uVar131 * -10000 + (int)uVar150;
            uVar131 = uVar131 * 0x147b >> 0x13;
            uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
            iVar137 = uVar138 * 0x7fffff9c + iVar137;
            *(undefined2 *)pbVar154 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
            *(undefined2 *)(pbVar154 + 2) =
                 *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
            uVar112 = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
          }
          *(undefined2 *)(pbVar154 + 4) = uVar112;
          *(undefined2 *)(pbVar154 + 6) = *(undefined2 *)(digit_table + (uint)(iVar137 * 2));
          puVar126 = (uint *)(pbVar154 + 8);
        }
        else {
          uVar109 = uVar150 & 0xfffffffffffff;
          uVar141 = uVar141 >> 0x14 & 0x7ff;
          if (uVar141 == 0x7ff) {
            if ((flg & 0x10) != 0) {
              *puVar151 = 0x6c6c756e;
              puVar126 = puVar151 + 1;
              goto LAB_00f27024;
            }
            if ((flg & 8) != 0) {
              if (uVar109 == 0) {
                *(byte *)puVar151 = 0x2d;
                lVar134 = -((long)uVar150 >> 0x3f);
                *(undefined8 *)((long)puVar151 + lVar134) = 0x7974696e69666e49;
                puVar126 = (uint *)((long)puVar151 + lVar134 + 8);
              }
              else {
                *puVar151 = 0x4e614e;
                puVar126 = (uint *)((long)puVar151 + 3);
              }
              goto LAB_00f27024;
            }
            (*p_Var6)(pvVar7,puVar151);
            if (dat_len != (usize *)0x0) {
              *dat_len = 0;
            }
            pyVar118 = &dummy_err;
            if (err != (yyjson_write_err *)0x0) {
              pyVar118 = err;
            }
            pyVar106->code = 4;
            pcVar110 = "nan or inf number is not allowed";
            goto LAB_00f27089;
          }
          *(byte *)puVar151 = 0x2d;
          lVar134 = -((long)uVar150 >> 0x3f);
          puVar159 = (undefined8 *)((long)puVar151 + lVar134);
          if ((uVar150 & 0x7fffffffffffffff) == 0) {
            *(undefined4 *)puVar159 = 0x302e30;
            puVar126 = (uint *)((long)puVar159 + 3);
            goto LAB_00f27024;
          }
          if (uVar141 == 0) {
            uVar150 = (ulong)((uint)uVar150 & 1);
            uVar109 = uVar109 * 0x20;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = uVar109 - 0x10;
            auVar101._8_8_ = 0;
            auVar101._0_8_ = SUB168(auVar62 * ZEXT816(0x6c07a2c26a8346d2),8);
            auVar63._8_8_ = 0;
            auVar63._0_8_ = uVar109 - 0x10;
            auVar101 = auVar63 * ZEXT816(0x9e19db92b4e31ba9) + auVar101;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = uVar109;
            auVar102._8_8_ = 0;
            auVar102._0_8_ = SUB168(auVar64 * ZEXT816(0x6c07a2c26a8346d2),8);
            auVar65._8_8_ = 0;
            auVar65._0_8_ = uVar109;
            auVar102 = auVar65 * ZEXT816(0x9e19db92b4e31ba9) + auVar102;
            uVar152 = auVar102._8_8_;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = uVar109 + 0x10;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = SUB168(auVar66 * ZEXT816(0x6c07a2c26a8346d2),8);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar109 + 0x10;
            auVar103 = auVar67 * ZEXT816(0x9e19db92b4e31ba9) + auVar103;
            uVar109 = ((ulong)((auVar101 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0) | auVar101._8_8_) + uVar150;
            uVar150 = ((ulong)((auVar103 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0) | auVar103._8_8_) - uVar150;
            if (uVar152 < 0x28) {
LAB_00f28c26:
              uVar108 = (auVar102 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                        uVar152;
              uVar120 = uVar152 & 0x7ffffffffffffffc;
              bVar161 = true;
              if (uVar108 <= (uVar120 | 2)) {
                bVar161 = (bool)((byte)((uVar152 & 0xffffffff) >> 2) & 0x3f &
                                uVar108 == (uVar120 | 2));
              }
              uVar108 = uVar152 >> 2;
              bVar160 = uVar120 + 4 <= uVar150;
              if (uVar120 < uVar109 == bVar160) {
                bVar161 = bVar160;
              }
              iVar137 = -0x144;
            }
            else {
              uVar108 = uVar152 / 0x28;
              bVar161 = uVar108 * 0x28 + 0x28 <= uVar150;
              if (uVar108 * 0x28 < uVar109 != bVar161) goto LAB_00f28c26;
              iVar137 = -0x143;
            }
            uVar108 = bVar161 + uVar108;
            pcVar110 = (char *)((long)puVar159 + 1);
            if (uVar108 < 1000000000000000) {
              if (uVar108 < 100000000) {
                if (uVar108 < 100) {
                  *(undefined2 *)pcVar110 =
                       *(undefined2 *)(digit_table + (ulong)(uVar108 < 10) + uVar108 * 2);
                  pcVar110 = pcVar110 + (2 - (ulong)(uVar108 < 10));
                }
                else {
                  iVar135 = (int)uVar108;
                  if (uVar108 < 10000) {
                    uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                    uVar150 = (ulong)(uVar108 < 1000);
                    *(undefined2 *)pcVar110 =
                         *(undefined2 *)(digit_table + uVar150 + (ulong)uVar141 * 2);
                    *(undefined2 *)(pcVar110 + (2 - uVar150)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                    pcVar110 = pcVar110 + (4 - uVar150);
                  }
                  else {
                    if (999999 < uVar108) {
                      uVar141 = (uint)(uVar108 * 0x68db8bb >> 0x20);
                      uVar131 = uVar141 >> 8;
                      iVar135 = uVar131 * -10000 + iVar135;
                      uVar131 = uVar131 * 0x147b >> 0x13;
                      uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
                      iVar135 = uVar138 * -100 + iVar135;
                      *(undefined2 *)pcVar110 =
                           *(undefined2 *)
                            (digit_table + (ulong)(uVar108 < 10000000) + (ulong)uVar131 * 2);
                      pcVar110 = pcVar110 + -(ulong)(uVar108 < 10000000);
                      *(undefined2 *)(pcVar110 + 2) =
                           *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                      uVar112 = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                      goto LAB_00f29163;
                    }
                    iVar135 = (int)(uVar108 * 0x68db9 >> 0x20) * -10000 + iVar135;
                    uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                    uVar150 = (ulong)(uVar108 < 100000);
                    *(undefined2 *)pcVar110 =
                         *(undefined2 *)(digit_table + uVar150 + (uVar108 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pcVar110 + (2 - uVar150)) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pcVar110 + (4 - uVar150)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                    pcVar110 = pcVar110 + (6 - uVar150);
                  }
                }
              }
              else {
                auVar31._8_8_ = 0;
                auVar31._0_8_ = uVar108;
                lVar134 = SUB168(auVar31 / ZEXT816(100000000),0);
                uVar150 = lVar134 * 0xfa0a1f00 + uVar108;
                if (uVar108 >> 10 < 0x9502f9) {
                  *(undefined2 *)pcVar110 =
                       *(undefined2 *)(digit_table + (ulong)(uVar108 < 1000000000) + lVar134 * 2);
                  pcVar110 = pcVar110 + (2 - (ulong)(uVar108 < 1000000000));
                }
                else {
                  iVar135 = SUB164(auVar31 / ZEXT816(100000000),0);
                  if (uVar108 >> 0xc < 0xe8d4a51) {
                    uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar108 >> 0xb < 0x2e90edd);
                    *(undefined2 *)pcVar110 =
                         *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
                    *(undefined2 *)(pcVar110 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                    pcVar110 = pcVar110 + (4 - uVar109);
                  }
                  else if (uVar108 < 100000000000000) {
                    iVar135 = (int)((ulong)(lVar134 * 0x68db9) >> 0x20) * -10000 + iVar135;
                    uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar108 >> 0xd < 0x48c27395);
                    *(undefined2 *)pcVar110 =
                         *(undefined2 *)
                          (digit_table + uVar109 + ((ulong)(lVar134 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pcVar110 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pcVar110 + (4 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar135) * 2);
                    pcVar110 = pcVar110 + (6 - uVar109);
                  }
                  else {
                    uVar141 = (uint)((ulong)(lVar134 * 0x68db8bb) >> 0x20);
                    uVar131 = uVar141 >> 8;
                    iVar135 = uVar131 * -10000 + iVar135;
                    uVar131 = uVar131 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar159 + 1) =
                         *(undefined2 *)(digit_table + (ulong)uVar131 * 2 + 1);
                    *(undefined2 *)((long)puVar159 + 2) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)((long)puVar159 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)((long)puVar159 + 6) =
                         *(undefined2 *)(digit_table + (uVar138 * -100 + iVar135) * 2);
                    pcVar110 = (char *)(puVar159 + 1);
                  }
                }
                uVar141 = (uint)((uVar150 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar131 = uVar141 >> 8;
                iVar135 = uVar131 * -10000 + (int)uVar150;
                uVar131 = uVar131 * 0x147b >> 0x13;
                uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
                iVar135 = uVar138 * 0x7fffff9c + iVar135;
                *(undefined2 *)pcVar110 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                *(undefined2 *)(pcVar110 + 2) =
                     *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                uVar112 = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
LAB_00f29163:
                *(undefined2 *)(pcVar110 + 4) = uVar112;
                *(undefined2 *)(pcVar110 + 6) = *(undefined2 *)(digit_table + (uint)(iVar135 * 2));
                pcVar110 = pcVar110 + 8;
              }
            }
            else {
              uVar150 = (uVar108 / 100000000) * 0xfa0a1f00 + uVar108;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar108;
              uVar109 = SUB168(auVar30 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                        uVar108 / 100000000;
              *pcVar110 = SUB161(auVar30 / ZEXT816(10000000000000000),0) + '0';
              pcVar110 = pcVar110 + (9999999999999999 < uVar108);
              uVar141 = (uint)((uVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar131 = uVar141 >> 8;
              iVar135 = uVar131 * -10000 + (int)uVar109;
              uVar131 = uVar131 * 0x147b >> 0x13;
              uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
              *(undefined2 *)pcVar110 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
              *(undefined2 *)(pcVar110 + 2) =
                   *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
              *(undefined2 *)(pcVar110 + 4) = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
              *(undefined2 *)(pcVar110 + 6) =
                   *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar135) * 2);
              uVar141 = (uint)((uVar150 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar131 = uVar141 >> 8;
              iVar135 = uVar131 * -10000 + (int)uVar150;
              uVar131 = uVar131 * 0x147b >> 0x13;
              uVar138 = (uint)(iVar135 * 0x147b) >> 0x13;
              *(undefined2 *)(pcVar110 + 8) = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
              *(undefined2 *)(pcVar110 + 10) =
                   *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
              *(undefined2 *)(pcVar110 + 0xc) = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
              *(undefined2 *)(pcVar110 + 0xe) =
                   *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar135) * 2);
              pcVar110 = pcVar110 + 0x10;
            }
            *(undefined1 *)puVar159 = *(undefined1 *)((long)puVar159 + 1);
            *(undefined1 *)((long)puVar159 + 1) = 0x2e;
            lVar134 = 0;
            do {
              lVar127 = lVar134 + -1;
              lVar134 = lVar134 + -1;
            } while (pcVar110[lVar127] == '0');
            iVar137 = ((int)pcVar110 - (int)puVar159) + iVar137 + -2;
            pcVar110 = pcVar110 + lVar134 + (ulong)(pcVar110[lVar127] != '.');
            puVar126 = (uint *)(pcVar110 + 5);
            pcVar110[0] = 'e';
            pcVar110[1] = '-';
            uVar141 = iVar137 * -0x290;
            pcVar110[2] = (char)(uVar141 >> 0x10) + '0';
            *(undefined2 *)(pcVar110 + 3) =
                 *(undefined2 *)(digit_table + ((uVar141 >> 0x10) * 0x7fffff9c - iVar137) * 2);
            goto LAB_00f27024;
          }
          uVar152 = uVar109 + 0x10000000000000;
          if (uVar141 - 0x3ff < 0x35) {
            lVar127 = 0;
            if (uVar152 != 0) {
              for (; (uVar152 >> lVar127 & 1) == 0; lVar127 = lVar127 + 1) {
              }
            }
            if (0x433 - uVar141 <= (uint)lVar127) {
              uVar152 = uVar152 >> ((byte)(0x433 - uVar141) & 0x3f);
              if (uVar152 < 100000000) {
                if (uVar152 < 100) {
                  *(undefined2 *)puVar159 =
                       *(undefined2 *)(digit_table + (ulong)(uVar152 < 10) + uVar152 * 2);
                  pbVar154 = (byte *)((long)puVar159 + (2 - (ulong)(uVar152 < 10)));
                }
                else {
                  iVar137 = (int)uVar152;
                  if (uVar152 < 10000) {
                    uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar150 = (ulong)(uVar152 < 1000);
                    *(undefined2 *)puVar159 =
                         *(undefined2 *)(digit_table + uVar150 + (ulong)uVar141 * 2);
                    *(undefined2 *)((long)puVar159 + (2 - uVar150)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                    pbVar154 = (byte *)((long)puVar159 + (4 - uVar150));
                  }
                  else if (uVar152 < 1000000) {
                    iVar137 = (int)(uVar152 * 0x68db9 >> 0x20) * -10000 + iVar137;
                    uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar150 = (ulong)(uVar152 < 100000);
                    *(undefined2 *)puVar159 =
                         *(undefined2 *)(digit_table + uVar150 + (uVar152 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)((long)puVar159 + (2 - uVar150)) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)((long)puVar159 + (4 - uVar150)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                    pbVar154 = (byte *)((long)puVar159 + (6 - uVar150));
                  }
                  else {
                    uVar141 = (uint)(uVar152 * 0x68db8bb >> 0x20);
                    uVar131 = uVar141 >> 8;
                    iVar137 = uVar131 * -10000 + iVar137;
                    uVar131 = uVar131 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar150 = (ulong)(uVar152 < 10000000);
                    *(undefined2 *)puVar159 =
                         *(undefined2 *)(digit_table + uVar150 + (ulong)uVar131 * 2);
                    *(undefined2 *)((long)puVar159 + (2 - uVar150)) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)((long)puVar159 + (4 - uVar150)) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)((long)puVar159 + (6 - uVar150)) =
                         *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
                    pbVar154 = (byte *)((long)puVar159 + (8 - uVar150));
                  }
                }
              }
              else {
                auVar29._8_8_ = 0;
                auVar29._0_8_ = uVar152;
                lVar134 = SUB168(auVar29 / ZEXT816(100000000),0);
                uVar150 = lVar134 * 0xfa0a1f00 + uVar152;
                if (uVar152 >> 10 < 0x9502f9) {
                  *(undefined2 *)puVar159 =
                       *(undefined2 *)(digit_table + (ulong)(uVar152 < 1000000000) + lVar134 * 2);
                  puVar139 = (undefined2 *)((long)puVar159 + (2 - (ulong)(uVar152 < 1000000000)));
                }
                else {
                  iVar137 = SUB164(auVar29 / ZEXT816(100000000),0);
                  if (uVar152 >> 0xc < 0xe8d4a51) {
                    uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar152 >> 0xb < 0x2e90edd);
                    *(undefined2 *)puVar159 =
                         *(undefined2 *)(digit_table + uVar109 + (ulong)uVar141 * 2);
                    *(undefined2 *)((long)puVar159 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                    puVar139 = (undefined2 *)((long)puVar159 + (4 - uVar109));
                  }
                  else if (uVar152 < 100000000000000) {
                    iVar137 = (int)((ulong)(lVar134 * 0x68db9) >> 0x20) * -10000 + iVar137;
                    uVar141 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar152 >> 0xd < 0x48c27395);
                    *(undefined2 *)puVar159 =
                         *(undefined2 *)
                          (digit_table + uVar109 + ((ulong)(lVar134 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)((long)puVar159 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)((long)puVar159 + (4 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar141 * -100 + iVar137) * 2);
                    puVar139 = (undefined2 *)((long)puVar159 + (6 - uVar109));
                  }
                  else {
                    uVar141 = (uint)((ulong)(lVar134 * 0x68db8bb) >> 0x20);
                    uVar131 = uVar141 >> 8;
                    iVar137 = uVar131 * -10000 + iVar137;
                    uVar131 = uVar131 * 0x147b >> 0x13;
                    uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                    uVar109 = (ulong)(uVar152 < 1000000000000000);
                    *(undefined2 *)puVar159 =
                         *(undefined2 *)(digit_table + uVar109 + (ulong)uVar131 * 2);
                    *(undefined2 *)((long)puVar159 + (2 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                    *(undefined2 *)((long)puVar159 + (4 - uVar109)) =
                         *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                    *(undefined2 *)((long)puVar159 + (6 - uVar109)) =
                         *(undefined2 *)(digit_table + (uVar138 * -100 + iVar137) * 2);
                    puVar139 = (undefined2 *)((long)puVar159 + (8 - uVar109));
                  }
                }
                uVar141 = (uint)((uVar150 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar131 = uVar141 >> 8;
                iVar137 = uVar131 * -10000 + (int)uVar150;
                uVar131 = uVar131 * 0x147b >> 0x13;
                uVar138 = (uint)(iVar137 * 0x147b) >> 0x13;
                *puVar139 = *(undefined2 *)(digit_table + (ulong)uVar131 * 2);
                puVar139[1] = *(undefined2 *)(digit_table + (uVar131 * -100 + (uVar141 >> 8)) * 2);
                puVar139[2] = *(undefined2 *)(digit_table + (ulong)uVar138 * 2);
                puVar139[3] = *(undefined2 *)(digit_table + (uVar138 * 0x7fffff9c + iVar137) * 2);
                pbVar154 = (byte *)(puVar139 + 4);
              }
              pbVar154[0] = 0x2e;
              pbVar154[1] = 0x30;
              goto LAB_00f28ad2;
            }
          }
          uVar150 = (ulong)((uint)uVar150 & 1);
          iVar137 = uVar141 * 0x4d105 + -0x200a5;
          if (uVar141 == 1 || uVar109 != 0) {
            iVar137 = uVar141 * 0x4d105;
          }
          iVar137 = iVar137 + -0x1439b7ff >> 0x14;
          uVar108 = *(ulong *)(pow10_sig_table + (ulong)(iVar137 * -2 + 0x2ae) * 8);
          uVar120 = *(long *)(pow10_sig_table + (ulong)(iVar137 * -2 + 0x2af) * 8) +
                    (ulong)(iVar137 - 1U < 0xffffffc8);
          bVar153 = ((char)((uint)(iVar137 * -0x3526b) >> 0x10) + (char)uVar141) - 0x32;
          uVar109 = (ulong)(uVar141 != 1 && uVar109 == 0) + uVar152 * 4 + -2 << (bVar153 & 0x3f);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uVar120;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar109;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = SUB168(auVar56 * auVar80,8);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = uVar108;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar109;
          auVar98 = auVar57 * auVar81 + auVar98;
          uVar109 = uVar152 * 4 << (bVar153 & 0x3f);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar120;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar109;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = SUB168(auVar58 * auVar82,8);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar108;
          auVar83._8_8_ = 0;
          auVar83._0_8_ = uVar109;
          auVar99 = auVar59 * auVar83 + auVar99;
          uVar109 = auVar99._8_8_;
          uVar152 = uVar152 * 4 + 2 << (bVar153 & 0x3f);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uVar120;
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar152;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = SUB168(auVar60 * auVar84,8);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar108;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar152;
          auVar100 = auVar61 * auVar85 + auVar100;
          uVar152 = ((ulong)((auVar98 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar98._8_8_) + uVar150;
          uVar150 = ((ulong)((auVar100 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar100._8_8_) - uVar150;
          if (uVar109 < 0x28) {
LAB_00f272b0:
            uVar120 = (auVar99 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                      uVar109;
            uVar108 = uVar109 & 0xfffffffffffffffc;
            bVar161 = true;
            if (uVar120 <= uVar108 + 2) {
              bVar161 = (bool)((byte)(uVar109 >> 2) & 0x3f & uVar120 == uVar108 + 2);
            }
            bVar160 = uVar108 + 4 <= uVar150;
            if (uVar108 < uVar152 == bVar160) {
              bVar161 = bVar160;
            }
            uVar150 = (uVar109 >> 2) + (ulong)bVar161;
          }
          else {
            uVar120 = (uVar109 / 0x28) * 0x28;
            uVar108 = uVar120 + 0x28;
            if (uVar120 < uVar152 != uVar108 <= uVar150) goto LAB_00f272b0;
            uVar150 = (uVar109 / 0x28 + 1) - (ulong)(uVar150 < uVar108);
            iVar137 = iVar137 + 1;
          }
          iVar148 = (0x11 - (uint)(uVar150 < 10000000000000000)) -
                    (uint)(uVar150 < 1000000000000000);
          uVar138 = iVar148 + iVar137;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar150;
          uVar109 = SUB168(auVar28 / ZEXT816(100000000),0);
          uVar150 = uVar109 * 0xfa0a1f00 + uVar150;
          uVar109 = (uVar109 & 0xffffffff) / 10000;
          iVar135 = (int)uVar109;
          uVar131 = SUB164(auVar28 / ZEXT816(100000000),0);
          iVar119 = iVar135 * -10000 + uVar131;
          iVar146 = (int)(uVar109 * 0x28f5d >> 0x18);
          uVar141 = (uint)(iVar146 * 0x29) >> 0xc;
          uVar155 = uVar141 * -100 + iVar146;
          uVar147 = iVar146 * -100 + iVar135;
          cVar129 = (char)uVar141 + '0';
          iVar135 = (int)uVar150;
          if (iVar148 + iVar137 + 5U < 0x1b) {
            if ((int)uVar138 < 1) {
              puVar139 = (undefined2 *)
                         ((long)puVar159 +
                         (((ulong)(2 - uVar138) + 1) - (ulong)(uVar131 < 100000000)));
              *(char *)((long)puVar159 + (ulong)(2 - uVar138)) = cVar129;
              uVar109 = (ulong)(uVar155 < 10 && uVar131 < 100000000);
              *puVar139 = *(undefined2 *)(digit_table + uVar109 + uVar155 * 2);
              *(undefined2 *)((long)puVar139 + (2 - uVar109)) =
                   *(undefined2 *)(digit_table + uVar147 * 2);
              if (iVar135 == 0) {
                if (iVar119 == 0) {
                  uVar150 = 0;
                  if (uVar147 == 0) {
                    uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar155];
                  }
                  uVar150 = 4 - (uVar150 + (byte)dec_trailing_zero_table[uVar147]);
                }
                else {
                  uVar141 = (uint)(iVar119 * 0x147b) >> 0x13;
                  uVar131 = uVar141 * -100 + iVar119;
                  *(undefined2 *)((long)puVar139 + (4 - uVar109)) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  *(undefined2 *)((long)puVar139 + (6 - uVar109)) =
                       *(undefined2 *)(digit_table + uVar131 * 2);
                  uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar141] + 2;
                  if (uVar131 != 0) {
                    uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar131];
                  }
                  uVar150 = 8 - uVar150;
                }
              }
              else {
                uVar147 = (uint)(iVar119 * 0x147b) >> 0x13;
                uVar141 = (uint)((uVar150 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar155 = uVar141 >> 8;
                uVar131 = uVar155 * 0x147b >> 0x13;
                uVar150 = (ulong)uVar131;
                uVar141 = uVar131 * -100 + (uVar141 >> 8);
                *(undefined2 *)((long)puVar139 + (4 - uVar109)) =
                     *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
                *(undefined2 *)((long)puVar139 + (6 - uVar109)) =
                     *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar119) * 2);
                *(undefined2 *)((long)puVar139 + (8 - uVar109)) =
                     *(undefined2 *)(digit_table + uVar150 * 2);
                *(undefined2 *)((long)puVar139 + (10 - uVar109)) =
                     *(undefined2 *)(digit_table + uVar141 * 2);
                iVar135 = uVar155 * -10000 + iVar135;
                if (iVar135 == 0) {
                  lStack_120 = 0xc;
                }
                else {
                  uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                  uVar150 = (ulong)uVar141;
                  uVar141 = uVar141 * -100 + iVar135;
                  *(undefined2 *)((long)puVar139 + (0xc - uVar109)) =
                       *(undefined2 *)(digit_table + uVar150 * 2);
                  *(undefined2 *)((long)puVar139 + (0xe - uVar109)) =
                       *(undefined2 *)(digit_table + uVar141 * 2);
                  lStack_120 = 0x10;
                }
                uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar150] + 2;
                if (uVar141 != 0) {
                  uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar141];
                }
                uVar150 = lStack_120 - uVar150;
              }
              *(undefined2 *)puVar159 = 0x2e30;
              for (uVar152 = 0;
                  puVar126 = (uint *)((long)puVar139 + ((uVar150 & 0xffffffff) - uVar109)),
                  -uVar138 != uVar152; uVar152 = uVar152 + 1) {
                *(undefined1 *)((long)puVar159 + uVar152 + 2) = 0x30;
              }
            }
            else {
              puVar139 = (undefined2 *)((long)puVar159 + (2 - (ulong)(uVar131 < 100000000)));
              *puVar159 = 0x3030303030303030;
              puVar159[1] = 0x3030303030303030;
              puVar159[2] = 0x3030303030303030;
              *(char *)((long)puVar159 + 1) = cVar129;
              uVar109 = (ulong)(uVar155 < 10 && uVar131 < 100000000);
              *puVar139 = *(undefined2 *)(digit_table + uVar109 + uVar155 * 2);
              *(undefined2 *)((long)puVar139 + (2 - uVar109)) =
                   *(undefined2 *)(digit_table + uVar147 * 2);
              if (iVar135 == 0) {
                if (iVar119 == 0) {
                  uVar150 = 0;
                  if (uVar147 == 0) {
                    uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar155];
                  }
                  uVar150 = 4 - (uVar150 + (byte)dec_trailing_zero_table[uVar147]);
                }
                else {
                  uVar141 = (uint)(iVar119 * 0x147b) >> 0x13;
                  uVar131 = uVar141 * -100 + iVar119;
                  *(undefined2 *)((long)puVar139 + (4 - uVar109)) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  *(undefined2 *)((long)puVar139 + (6 - uVar109)) =
                       *(undefined2 *)(digit_table + uVar131 * 2);
                  uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar141] + 2;
                  if (uVar131 != 0) {
                    uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar131];
                  }
                  uVar150 = 8 - uVar150;
                }
              }
              else {
                uVar147 = (uint)(iVar119 * 0x147b) >> 0x13;
                uVar141 = (uint)((uVar150 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar155 = uVar141 >> 8;
                uVar131 = uVar155 * 0x147b >> 0x13;
                uVar150 = (ulong)uVar131;
                uVar141 = uVar131 * -100 + (uVar141 >> 8);
                *(undefined2 *)((long)puVar139 + (4 - uVar109)) =
                     *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
                *(undefined2 *)((long)puVar139 + (6 - uVar109)) =
                     *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar119) * 2);
                *(undefined2 *)((long)puVar139 + (8 - uVar109)) =
                     *(undefined2 *)(digit_table + uVar150 * 2);
                *(undefined2 *)((long)puVar139 + (10 - uVar109)) =
                     *(undefined2 *)(digit_table + uVar141 * 2);
                iVar135 = uVar155 * -10000 + iVar135;
                if (iVar135 == 0) {
                  lStack_120 = 0xc;
                }
                else {
                  uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
                  uVar150 = (ulong)uVar141;
                  uVar141 = uVar141 * -100 + iVar135;
                  *(undefined2 *)((long)puVar139 + (0xc - uVar109)) =
                       *(undefined2 *)(digit_table + uVar150 * 2);
                  *(undefined2 *)((long)puVar139 + (0xe - uVar109)) =
                       *(undefined2 *)(digit_table + uVar141 * 2);
                  lStack_120 = 0x10;
                }
                uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar150] + 2;
                if (uVar141 != 0) {
                  uVar150 = (ulong)(byte)dec_trailing_zero_table[uVar141];
                }
                uVar150 = lStack_120 - uVar150;
              }
              puVar121 = (uint *)((long)puVar139 + ((uVar150 & 0xffffffff) - uVar109));
              for (uVar150 = 0; uVar138 != uVar150; uVar150 = uVar150 + 1) {
                *(byte *)((long)puVar151 + uVar150 + lVar134) =
                     *(byte *)((long)puVar151 + uVar150 + lVar134 + 1);
              }
              puVar157 = (undefined1 *)((long)puVar159 + (ulong)uVar138);
              puVar126 = (uint *)(puVar157 + 2);
              *puVar157 = 0x2e;
              if (puVar126 < puVar121) {
                puVar126 = puVar121;
              }
            }
            goto LAB_00f27024;
          }
          lVar134 = 2 - (ulong)(uVar131 < 100000000);
          *(char *)((long)puVar159 + 1) = cVar129;
          uVar109 = (ulong)(uVar155 < 10 && uVar131 < 100000000);
          *(undefined2 *)((long)puVar159 + lVar134) =
               *(undefined2 *)(digit_table + uVar109 + uVar155 * 2);
          lVar134 = lVar134 - uVar109;
          *(undefined2 *)((long)puVar159 + lVar134 + 2) = *(undefined2 *)(digit_table + uVar147 * 2)
          ;
          if (iVar135 == 0) {
            if (iVar119 != 0) {
              uVar141 = (uint)(iVar119 * 0x147b) >> 0x13;
              uVar131 = uVar141 * -100 + iVar119;
              *(undefined2 *)((long)puVar159 + lVar134 + 4) =
                   *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
              *(undefined2 *)((long)puVar159 + lVar134 + 6) =
                   *(undefined2 *)(digit_table + uVar131 * 2);
              uVar141 = (byte)dec_trailing_zero_table[uVar141] + 2;
              if (uVar131 != 0) {
                uVar141 = (uint)(byte)dec_trailing_zero_table[uVar131];
              }
              iVar137 = 8;
              goto LAB_00f282f0;
            }
            uVar141 = 0;
            if (uVar147 == 0) {
              uVar141 = (uint)(byte)dec_trailing_zero_table[uVar155];
            }
            uVar141 = uVar141 + (byte)dec_trailing_zero_table[uVar147];
            iVar137 = 4;
LAB_00f28606:
            uVar141 = iVar137 - uVar141;
          }
          else {
            uVar155 = (uint)(iVar119 * 0x147b) >> 0x13;
            uVar141 = (uint)((uVar150 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar156 = uVar141 >> 8;
            uVar147 = uVar156 * 0x147b >> 0x13;
            uVar131 = uVar147 * -100 + (uVar141 >> 8);
            *(undefined2 *)((long)puVar159 + lVar134 + 4) =
                 *(undefined2 *)(digit_table + (ulong)uVar155 * 2);
            *(undefined2 *)((long)puVar159 + lVar134 + 6) =
                 *(undefined2 *)(digit_table + (uVar155 * 0x7fffff9c + iVar119) * 2);
            *(undefined2 *)((long)puVar159 + lVar134 + 8) =
                 *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
            *(undefined2 *)((long)puVar159 + lVar134 + 10) =
                 *(undefined2 *)(digit_table + uVar131 * 2);
            iVar135 = uVar156 * -10000 + iVar135;
            if (iVar135 == 0) {
              uVar141 = (byte)dec_trailing_zero_table[uVar147] + 2;
              if (uVar131 != 0) {
                uVar141 = (uint)(byte)dec_trailing_zero_table[uVar131];
              }
              iVar137 = 0xc;
              goto LAB_00f28606;
            }
            uVar141 = (uint)(iVar135 * 0x147b) >> 0x13;
            uVar131 = uVar141 * -100 + iVar135;
            *(undefined2 *)((long)puVar159 + lVar134 + 0xc) =
                 *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
            *(undefined2 *)((long)puVar159 + lVar134 + 0xe) =
                 *(undefined2 *)(digit_table + uVar131 * 2);
            uVar141 = (byte)dec_trailing_zero_table[uVar141] + 2;
            if (uVar131 != 0) {
              uVar141 = (uint)(byte)dec_trailing_zero_table[uVar131];
            }
            iVar137 = 0x10;
LAB_00f282f0:
            uVar141 = iVar137 - uVar141;
          }
          puVar139 = (undefined2 *)
                     ((long)puVar159 +
                     (((ulong)uVar141 + lVar134) - (ulong)((ulong)uVar141 + lVar134 == 2)));
          uVar138 = uVar138 - 1;
          *(undefined1 *)puVar159 = *(undefined1 *)((long)puVar159 + 1);
          *(undefined1 *)((long)puVar159 + 1) = 0x2e;
          *puVar139 = 0x2d65;
          uVar131 = uVar138 >> 0x1f;
          pcVar110 = (char *)((long)puVar139 + (ulong)uVar131 + 1);
          uVar141 = -uVar138;
          if (0 < (int)uVar138) {
            uVar141 = uVar138;
          }
          if (99 < uVar141) {
            *pcVar110 = (char)(uVar141 * 0x290 >> 0x10) + '0';
            *(undefined2 *)((long)puVar139 + (ulong)uVar131 + 2) =
                 *(undefined2 *)
                  (digit_table + ((uVar141 * 0x290 >> 0x10) * 0x7fffff9c + uVar141) * 2);
            puVar126 = (uint *)((long)puVar139 + (ulong)uVar131 + 4);
            goto LAB_00f27024;
          }
          *(undefined2 *)pcVar110 =
               *(undefined2 *)(digit_table + (ulong)(uVar141 < 10) + (ulong)uVar141 * 2);
          pbVar154 = (byte *)(pcVar110 + -(ulong)(uVar141 < 10));
LAB_00f28ad2:
          puVar126 = (uint *)(pbVar154 + 2);
        }
LAB_00f27024:
        if (local_10c < '\0') {
          *(byte *)puVar126 = 10;
          puVar126 = (uint *)((long)puVar126 + 1);
        }
        *(byte *)puVar126 = 0;
        if (dat_len != (usize *)0x0) {
          *dat_len = (long)puVar126 - (long)puVar151;
        }
        *(undefined8 *)pyVar106 = 0;
        pyVar106->msg = (char *)0x0;
        return (char *)puVar151;
      }
      break;
    case 5:
switchD_00f2112f_caseD_5:
      uVar109 = uVar150 >> 8;
      pbVar154 = (byte *)(val->uni).str;
      puVar151 = (uint *)(*p_Var5)(pvVar7,uVar109 * 6 + 4);
      if (puVar151 != (uint *)0x0) {
        if ((puVar157 != enc_table_cpy) || ((val->tag & 0x18) == 0)) {
          puVar114 = (uint *)(pbVar154 + uVar109);
          *(byte *)puVar151 = 0x22;
          puVar121 = puVar151;
LAB_00f27321:
          lVar127 = (long)puVar114 - (long)pbVar154;
          lVar134 = 0;
          while( true ) {
            puVar140 = (uint *)(pbVar154 + lVar134);
            puVar126 = (uint *)((long)puVar121 + lVar134 + 1);
            if (lVar127 < 0x10) break;
            bVar153 = (byte)*puVar140;
            if (puVar157[bVar153] != '\0') {
              puVar140 = (uint *)(pbVar154 + lVar134);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 1);
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 1]] != '\0') {
              puVar140 = (uint *)(pbVar154 + lVar134);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 1);
              goto LAB_00f276e3;
            }
            if (puVar157[pbVar154[lVar134 + 2]] != '\0') {
              puVar140 = (uint *)(pbVar154 + lVar134);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 1);
              goto LAB_00f2750f;
            }
            if (puVar157[pbVar154[lVar134 + 3]] != '\0') {
              puVar140 = (uint *)(pbVar154 + lVar134);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 1);
              goto LAB_00f27531;
            }
            if (puVar157[pbVar154[lVar134 + 4]] != '\0') {
              puVar140 = (uint *)(pbVar154 + lVar134 + 4);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 5);
              *(undefined4 *)((long)puVar121 + lVar134 + 1) = *(undefined4 *)(pbVar154 + lVar134);
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 5]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 5);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 6);
              *(byte *)((long)puVar126 + -1) = pbVar154[4];
              *(undefined4 *)((long)puVar126 + -5) = *(undefined4 *)pbVar154;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 6]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 6);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 7);
              *(ushort *)((long)puVar126 + -2) = *(ushort *)(pbVar154 + 4);
              *(undefined4 *)((long)puVar126 + -6) = *(undefined4 *)pbVar154;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 7]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 7);
              uVar4 = *(undefined4 *)pbVar154;
              puVar126 = (uint *)((long)puVar121 + lVar134 + 8);
              *(undefined4 *)((long)puVar121 + lVar134 + 4) = *(undefined4 *)(pbVar154 + 3);
              *(undefined4 *)((long)puVar121 + lVar134 + 1) = uVar4;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 8]] != '\0') {
              puVar140 = (uint *)(pbVar154 + lVar134 + 8);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 9);
              *(undefined8 *)((long)puVar121 + lVar134 + 1) = *(undefined8 *)(pbVar154 + lVar134);
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 9]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 9);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 10);
              *(byte *)((long)puVar126 + -1) = pbVar154[8];
              *(undefined8 *)((long)puVar126 + -9) = *(undefined8 *)pbVar154;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 10]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 10);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 0xb);
              *(ushort *)((long)puVar126 + -2) = *(ushort *)(pbVar154 + 8);
              *(undefined8 *)((long)puVar126 + -10) = *(undefined8 *)pbVar154;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 0xb]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 0xb);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 0xc);
              puVar126[-1] = *(uint *)(pbVar154 + 7);
              *(undefined8 *)((long)puVar126 + -0xb) = *(undefined8 *)pbVar154;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 0xc]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 0xc);
              puVar126 = (uint *)((long)puVar121 + lVar134 + 0xd);
              puVar126[-1] = *(uint *)(pbVar154 + 8);
              *(undefined8 *)(puVar126 + -3) = *(undefined8 *)pbVar154;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 0xd]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 0xd);
              uVar115 = *(undefined8 *)pbVar154;
              puVar126 = (uint *)((long)puVar121 + lVar134 + 0xe);
              *(undefined8 *)((long)puVar121 + lVar134 + 6) = *(undefined8 *)(pbVar154 + 5);
              *(undefined8 *)((long)puVar121 + lVar134 + 1) = uVar115;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 0xe]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 0xe);
              uVar115 = *(undefined8 *)pbVar154;
              puVar126 = (uint *)((long)puVar121 + lVar134 + 0xf);
              *(undefined8 *)((long)puVar121 + lVar134 + 7) = *(undefined8 *)(pbVar154 + 6);
              *(undefined8 *)((long)puVar121 + lVar134 + 1) = uVar115;
              goto LAB_00f276ef;
            }
            if (puVar157[pbVar154[lVar134 + 0xf]] != '\0') {
              pbVar154 = pbVar154 + lVar134;
              puVar140 = (uint *)(pbVar154 + 0xf);
              uVar115 = *(undefined8 *)pbVar154;
              puVar126 = (uint *)((long)puVar121 + lVar134 + 0x10);
              *(undefined8 *)((long)puVar121 + lVar134 + 8) = *(undefined8 *)(pbVar154 + 7);
              *(undefined8 *)((long)puVar121 + lVar134 + 1) = uVar115;
              goto LAB_00f276ef;
            }
            uVar141 = puVar140[1];
            uVar131 = puVar140[2];
            uVar138 = puVar140[3];
            *puVar126 = *puVar140;
            *(uint *)((long)puVar121 + lVar134 + 5) = uVar141;
            *(uint *)((long)puVar121 + lVar134 + 9) = uVar131;
            *(uint *)((long)puVar121 + lVar134 + 0xd) = uVar138;
            lVar134 = lVar134 + 0x10;
            lVar127 = lVar127 + -0x10;
          }
LAB_00f27474:
          if (3 < lVar127) {
            if (puVar157[(byte)*puVar140] == '\0') {
              if (puVar157[*(byte *)((long)puVar140 + 1)] == '\0') {
                if (puVar157[*(byte *)((long)puVar140 + 2)] == '\0') {
                  if (puVar157[*(byte *)((long)puVar140 + 3)] == '\0') goto LAB_00f27462;
LAB_00f27531:
                  *(byte *)((long)puVar126 + 2) = *(byte *)((long)puVar140 + 2);
                  *(ushort *)puVar126 = (ushort)*puVar140;
                  puVar126 = (uint *)((long)puVar126 + 3);
                  puVar140 = (uint *)((long)puVar140 + 3);
                }
                else {
LAB_00f2750f:
                  *(ushort *)puVar126 = (ushort)*puVar140;
                  puVar126 = (uint *)((long)puVar126 + 2);
                  puVar140 = (uint *)((long)puVar140 + 2);
                }
              }
              else {
                bVar153 = (byte)*puVar140;
LAB_00f276e3:
                *(byte *)puVar126 = bVar153;
                puVar126 = (uint *)((long)puVar126 + 1);
                puVar140 = (uint *)((long)puVar140 + 1);
              }
            }
            goto LAB_00f276ef;
          }
          goto LAB_00f274bb;
        }
        *(byte *)puVar151 = 0x22;
        puVar126 = (uint *)((long)puVar151 + 2);
        for (uVar152 = uVar109; 0xf < uVar152; uVar152 = uVar152 - 0x10) {
          uVar115 = *(undefined8 *)(pbVar154 + 8);
          *(undefined8 *)((long)puVar126 + -1) = *(undefined8 *)pbVar154;
          *(undefined8 *)((long)puVar126 + 7) = uVar115;
          pbVar154 = pbVar154 + 0x10;
          puVar126 = puVar126 + 4;
        }
        for (uVar109 = uVar109 - (uVar150 >> 8 & 0xfffffffffffffff0); 3 < uVar109;
            uVar109 = uVar109 - 4) {
          *(undefined4 *)((long)puVar126 + -1) = *(undefined4 *)pbVar154;
          pbVar154 = pbVar154 + 4;
          puVar126 = puVar126 + 1;
        }
        for (uVar150 = 0; uVar109 != uVar150; uVar150 = uVar150 + 1) {
          *(byte *)((long)puVar126 + -1) = pbVar154[uVar150];
          puVar126 = (uint *)((long)puVar126 + 1);
        }
        *(byte *)((long)puVar126 + -1) = 0x22;
        goto LAB_00f27024;
      }
      break;
    case 6:
switchD_00f2112f_caseD_6:
      puVar151 = (uint *)(*p_Var5)(pvVar7,4);
      if (puVar151 != (uint *)0x0) {
        *(ushort *)puVar151 = 0x5d5b;
LAB_00f27015:
        puVar126 = (uint *)((long)puVar151 + 2);
        goto LAB_00f27024;
      }
      break;
    case 7:
switchD_00f2112f_caseD_7:
      puVar151 = (uint *)(*p_Var5)(pvVar7,4);
      if (puVar151 != (uint *)0x0) {
        *(ushort *)puVar151 = 0x7d7b;
        goto LAB_00f27015;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar106->code = 2;
    pcVar110 = "memory allocation failed";
  }
  else {
    puVar157 = enc_table_esc_slash;
    if ((flg & 4) == 0) {
      puVar157 = enc_table_esc;
    }
    switch(bVar153 & 7) {
    case 1:
      goto switchD_00f2112f_caseD_1;
    case 2:
      goto switchD_00f2112f_caseD_2;
    case 3:
      goto switchD_00f2112f_caseD_3;
    case 4:
      goto switchD_00f2112f_caseD_4;
    case 5:
      goto switchD_00f2112f_caseD_5;
    case 6:
      goto switchD_00f2112f_caseD_6;
    case 7:
      goto switchD_00f2112f_caseD_7;
    }
switchD_00f2112f_caseD_0:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar106->code = 3;
    pcVar110 = "invalid JSON value type";
  }
LAB_00f27089:
  pyVar118->msg = pcVar110;
  return (char *)0x0;
code_r0x00f21959:
  *puVar114 = *puVar121;
  puVar114 = puVar114 + 1;
  puVar121 = puVar121 + 1;
  lVar136 = lVar136 + -4;
  goto LAB_00f21918;
LAB_00f21977:
  if (puVar126 <= puVar121) goto switchD_00f21bd6_default;
  uVar138 = *puVar121;
  if (puVar130[(byte)uVar138] != '\0') goto LAB_00f21ba8;
  puVar121 = (uint *)((long)puVar121 + 1);
  *(byte *)puVar114 = (byte)uVar138;
  puVar114 = (uint *)((long)puVar114 + 1);
  goto LAB_00f21977;
LAB_00f21ba8:
  puVar151 = puVar121 + 1;
  if (puVar126 < puVar151) {
    if (puVar126 != puVar121) {
      uVar138 = (uint)(byte)*puVar121;
      uVar120 = (ulong)(byte)*puVar121;
      bVar153 = puVar130[uVar120];
      if ((long)(ulong)(bVar153 >> 1) <= (long)puVar126 - (long)puVar121) goto LAB_00f21bc1;
switchD_00f21bd6_caseD_1:
      if ((flg & 2) != 0) goto LAB_00f21cd4;
      goto LAB_00f21e63;
    }
    goto switchD_00f21bd6_default;
  }
  uVar138 = (uint)(byte)*puVar121;
  uVar120 = (ulong)(byte)*puVar121;
  bVar153 = puVar130[uVar120];
LAB_00f21bc1:
  switch(bVar153) {
  case 0:
    goto switchD_00f21bd6_caseD_0;
  case 1:
    goto switchD_00f21bd6_caseD_1;
  case 2:
    *(ushort *)puVar114 = *(ushort *)(esc_single_char_table + uVar120 * 2);
    puVar114 = (uint *)((long)puVar114 + 2);
    puVar121 = (uint *)((long)puVar121 + 1);
    goto LAB_00f21ba8;
  case 3:
    *puVar114 = 0x3030755c;
    *(ushort *)(puVar114 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar121 * 2);
    goto LAB_00f21cea;
  case 4:
    uVar3 = (ushort)*puVar121;
    uVar138 = (uint)uVar3;
    if (((uVar138 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar114 = uVar3;
      puVar114 = (uint *)((long)puVar114 + 2);
      puVar121 = (uint *)((long)puVar121 + 2);
      goto LAB_00f21ba8;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar121;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_00f21cd4;
    *(ushort *)puVar114 = 0x755c;
    *(ushort *)((long)puVar114 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar114 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar114 = (uint *)((long)puVar114 + 6);
    puVar121 = (uint *)((long)puVar121 + 2);
    goto LAB_00f21ba8;
  case 6:
    if (puVar126 < puVar151) {
      uVar3 = (ushort)*puVar121;
      uVar138 = (uint)uVar3;
      uVar147 = (uint)(uint3)*puVar121;
      if (((uVar147 & 0xc0c0f0) == 0x8080e0) && (uVar155 = uVar3 & 0x200f, (uVar3 & 0x200f) != 0))
      goto LAB_00f21c8c;
    }
    else {
      uVar147 = *puVar121;
      uVar138 = uVar147;
      if (((uVar147 & 0xc0c0f0) == 0x8080e0) && (uVar155 = uVar147 & 0x200f, uVar155 != 0)) {
LAB_00f21c8c:
        if (uVar155 != 0x200d) {
          *puVar114 = uVar147;
          puVar114 = (uint *)((long)puVar114 + 3);
          puVar121 = (uint *)((long)puVar121 + 3);
          goto LAB_00f21ba8;
        }
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar121;
    bVar153 = *(byte *)((long)puVar121 + 2);
    if ((((*puVar121 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar138 = *puVar121;
      *(ushort *)puVar114 = 0x755c;
      *(ushort *)((long)puVar114 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar138 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar114 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar153 & 0x3f) * 2);
      puVar114 = (uint *)((long)puVar114 + 6);
      puVar121 = (uint *)((long)puVar121 + 3);
    }
    else {
LAB_00f21cd4:
      if ((flg & 0x20) == 0) goto LAB_00f26c44;
      *(ushort *)puVar114 = 0x755c;
      ((ushort *)((long)puVar114 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar114 + 2))[1] = 0x4446;
LAB_00f21cea:
      puVar114 = (uint *)((long)puVar114 + 6);
      puVar121 = (uint *)((long)puVar121 + 1);
    }
    goto LAB_00f21ba8;
  case 8:
    uVar138 = *puVar121;
    if ((((uVar138 & 0xc0c0c0f8) == 0x808080f0) && ((uVar138 & 0x3007) != 0)) &&
       (((byte)(uVar138 >> 2) & 0x3f & (uVar138 & 0x3003) != 0) == 0)) {
      *puVar114 = uVar138;
      puVar114 = puVar114 + 1;
      puVar121 = puVar151;
      goto LAB_00f21ba8;
    }
    break;
  case 9:
    uVar138 = *puVar121;
    if ((((uVar138 & 0xc0c0c0f8) != 0x808080f0) || ((uVar138 & 0x3007) == 0)) ||
       (((byte)uVar138 >> 2 & (uVar138 & 0x3003) != 0) != 0)) goto LAB_00f21cd4;
    iVar137 = (uVar138 & 7) * 0x40000;
    iVar135 = (uVar138 & 0x3f00) * 0x10;
    *(ushort *)puVar114 = 0x755c;
    *(ushort *)((long)puVar114 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar137 + iVar135) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar114 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar138 >> 10 & 0xc00) + iVar137 + iVar135) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar114 + 6) = 0x755c;
    *(ushort *)(puVar114 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar138 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar114 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar138 >> 10 & 0xc0 | uVar138 >> 0x18 & 0x3f) * 2);
    puVar114 = puVar114 + 3;
    puVar121 = puVar151;
    goto LAB_00f21ba8;
  default:
    goto switchD_00f21bd6_default;
  }
LAB_00f21e63:
  if ((flg & 0x20) == 0) goto LAB_00f26c44;
  *(byte *)puVar114 = (byte)uVar138;
  puVar114 = (uint *)((long)puVar114 + 1);
  puVar121 = (uint *)((long)puVar121 + 1);
  goto LAB_00f21ba8;
switchD_00f21bd6_caseD_0:
  pbVar154 = (byte *)((long)puVar121 + 1);
  *(byte *)puVar114 = (byte)uVar138;
  puVar151 = puVar114;
  goto LAB_00f217d2;
  while( true ) {
    uVar109 = *__dest;
    local_e8 = __dest + 1;
    local_48 = uVar109 & 0xffffffffffffff01;
    puVar151 = (uint *)(pbVar113 + 2);
    pbVar113[0] = 0x2c;
    pbVar113[1] = 10;
    lVar142 = (uVar109 >> 1) - 1;
    puVar126 = local_d8;
    lVar133 = lVar134;
    if (lVar142 != 0) break;
LAB_00f23ffb:
    pbVar154 = (byte *)((long)puVar151 + -1);
    *(byte *)((long)puVar151 + -2) = 10;
    local_d8 = puVar126;
    __dest = local_e8;
    if (local_e8 <= (ulong *)(lVar133 * 4 + -1 + (long)puVar151)) {
      uVar109 = (ulong)puVar126 >> 1;
      if ((ulong)puVar126 >> 1 <= (ulong)(lVar133 * 4)) {
        uVar109 = lVar133 * 4;
      }
      local_d8 = (uint *)((uVar109 + 7 & 0xfffffffffffffff8) + (long)puVar126);
      pbVar113 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)puVar126,(size_t)local_d8);
      if (pbVar113 == (byte *)0x0) goto LAB_00f26ca3;
      __dest = (ulong *)(pbVar113 + ((long)local_d8 - ((long)local_a8 - (long)local_e8)));
      memmove(__dest,pbVar113 + ((long)local_e8 - (long)local_100),(long)local_a8 - (long)local_e8);
      pbVar154 = pbVar113 + ((long)pbVar154 - (long)local_100);
      local_a8 = (ulong *)(pbVar113 + (long)local_d8);
      local_100 = pbVar113;
    }
    lVar134 = lVar133 + -1;
    pbVar113 = pbVar154 + 1;
    pbVar154 = local_100 + ~(ulong)pbVar154;
    for (lVar142 = 1; lVar133 != lVar142; lVar142 = lVar142 + 1) {
      pbVar113[-1] = 0x20;
      pbVar113[0] = 0x20;
      pbVar113[1] = 0x20;
      pbVar113[2] = 0x20;
      pbVar113 = pbVar113 + lVar127;
      pbVar154 = pbVar154 + -lVar127;
    }
    pbVar113[-1] = (char)local_48 * ' ' + 0x5d;
    if (local_a8 <= __dest) {
      if (local_10c < '\0') {
        if (__dest <= pbVar113 + 2) {
          uVar150 = 2;
          if (2 < (ulong)local_d8 >> 1) {
            uVar150 = (ulong)local_d8 >> 1;
          }
          sVar128 = (uVar150 + 7 & 0xfffffffffffffff8) + (long)local_d8;
          pbVar111 = (byte *)(*p_Var8)(pvVar7,local_100,(size_t)local_d8,sVar128);
          if (pbVar111 == (byte *)0x0) goto LAB_00f26ca3;
          memmove(pbVar111 + (sVar128 - ((long)local_a8 - (long)__dest)),
                  pbVar111 + ((long)__dest - (long)local_100),(long)local_a8 - (long)__dest);
          pbVar113 = pbVar111 + -(long)pbVar154;
          local_100 = pbVar111;
        }
        *pbVar113 = 10;
        pbVar113 = pbVar113 + 1;
      }
      *pbVar113 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar113 - (long)local_100;
      }
      goto LAB_00f28f98;
    }
  }
  puVar151 = (uint *)(pbVar113 + 2);
  goto LAB_00f21239;
code_r0x00f24886:
  *puVar114 = *puVar121;
  puVar114 = puVar114 + 1;
  puVar121 = puVar121 + 1;
  lVar142 = lVar142 + -4;
  goto LAB_00f24845;
LAB_00f248a0:
  if (puVar151 <= puVar121) goto switchD_00f24b06_default;
  uVar141 = *puVar121;
  if (puVar157[(byte)uVar141] != '\0') goto LAB_00f24adb;
  puVar121 = (uint *)((long)puVar121 + 1);
  *(byte *)puVar114 = (byte)uVar141;
  puVar114 = (uint *)((long)puVar114 + 1);
  goto LAB_00f248a0;
LAB_00f24adb:
  puVar126 = puVar121 + 1;
  if (puVar151 < puVar126) {
    if (puVar151 != puVar121) {
      bVar153 = (byte)*puVar121;
      uVar109 = (ulong)bVar153;
      bVar2 = puVar157[uVar109];
      if ((long)(ulong)(bVar2 >> 1) <= (long)puVar151 - (long)puVar121) goto LAB_00f24af1;
switchD_00f24b06_caseD_1:
      if ((flg & 2) != 0) goto LAB_00f24c19;
      goto LAB_00f24ddc;
    }
    goto switchD_00f24b06_default;
  }
  bVar153 = (byte)*puVar121;
  uVar109 = (ulong)bVar153;
  bVar2 = puVar157[uVar109];
LAB_00f24af1:
  switch(bVar2) {
  case 0:
    goto switchD_00f24b06_caseD_0;
  case 1:
    goto switchD_00f24b06_caseD_1;
  case 2:
    *(ushort *)puVar114 = *(ushort *)(esc_single_char_table + uVar109 * 2);
    puVar114 = (uint *)((long)puVar114 + 2);
    puVar121 = (uint *)((long)puVar121 + 1);
    goto LAB_00f24adb;
  case 3:
    *puVar114 = 0x3030755c;
    *(ushort *)(puVar114 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar121 * 2);
    goto LAB_00f24c31;
  case 4:
    uVar3 = (ushort)*puVar121;
    bVar153 = (byte)uVar3;
    if (((uVar3 & 0xc0e0) == 0x80c0) && ((uVar3 & 0x1e) != 0)) {
      *(ushort *)puVar114 = uVar3;
      puVar114 = (uint *)((long)puVar114 + 2);
      puVar121 = (uint *)((long)puVar121 + 2);
      goto LAB_00f24adb;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar121;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_00f24c19;
    *(ushort *)puVar114 = 0x755c;
    *(ushort *)((long)puVar114 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar114 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar114 = (uint *)((long)puVar114 + 6);
    puVar121 = (uint *)((long)puVar121 + 2);
    goto LAB_00f24adb;
  case 6:
    if (puVar151 < puVar126) {
      uVar3 = (ushort)*puVar121;
      bVar153 = (byte)uVar3;
      uVar141 = (uint)(uint3)*puVar121;
      if (((uVar141 & 0xc0c0f0) == 0x8080e0) &&
         (uVar138 = uVar3 & 0x200f, uVar131 = (uint)uVar3, (uVar3 & 0x200f) != 0))
      goto LAB_00f24bcb;
    }
    else {
      uVar141 = *puVar121;
      if (((uVar141 & 0xc0c0f0) == 0x8080e0) &&
         (uVar138 = uVar141 & 0x200f, uVar131 = uVar141, uVar138 != 0)) {
LAB_00f24bcb:
        bVar153 = (byte)uVar131;
        if (uVar138 != 0x200d) {
          *puVar114 = uVar141;
          puVar114 = (uint *)((long)puVar114 + 3);
          puVar121 = (uint *)((long)puVar121 + 3);
          goto LAB_00f24adb;
        }
      }
      else {
        bVar153 = (byte)uVar141;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar121;
    bVar153 = *(byte *)((long)puVar121 + 2);
    if ((((*puVar121 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar141 = *puVar121;
      *(ushort *)puVar114 = 0x755c;
      *(ushort *)((long)puVar114 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar141 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar114 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar153 & 0x3f) * 2);
      puVar114 = (uint *)((long)puVar114 + 6);
      puVar121 = (uint *)((long)puVar121 + 3);
    }
    else {
LAB_00f24c19:
      if ((flg & 0x20) == 0) goto LAB_00f26c44;
      *(ushort *)puVar114 = 0x755c;
      ((ushort *)((long)puVar114 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar114 + 2))[1] = 0x4446;
LAB_00f24c31:
      puVar114 = (uint *)((long)puVar114 + 6);
      puVar121 = (uint *)((long)puVar121 + 1);
    }
    goto LAB_00f24adb;
  case 8:
    uVar141 = *puVar121;
    bVar153 = (byte)uVar141;
    if ((((uVar141 & 0xc0c0c0f8) == 0x808080f0) && ((uVar141 & 0x3007) != 0)) &&
       ((bVar153 >> 2 & (uVar141 & 0x3003) != 0) == 0)) {
      *puVar114 = uVar141;
      puVar114 = puVar114 + 1;
      puVar121 = puVar126;
      goto LAB_00f24adb;
    }
    break;
  case 9:
    uVar141 = *puVar121;
    if ((((uVar141 & 0xc0c0c0f8) != 0x808080f0) || ((uVar141 & 0x3007) == 0)) ||
       (((byte)uVar141 >> 2 & (uVar141 & 0x3003) != 0) != 0)) goto LAB_00f24c19;
    iVar137 = (uVar141 & 7) * 0x40000;
    iVar135 = (uVar141 & 0x3f00) * 0x10;
    *(ushort *)puVar114 = 0x755c;
    *(ushort *)((long)puVar114 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar137 + iVar135) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar114 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar141 >> 10 & 0xc00) + iVar137 + iVar135) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar114 + 6) = 0x755c;
    *(ushort *)(puVar114 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar141 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar114 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar141 >> 10 & 0xc0 | uVar141 >> 0x18 & 0x3f) * 2);
    puVar114 = puVar114 + 3;
    puVar121 = puVar126;
    goto LAB_00f24adb;
  default:
    goto switchD_00f24b06_default;
  }
LAB_00f24ddc:
  if ((flg & 0x20) == 0) goto LAB_00f26c44;
  *(byte *)puVar114 = bVar153;
  puVar114 = (uint *)((long)puVar114 + 1);
  puVar121 = (uint *)((long)puVar121 + 1);
  goto LAB_00f24adb;
LAB_00f26c44:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar118 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar118 = err;
  }
  pyVar106->code = 7;
  pcVar110 = "invalid utf-8 encoding in string";
  goto LAB_00f26c7b;
switchD_00f24b06_caseD_0:
  pbVar154 = (byte *)((long)puVar121 + 1);
  *(byte *)puVar114 = bVar153;
  puVar126 = puVar114;
  goto LAB_00f2470b;
LAB_00f27462:
  *puVar126 = *puVar140;
  puVar126 = puVar126 + 1;
  puVar140 = puVar140 + 1;
  lVar127 = lVar127 + -4;
  goto LAB_00f27474;
LAB_00f274bb:
  if (puVar114 <= puVar140) {
    *(byte *)puVar126 = 0x22;
    puVar126 = (uint *)((long)puVar126 + 1);
    goto LAB_00f27024;
  }
  uVar141 = *puVar140;
  if (puVar157[(byte)uVar141] != '\0') goto LAB_00f276ef;
  puVar140 = (uint *)((long)puVar140 + 1);
  *(byte *)puVar126 = (byte)uVar141;
  puVar126 = (uint *)((long)puVar126 + 1);
  goto LAB_00f274bb;
LAB_00f276ef:
  puVar121 = puVar140 + 1;
  if (puVar114 < puVar121) {
    if (puVar114 == puVar140) goto switchD_00f2771a_default;
    bVar153 = (byte)*puVar140;
    uVar150 = (ulong)bVar153;
    bVar2 = puVar157[uVar150];
    if ((long)(ulong)(bVar2 >> 1) <= (long)puVar114 - (long)puVar140) goto LAB_00f27707;
switchD_00f2771a_caseD_1:
    if ((flg & 2) == 0) goto LAB_00f27a68;
    goto LAB_00f27856;
  }
  bVar153 = (byte)*puVar140;
  uVar150 = (ulong)bVar153;
  bVar2 = puVar157[uVar150];
LAB_00f27707:
  switch(bVar2) {
  case 0:
    goto switchD_00f2771a_caseD_0;
  case 1:
    goto switchD_00f2771a_caseD_1;
  case 2:
    *(ushort *)puVar126 = *(ushort *)(esc_single_char_table + uVar150 * 2);
    puVar126 = (uint *)((long)puVar126 + 2);
    puVar140 = (uint *)((long)puVar140 + 1);
    goto LAB_00f276ef;
  case 3:
    *puVar126 = 0x3030755c;
    *(ushort *)(puVar126 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar140 * 2);
    goto LAB_00f2786d;
  case 4:
    uVar3 = (ushort)*puVar140;
    bVar153 = (byte)uVar3;
    uVar141 = (uint)uVar3;
    if ((uVar3 & 0xc0e0) == 0x80c0) {
      if ((uVar3 & 0x1e) != 0) {
        *(ushort *)puVar126 = uVar3;
        puVar126 = (uint *)((long)puVar126 + 2);
        puVar140 = (uint *)((long)puVar140 + 2);
        goto LAB_00f276ef;
      }
    }
    else {
LAB_00f27af6:
      bVar153 = (byte)uVar141;
    }
    break;
  case 5:
    uVar3 = (ushort)*puVar140;
    if (((uVar3 & 0xc0e0) != 0x80c0) || ((uVar3 & 0x1e) == 0)) goto LAB_00f27856;
    *(ushort *)puVar126 = 0x755c;
    *(ushort *)((long)puVar126 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar3 >> 1) & 0xe));
    *(ushort *)(puVar126 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar3 >> 8) & 0x3f | (byte)uVar3 << 6) * 2);
    puVar126 = (uint *)((long)puVar126 + 6);
    puVar140 = (uint *)((long)puVar140 + 2);
    goto LAB_00f276ef;
  case 6:
    if (puVar114 < puVar121) {
      uVar3 = (ushort)*puVar140;
      bVar153 = (byte)uVar3;
      uVar131 = (uint)(uint3)*puVar140;
      uVar141 = (uint)uVar3;
      if (((uVar131 & 0xc0c0f0) != 0x8080e0) || ((uVar3 & 0x200f) == 0)) goto LAB_00f27af6;
      if ((uVar3 & 0x200f) != 0x200d) goto LAB_00f27805;
    }
    else {
      uVar131 = *puVar140;
      uVar141 = uVar131;
      if ((uVar131 & 0xc0c0f0) != 0x8080e0) goto LAB_00f27af6;
      bVar153 = (byte)uVar131;
      if (((uVar131 & 0x200f) != 0) && ((uVar131 & 0x200f) != 0x200d)) {
LAB_00f27805:
        *puVar126 = uVar131;
        puVar126 = (uint *)((long)puVar126 + 3);
        puVar140 = (uint *)((long)puVar140 + 3);
        goto LAB_00f276ef;
      }
    }
    break;
  case 7:
    uVar3 = (ushort)*puVar140;
    bVar153 = *(byte *)((long)puVar140 + 2);
    if ((((*puVar140 & 0xc0c0f0) == 0x8080e0) && ((uVar3 & 0x200f) != 0)) &&
       ((uVar3 & 0x200f) != 0x200d)) {
      uVar141 = *puVar140;
      *(ushort *)puVar126 = 0x755c;
      *(ushort *)((long)puVar126 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar3 >> 2 & 0xfc0 | (uint)(byte)uVar141 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar126 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar3 >> 2 & 0xc0 | bVar153 & 0x3f) * 2);
      puVar126 = (uint *)((long)puVar126 + 6);
      puVar140 = (uint *)((long)puVar140 + 3);
    }
    else {
LAB_00f27856:
      if ((flg & 0x20) == 0) goto LAB_00f28172;
      *(ushort *)puVar126 = 0x755c;
      ((ushort *)((long)puVar126 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar126 + 2))[1] = 0x4446;
LAB_00f2786d:
      puVar126 = (uint *)((long)puVar126 + 6);
      puVar140 = (uint *)((long)puVar140 + 1);
    }
    goto LAB_00f276ef;
  case 8:
    uVar141 = *puVar140;
    bVar153 = (byte)uVar141;
    if ((uVar141 & 0xc0c0c0f8) != 0x808080f0) goto LAB_00f27af6;
    if (((uVar141 & 0x3007) != 0) && ((bVar153 >> 2 & (uVar141 & 0x3003) != 0) == 0)) {
      *puVar126 = uVar141;
      puVar126 = puVar126 + 1;
      puVar140 = puVar121;
      goto LAB_00f276ef;
    }
    break;
  case 9:
    uVar141 = *puVar140;
    if ((((uVar141 & 0xc0c0c0f8) != 0x808080f0) || ((uVar141 & 0x3007) == 0)) ||
       (((byte)uVar141 >> 2 & (uVar141 & 0x3003) != 0) != 0)) goto LAB_00f27856;
    iVar137 = (uVar141 & 7) * 0x40000;
    iVar135 = (uVar141 & 0x3f00) * 0x10;
    *(ushort *)puVar126 = 0x755c;
    *(ushort *)((long)puVar126 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar137 + iVar135) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar126 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          ((iVar137 + iVar135 + (uVar141 >> 10 & 0xc00)) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar126 + 6) = 0x755c;
    *(ushort *)(puVar126 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar141 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar126 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar141 >> 10 & 0xc0 | uVar141 >> 0x18 & 0x3f) * 2);
    puVar126 = puVar126 + 3;
    puVar140 = puVar121;
    goto LAB_00f276ef;
  default:
switchD_00f2771a_default:
    *(byte *)puVar126 = 0x22;
    puVar126 = (uint *)((long)puVar126 + 1);
    goto LAB_00f27024;
  }
LAB_00f27a68:
  if ((flg & 0x20) == 0) {
LAB_00f28172:
    (*p_Var6)(pvVar7,puVar151);
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar106->code = 7;
    pcVar110 = "invalid utf-8 encoding in string";
    goto LAB_00f27089;
  }
  *(byte *)puVar126 = bVar153;
  puVar126 = (uint *)((long)puVar126 + 1);
  puVar140 = (uint *)((long)puVar140 + 1);
  goto LAB_00f276ef;
switchD_00f2771a_caseD_0:
  pbVar154 = (byte *)((long)puVar140 + 1);
  *(byte *)puVar126 = bVar153;
  puVar121 = puVar126;
  goto LAB_00f27321;
LAB_00f26d85:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar118 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar118 = err;
  }
  pyVar106->code = 4;
  pyVar118->msg = "nan or inf number is not allowed";
LAB_00f26d38:
  if (local_100 == (byte *)0x0) {
    return (char *)0x0;
  }
  (*p_Var6)(pvVar7,local_100);
  return (char *)0x0;
LAB_00f26d49:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar118 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar118 = err;
  }
  pyVar106->code = 3;
  pcVar110 = "invalid JSON value type";
LAB_00f26c7b:
  pyVar118->msg = pcVar110;
  if (local_100 != (byte *)0x0) {
    (*p_Var6)(pvVar7,local_100);
  }
  return (char *)0x0;
}

Assistant:

char *yyjson_val_write_opts(const yyjson_val *val,
                            yyjson_write_flag flg,
                            const yyjson_alc *alc_ptr,
                            usize *dat_len,
                            yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_val *root = constcast(yyjson_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_READ_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_write_pretty(root, flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_write_minify(root, flg, alc, dat_len, err);
    }
}